

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  ushort uVar28;
  undefined8 uVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [40];
  undefined1 auVar272 [48];
  undefined1 auVar273 [56];
  undefined1 auVar274 [40];
  undefined1 auVar275 [48];
  undefined1 auVar276 [56];
  undefined1 auVar277 [24];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  float fVar284;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  __m128 _outp_5;
  __m128 _b_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_512_1;
  __m256 _p_256;
  __m128 _p_2;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_512;
  __m256 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_pow op;
  __m512 pow2n_3;
  __m512 y_7;
  __mmask16 mask_7;
  __m512 one_7;
  __m512i imm0_7;
  __m512 fx_3;
  __m512 tmp_7;
  __m512 pow2n_1;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_3;
  __m512i imm0_3;
  __m512 fx_1;
  __m512 tmp_3;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y_6;
  __m512 z_3;
  __m512 tmp_6;
  __mmask16 mask_6;
  __m512 e_3;
  __mmask16 invalid_mask_3;
  __m512 one_6;
  __m512i imm0_6;
  __m512 y_2;
  __m512 z_1;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e_1;
  __mmask16 invalid_mask_1;
  __m512 one_2;
  __m512i imm0_2;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_4;
  __m256 y_9;
  __m256 mask_9;
  __m256 one_9;
  __m256i imm0_9;
  __m256 fx_4;
  __m256 tmp_9;
  __m256 pow2n_2;
  __m256 y_5;
  __m256 mask_5;
  __m256 one_5;
  __m256i imm0_5;
  __m256 fx_2;
  __m256 tmp_5;
  __m256 y_8;
  __m256 z_4;
  __m256 tmp_8;
  __m256 mask_8;
  __m256 e_4;
  __m256 invalid_mask_4;
  __m256 one_8;
  __m256i imm0_8;
  __m256 y_4;
  __m256 z_2;
  __m256 tmp_4;
  __m256 mask_4;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_4;
  __m256i imm0_4;
  v4sf pow2n_5;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_11;
  v4si emm0_1;
  v4sf fx_5;
  v4sf tmp_11;
  v4sf y_10;
  v4sf z_5;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_5;
  v4sf invalid_mask_5;
  v4sf one_10;
  v4si emm0;
  int local_a844;
  int local_a6c4;
  int local_a5f0;
  undefined8 *local_a5e0;
  float *local_a5d8;
  undefined8 uStack_a190;
  undefined8 uStack_a188;
  undefined8 uStack_a150;
  undefined8 uStack_a148;
  undefined1 local_9d00 [8];
  undefined8 uStack_9cf8;
  undefined8 uStack_9cf0;
  undefined8 uStack_9ce8;
  undefined8 uStack_9ce0;
  undefined8 uStack_9cd8;
  undefined8 uStack_9cd0;
  undefined8 uStack_9cc8;
  undefined1 local_9c00 [16];
  undefined8 uStack_9bf0;
  undefined8 uStack_9be8;
  undefined8 uStack_9be0;
  undefined8 uStack_9bd8;
  undefined8 uStack_9bd0;
  undefined8 uStack_9bc8;
  undefined1 local_9880 [8];
  undefined8 uStack_9878;
  undefined8 uStack_9870;
  undefined8 uStack_9868;
  undefined8 uStack_9860;
  undefined8 uStack_9858;
  undefined8 uStack_9850;
  undefined8 uStack_9848;
  undefined1 local_9780 [16];
  undefined8 uStack_9770;
  undefined8 uStack_9768;
  undefined8 uStack_9760;
  undefined8 uStack_9758;
  undefined8 uStack_9750;
  undefined8 uStack_9748;
  undefined1 local_9400 [8];
  undefined8 uStack_93f8;
  undefined8 uStack_93f0;
  undefined8 uStack_93e8;
  undefined8 uStack_93e0;
  undefined8 uStack_93d8;
  undefined8 uStack_93d0;
  undefined8 uStack_93c8;
  undefined1 local_9300 [16];
  undefined8 uStack_92f0;
  undefined8 uStack_92e8;
  undefined8 uStack_92e0;
  undefined8 uStack_92d8;
  undefined8 uStack_92d0;
  undefined8 uStack_92c8;
  undefined1 local_8fc0 [256];
  undefined1 local_8ec0 [16];
  undefined8 uStack_8eb0;
  undefined8 uStack_8ea8;
  undefined8 uStack_8ea0;
  undefined8 uStack_8e98;
  undefined8 uStack_8e90;
  undefined8 uStack_8e88;
  undefined1 local_8dc0 [16];
  undefined8 uStack_8db0;
  undefined8 uStack_8da8;
  undefined8 uStack_8da0;
  undefined8 uStack_8d98;
  undefined8 uStack_8d90;
  undefined8 uStack_8d88;
  undefined1 local_8a00 [256];
  undefined1 local_8900 [16];
  undefined8 uStack_88f0;
  undefined8 uStack_88e8;
  undefined8 uStack_88e0;
  undefined8 uStack_88d8;
  undefined8 uStack_88d0;
  undefined8 uStack_88c8;
  undefined1 local_8800 [16];
  undefined8 uStack_87f0;
  undefined8 uStack_87e8;
  undefined8 uStack_87e0;
  undefined8 uStack_87d8;
  undefined8 uStack_87d0;
  undefined8 uStack_87c8;
  undefined1 local_8440 [256];
  undefined1 local_8340 [16];
  undefined8 uStack_8330;
  undefined8 uStack_8328;
  undefined8 uStack_8320;
  undefined8 uStack_8318;
  undefined8 uStack_8310;
  undefined8 uStack_8308;
  undefined1 local_8240 [16];
  undefined8 uStack_8230;
  undefined8 uStack_8228;
  undefined8 uStack_8220;
  undefined8 uStack_8218;
  undefined8 uStack_8210;
  undefined8 uStack_8208;
  int local_5600;
  int iStack_55fc;
  int iStack_55f8;
  int iStack_55f4;
  int iStack_55f0;
  int iStack_55ec;
  int iStack_55e8;
  int iStack_55e4;
  int iStack_55e0;
  int iStack_55dc;
  int iStack_55d8;
  int iStack_55d4;
  int iStack_55d0;
  int iStack_55cc;
  int iStack_55c8;
  int iStack_55c4;
  int local_5480;
  int iStack_547c;
  int iStack_5478;
  int iStack_5474;
  int iStack_5470;
  int iStack_546c;
  int iStack_5468;
  int iStack_5464;
  int iStack_5460;
  int iStack_545c;
  int iStack_5458;
  int iStack_5454;
  int iStack_5450;
  int iStack_544c;
  int iStack_5448;
  int iStack_5444;
  int local_5300;
  int iStack_52fc;
  int iStack_52f8;
  int iStack_52f4;
  int iStack_52f0;
  int iStack_52ec;
  int iStack_52e8;
  int iStack_52e4;
  int iStack_52e0;
  int iStack_52dc;
  int iStack_52d8;
  int iStack_52d4;
  int iStack_52d0;
  int iStack_52cc;
  int iStack_52c8;
  int iStack_52c4;
  int local_5180;
  int iStack_517c;
  int iStack_5178;
  int iStack_5174;
  int iStack_5170;
  int iStack_516c;
  int iStack_5168;
  int iStack_5164;
  int iStack_5160;
  int iStack_515c;
  int iStack_5158;
  int iStack_5154;
  int iStack_5150;
  int iStack_514c;
  int iStack_5148;
  int iStack_5144;
  int local_5000;
  int iStack_4ffc;
  int iStack_4ff8;
  int iStack_4ff4;
  int iStack_4ff0;
  int iStack_4fec;
  int iStack_4fe8;
  int iStack_4fe4;
  int iStack_4fe0;
  int iStack_4fdc;
  int iStack_4fd8;
  int iStack_4fd4;
  int iStack_4fd0;
  int iStack_4fcc;
  int iStack_4fc8;
  int iStack_4fc4;
  int local_4e80;
  int iStack_4e7c;
  int iStack_4e78;
  int iStack_4e74;
  int iStack_4e70;
  int iStack_4e6c;
  int iStack_4e68;
  int iStack_4e64;
  int iStack_4e60;
  int iStack_4e5c;
  int iStack_4e58;
  int iStack_4e54;
  int iStack_4e50;
  int iStack_4e4c;
  int iStack_4e48;
  int iStack_4e44;
  int local_3740;
  int iStack_373c;
  int iStack_3738;
  int iStack_3734;
  int iStack_3730;
  int iStack_372c;
  int iStack_3728;
  int iStack_3724;
  int iStack_3720;
  int iStack_371c;
  int iStack_3718;
  int iStack_3714;
  int iStack_3710;
  int iStack_370c;
  int iStack_3708;
  int iStack_3704;
  int local_35c0;
  int iStack_35bc;
  int iStack_35b8;
  int iStack_35b4;
  int iStack_35b0;
  int iStack_35ac;
  int iStack_35a8;
  int iStack_35a4;
  int iStack_35a0;
  int iStack_359c;
  int iStack_3598;
  int iStack_3594;
  int iStack_3590;
  int iStack_358c;
  int iStack_3588;
  int iStack_3584;
  int local_3440;
  int iStack_343c;
  int iStack_3438;
  int iStack_3434;
  int iStack_3430;
  int iStack_342c;
  int iStack_3428;
  int iStack_3424;
  int iStack_3420;
  int iStack_341c;
  int iStack_3418;
  int iStack_3414;
  int iStack_3410;
  int iStack_340c;
  int iStack_3408;
  int iStack_3404;
  float local_3320;
  float fStack_331c;
  float fStack_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float fStack_3308;
  float local_3300;
  float fStack_32fc;
  float fStack_32f8;
  float fStack_32f4;
  float fStack_32f0;
  float fStack_32ec;
  float fStack_32e8;
  undefined4 uStack_32e4;
  float local_32a0;
  float fStack_329c;
  float fStack_3298;
  float fStack_3294;
  float fStack_3290;
  float fStack_328c;
  float fStack_3288;
  undefined1 local_3240 [8];
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined1 local_31e0 [16];
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined1 local_31a0 [8];
  float fStack_3198;
  float fStack_3194;
  undefined1 local_3180 [8];
  float fStack_3178;
  float fStack_3174;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  float local_3140;
  float fStack_313c;
  float fStack_3138;
  float fStack_3134;
  float local_30e0;
  float fStack_30dc;
  float fStack_30d8;
  float fStack_30d4;
  float fStack_30d0;
  float fStack_30cc;
  float fStack_30c8;
  float local_3080;
  float fStack_307c;
  float fStack_3078;
  float fStack_3074;
  undefined1 local_2fc0 [8];
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined1 local_2f60 [16];
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined1 local_2f20 [8];
  float fStack_2f18;
  float fStack_2f14;
  undefined1 local_2f00 [8];
  float fStack_2ef8;
  float fStack_2ef4;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2ec0;
  float fStack_2ebc;
  float fStack_2eb8;
  float fStack_2eb4;
  float local_2e60;
  float fStack_2e5c;
  float fStack_2e58;
  float fStack_2e54;
  float fStack_2e50;
  float fStack_2e4c;
  float fStack_2e48;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  undefined1 local_2d60 [8];
  float fStack_2d58;
  float fStack_2d54;
  float fStack_2d50;
  float fStack_2d4c;
  float fStack_2d48;
  undefined4 uStack_2d44;
  undefined1 local_2ce0 [8];
  float fStack_2cd8;
  float fStack_2cd4;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined1 local_2c60 [8];
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  float local_2c40;
  float fStack_2c3c;
  float fStack_2c38;
  float fStack_2c34;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  float local_2be0;
  float fStack_2bdc;
  float fStack_2bd8;
  float fStack_2bd4;
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  float fStack_2bc4;
  float local_2ba0;
  float fStack_2b9c;
  float fStack_2b98;
  float fStack_2b94;
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  float fStack_2b84;
  float local_2aa0;
  float fStack_2a9c;
  float fStack_2a98;
  float fStack_2a94;
  undefined1 local_2a00 [8];
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined4 uStack_29e4;
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined1 local_2900 [8];
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  float fStack_28e4;
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  float local_2880;
  float fStack_287c;
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  float local_2740;
  float fStack_273c;
  float fStack_2738;
  float fStack_2734;
  float local_2040;
  float fStack_203c;
  float fStack_2038;
  float fStack_2034;
  float fStack_2030;
  float fStack_202c;
  float fStack_2028;
  float fStack_2024;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float fStack_2010;
  float fStack_200c;
  float fStack_2008;
  float fStack_2004;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined8 local_a90;
  undefined8 uStack_a88;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  
  local_a5e0 = in_RDX;
  local_a5d8 = in_RSI;
  if (in_R8D == 0x10) {
    local_a5f0 = 0;
    auVar283 = *in_RDI;
    auVar282 = *in_RDI;
    for (; local_a5f0 < in_ECX; local_a5f0 = local_a5f0 + 1) {
      auVar278 = vbroadcastss_avx512f(ZEXT416((uint)*local_a5d8));
      uVar24 = vcmpps_avx512f(auVar282,ZEXT1664(ZEXT816(0)),2);
      auVar55._8_4_ = 0x800000;
      auVar55._12_4_ = 0x800000;
      auVar55._0_4_ = 0x800000;
      auVar55._4_4_ = 0x800000;
      auVar55._16_4_ = 0x800000;
      auVar55._20_4_ = 0x800000;
      auVar55._24_4_ = 0x800000;
      auVar55._28_4_ = 0x800000;
      auVar55._32_4_ = 0x800000;
      auVar55._36_4_ = 0x800000;
      auVar55._40_4_ = 0x800000;
      auVar55._44_4_ = 0x800000;
      auVar55._48_4_ = 0x800000;
      auVar55._52_4_ = 0x800000;
      auVar55._56_4_ = 0x800000;
      auVar55._60_4_ = 0x800000;
      auVar279 = vmaxps_avx512f(auVar283,auVar55);
      auVar280 = vmovdqa64_avx512f(auVar279);
      auVar280 = vpsrld_avx512f(auVar280,ZEXT416(0x17));
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar166._8_4_ = -0x7f800001;
      auVar166._12_4_ = -0x7f800001;
      auVar166._0_4_ = -0x7f800001;
      auVar166._4_4_ = -0x7f800001;
      auVar166._16_4_ = -0x7f800001;
      auVar166._20_4_ = -0x7f800001;
      auVar166._24_4_ = -0x7f800001;
      auVar166._28_4_ = -0x7f800001;
      auVar166._32_4_ = -0x7f800001;
      auVar166._36_4_ = -0x7f800001;
      auVar166._40_4_ = -0x7f800001;
      auVar166._44_4_ = -0x7f800001;
      auVar166._48_4_ = -0x7f800001;
      auVar166._52_4_ = -0x7f800001;
      auVar166._56_4_ = -0x7f800001;
      auVar166._60_4_ = -0x7f800001;
      auVar281 = vmovdqa64_avx512f(auVar166);
      auVar279 = vpandd_avx512f(auVar279,auVar281);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar169._8_4_ = 0.5;
      auVar169._12_4_ = 0.5;
      auVar169._0_4_ = 0.5;
      auVar169._4_4_ = 0.5;
      auVar169._16_4_ = 0.5;
      auVar169._20_4_ = 0.5;
      auVar169._24_4_ = 0.5;
      auVar169._28_4_ = 0.5;
      auVar169._32_4_ = 0.5;
      auVar169._36_4_ = 0.5;
      auVar169._40_4_ = 0.5;
      auVar169._44_4_ = 0.5;
      auVar169._48_4_ = 0.5;
      auVar169._52_4_ = 0.5;
      auVar169._56_4_ = 0.5;
      auVar169._60_4_ = 0.5;
      auVar281 = vmovdqa64_avx512f(auVar169);
      auVar279 = vpord_avx512f(auVar279,auVar281);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar281 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar281 = vmovdqa64_avx512f(auVar281);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar281 = vmovdqa64_avx512f(auVar281);
      auVar280 = vpsubd_avx512f(auVar280,auVar281);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vcvtdq2ps_avx512f(auVar280);
      auVar50._8_4_ = 1.0;
      auVar50._12_4_ = 1.0;
      auVar50._0_4_ = 1.0;
      auVar50._4_4_ = 1.0;
      auVar50._16_4_ = 1.0;
      auVar50._20_4_ = 1.0;
      auVar50._24_4_ = 1.0;
      auVar50._28_4_ = 1.0;
      auVar50._32_4_ = 1.0;
      auVar50._36_4_ = 1.0;
      auVar50._40_4_ = 1.0;
      auVar50._44_4_ = 1.0;
      auVar50._48_4_ = 1.0;
      auVar50._52_4_ = 1.0;
      auVar50._56_4_ = 1.0;
      auVar50._60_4_ = 1.0;
      auVar280 = vaddps_avx512f(auVar280,auVar50);
      uVar25 = vcmpps_avx512f(auVar279,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar28 = (ushort)uVar25;
      auVar51._8_4_ = 1.0;
      auVar51._12_4_ = 1.0;
      auVar51._0_4_ = 1.0;
      auVar51._4_4_ = 1.0;
      auVar51._16_4_ = 1.0;
      auVar51._20_4_ = 1.0;
      auVar51._24_4_ = 1.0;
      auVar51._28_4_ = 1.0;
      auVar51._32_4_ = 1.0;
      auVar51._36_4_ = 1.0;
      auVar51._40_4_ = 1.0;
      auVar51._44_4_ = 1.0;
      auVar51._48_4_ = 1.0;
      auVar51._52_4_ = 1.0;
      auVar51._56_4_ = 1.0;
      auVar51._60_4_ = 1.0;
      auVar281 = vsubps_avx512f(auVar279,auVar51);
      auVar142._8_4_ = 1.0;
      auVar142._12_4_ = 1.0;
      auVar142._0_4_ = 1.0;
      auVar142._4_4_ = 1.0;
      auVar142._16_4_ = 1.0;
      auVar142._20_4_ = 1.0;
      auVar142._24_4_ = 1.0;
      auVar142._28_4_ = 1.0;
      auVar142._32_4_ = 1.0;
      auVar142._36_4_ = 1.0;
      auVar142._40_4_ = 1.0;
      auVar142._44_4_ = 1.0;
      auVar142._48_4_ = 1.0;
      auVar142._52_4_ = 1.0;
      auVar142._56_4_ = 1.0;
      auVar142._60_4_ = 1.0;
      local_5600 = auVar280._0_4_;
      iStack_55fc = auVar280._4_4_;
      iStack_55f8 = auVar280._8_4_;
      iStack_55f4 = auVar280._12_4_;
      iStack_55f0 = auVar280._16_4_;
      iStack_55ec = auVar280._20_4_;
      iStack_55e8 = auVar280._24_4_;
      iStack_55e4 = auVar280._28_4_;
      iStack_55e0 = auVar280._32_4_;
      iStack_55dc = auVar280._36_4_;
      iStack_55d8 = auVar280._40_4_;
      iStack_55d4 = auVar280._44_4_;
      iStack_55d0 = auVar280._48_4_;
      iStack_55cc = auVar280._52_4_;
      iStack_55c8 = auVar280._56_4_;
      iStack_55c4 = auVar280._60_4_;
      auVar280 = vsubps_avx512f(auVar280,auVar142);
      bVar1 = (bool)((byte)uVar25 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar25 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8340._4_4_ = (uint)bVar2 * auVar280._4_4_ | (uint)!bVar2 * iStack_55fc;
      local_8340._0_4_ = (uint)bVar1 * auVar280._0_4_ | (uint)!bVar1 * local_5600;
      local_8340._8_4_ = (uint)bVar3 * auVar280._8_4_ | (uint)!bVar3 * iStack_55f8;
      local_8340._12_4_ = (uint)bVar4 * auVar280._12_4_ | (uint)!bVar4 * iStack_55f4;
      uStack_8330._0_4_ = (uint)bVar5 * auVar280._16_4_ | (uint)!bVar5 * iStack_55f0;
      uStack_8330._4_4_ = (uint)bVar6 * auVar280._20_4_ | (uint)!bVar6 * iStack_55ec;
      uStack_8328._0_4_ = (uint)bVar7 * auVar280._24_4_ | (uint)!bVar7 * iStack_55e8;
      uStack_8328._4_4_ = (uint)bVar8 * auVar280._28_4_ | (uint)!bVar8 * iStack_55e4;
      auVar17 = _local_8340;
      uStack_8320._0_4_ =
           (uint)(bVar9 & 1) * auVar280._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_55e0;
      uStack_8320._4_4_ = (uint)bVar10 * auVar280._36_4_ | (uint)!bVar10 * iStack_55dc;
      auVar271 = _local_8340;
      uStack_8318._0_4_ = (uint)bVar11 * auVar280._40_4_ | (uint)!bVar11 * iStack_55d8;
      uStack_8318._4_4_ = (uint)bVar12 * auVar280._44_4_ | (uint)!bVar12 * iStack_55d4;
      auVar272 = _local_8340;
      uStack_8310._0_4_ = (uint)bVar13 * auVar280._48_4_ | (uint)!bVar13 * iStack_55d0;
      uStack_8310._4_4_ = (uint)bVar14 * auVar280._52_4_ | (uint)!bVar14 * iStack_55cc;
      auVar273 = _local_8340;
      uStack_8308._0_4_ = (uint)bVar15 * auVar280._56_4_ | (uint)!bVar15 * iStack_55c8;
      uStack_8308._4_4_ =
           (uint)(bVar9 >> 7) * auVar280._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_55c4;
      auVar280 = _local_8340;
      local_3740 = auVar281._0_4_;
      iStack_373c = auVar281._4_4_;
      iStack_3738 = auVar281._8_4_;
      iStack_3734 = auVar281._12_4_;
      iStack_3730 = auVar281._16_4_;
      iStack_372c = auVar281._20_4_;
      iStack_3728 = auVar281._24_4_;
      iStack_3724 = auVar281._28_4_;
      iStack_3720 = auVar281._32_4_;
      iStack_371c = auVar281._36_4_;
      iStack_3718 = auVar281._40_4_;
      iStack_3714 = auVar281._44_4_;
      iStack_3710 = auVar281._48_4_;
      iStack_370c = auVar281._52_4_;
      iStack_3708 = auVar281._56_4_;
      iStack_3704 = auVar281._60_4_;
      auVar279 = vaddps_avx512f(auVar281,auVar279);
      bVar1 = (bool)((byte)uVar25 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8240._4_4_ = (uint)bVar2 * auVar279._4_4_ | (uint)!bVar2 * iStack_373c;
      local_8240._0_4_ = (uint)bVar1 * auVar279._0_4_ | (uint)!bVar1 * local_3740;
      local_8240._8_4_ = (uint)bVar3 * auVar279._8_4_ | (uint)!bVar3 * iStack_3738;
      local_8240._12_4_ = (uint)bVar4 * auVar279._12_4_ | (uint)!bVar4 * iStack_3734;
      uStack_8230._0_4_ = (uint)bVar5 * auVar279._16_4_ | (uint)!bVar5 * iStack_3730;
      uStack_8230._4_4_ = (uint)bVar6 * auVar279._20_4_ | (uint)!bVar6 * iStack_372c;
      uStack_8228._0_4_ = (uint)bVar7 * auVar279._24_4_ | (uint)!bVar7 * iStack_3728;
      uStack_8228._4_4_ = (uint)bVar8 * auVar279._28_4_ | (uint)!bVar8 * iStack_3724;
      auVar286 = _local_8240;
      uStack_8220._0_4_ =
           (uint)(bVar9 & 1) * auVar279._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_3720;
      uStack_8220._4_4_ = (uint)bVar10 * auVar279._36_4_ | (uint)!bVar10 * iStack_371c;
      auVar274 = _local_8240;
      uStack_8218._0_4_ = (uint)bVar11 * auVar279._40_4_ | (uint)!bVar11 * iStack_3718;
      uStack_8218._4_4_ = (uint)bVar12 * auVar279._44_4_ | (uint)!bVar12 * iStack_3714;
      auVar275 = _local_8240;
      uStack_8210._0_4_ = (uint)bVar13 * auVar279._48_4_ | (uint)!bVar13 * iStack_3710;
      uStack_8210._4_4_ = (uint)bVar14 * auVar279._52_4_ | (uint)!bVar14 * iStack_370c;
      auVar276 = _local_8240;
      uStack_8208._0_4_ = (uint)bVar15 * auVar279._56_4_ | (uint)!bVar15 * iStack_3708;
      uStack_8208._4_4_ =
           (uint)(bVar9 >> 7) * auVar279._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_3704;
      auVar279 = _local_8240;
      uStack_8228 = auVar286._24_8_;
      uStack_8220 = auVar274._32_8_;
      uStack_8218 = auVar275._40_8_;
      uStack_8210 = auVar276._48_8_;
      uStack_8208 = auVar279._56_8_;
      auVar54._16_8_ = uStack_8230;
      auVar54._0_16_ = local_8240;
      auVar54._24_8_ = uStack_8228;
      auVar54._32_8_ = uStack_8220;
      auVar54._40_8_ = uStack_8218;
      auVar54._48_8_ = uStack_8210;
      auVar54._56_8_ = uStack_8208;
      auVar53._16_8_ = uStack_8230;
      auVar53._0_16_ = local_8240;
      auVar53._24_8_ = uStack_8228;
      auVar53._32_8_ = uStack_8220;
      auVar53._40_8_ = uStack_8218;
      auVar53._48_8_ = uStack_8210;
      auVar53._56_8_ = uStack_8208;
      auVar279 = vmulps_avx512f(auVar54,auVar53);
      local_8440._8_4_ = 0.070376836;
      local_8440._12_4_ = 0.070376836;
      local_8440._0_4_ = 0.070376836;
      local_8440._4_4_ = 0.070376836;
      auVar76._16_4_ = 0.070376836;
      auVar76._20_4_ = 0.070376836;
      auVar76._0_16_ = local_8440._0_16_;
      auVar76._24_4_ = 0.070376836;
      auVar76._28_4_ = 0.070376836;
      auVar76._32_4_ = 0.070376836;
      auVar76._36_4_ = 0.070376836;
      auVar76._40_4_ = 0.070376836;
      auVar76._44_4_ = 0.070376836;
      auVar76._48_4_ = 0.070376836;
      auVar76._52_4_ = 0.070376836;
      auVar76._56_4_ = 0.070376836;
      auVar76._60_4_ = 0.070376836;
      auVar75._16_8_ = uStack_8230;
      auVar75._0_16_ = local_8240;
      auVar75._24_8_ = uStack_8228;
      auVar75._32_8_ = uStack_8220;
      auVar75._40_8_ = uStack_8218;
      auVar75._48_8_ = uStack_8210;
      auVar75._56_8_ = uStack_8208;
      auVar74._8_4_ = -0.1151461;
      auVar74._12_4_ = -0.1151461;
      auVar74._0_4_ = -0.1151461;
      auVar74._4_4_ = -0.1151461;
      auVar74._16_4_ = -0.1151461;
      auVar74._20_4_ = -0.1151461;
      auVar74._24_4_ = -0.1151461;
      auVar74._28_4_ = -0.1151461;
      auVar74._32_4_ = -0.1151461;
      auVar74._36_4_ = -0.1151461;
      auVar74._40_4_ = -0.1151461;
      auVar74._44_4_ = -0.1151461;
      auVar74._48_4_ = -0.1151461;
      auVar74._52_4_ = -0.1151461;
      auVar74._56_4_ = -0.1151461;
      auVar74._60_4_ = -0.1151461;
      auVar281 = vfmadd213ps_avx512f(auVar75,auVar76,auVar74);
      auVar73._16_8_ = uStack_8230;
      auVar73._0_16_ = local_8240;
      auVar73._24_8_ = uStack_8228;
      auVar73._32_8_ = uStack_8220;
      auVar73._40_8_ = uStack_8218;
      auVar73._48_8_ = uStack_8210;
      auVar73._56_8_ = uStack_8208;
      auVar72._8_4_ = 0.116769984;
      auVar72._12_4_ = 0.116769984;
      auVar72._0_4_ = 0.116769984;
      auVar72._4_4_ = 0.116769984;
      auVar72._16_4_ = 0.116769984;
      auVar72._20_4_ = 0.116769984;
      auVar72._24_4_ = 0.116769984;
      auVar72._28_4_ = 0.116769984;
      auVar72._32_4_ = 0.116769984;
      auVar72._36_4_ = 0.116769984;
      auVar72._40_4_ = 0.116769984;
      auVar72._44_4_ = 0.116769984;
      auVar72._48_4_ = 0.116769984;
      auVar72._52_4_ = 0.116769984;
      auVar72._56_4_ = 0.116769984;
      auVar72._60_4_ = 0.116769984;
      auVar281 = vfmadd213ps_avx512f(auVar73,auVar281,auVar72);
      auVar71._16_8_ = uStack_8230;
      auVar71._0_16_ = local_8240;
      auVar71._24_8_ = uStack_8228;
      auVar71._32_8_ = uStack_8220;
      auVar71._40_8_ = uStack_8218;
      auVar71._48_8_ = uStack_8210;
      auVar71._56_8_ = uStack_8208;
      auVar70._8_4_ = -0.12420141;
      auVar70._12_4_ = -0.12420141;
      auVar70._0_4_ = -0.12420141;
      auVar70._4_4_ = -0.12420141;
      auVar70._16_4_ = -0.12420141;
      auVar70._20_4_ = -0.12420141;
      auVar70._24_4_ = -0.12420141;
      auVar70._28_4_ = -0.12420141;
      auVar70._32_4_ = -0.12420141;
      auVar70._36_4_ = -0.12420141;
      auVar70._40_4_ = -0.12420141;
      auVar70._44_4_ = -0.12420141;
      auVar70._48_4_ = -0.12420141;
      auVar70._52_4_ = -0.12420141;
      auVar70._56_4_ = -0.12420141;
      auVar70._60_4_ = -0.12420141;
      auVar281 = vfmadd213ps_avx512f(auVar71,auVar281,auVar70);
      auVar69._16_8_ = uStack_8230;
      auVar69._0_16_ = local_8240;
      auVar69._24_8_ = uStack_8228;
      auVar69._32_8_ = uStack_8220;
      auVar69._40_8_ = uStack_8218;
      auVar69._48_8_ = uStack_8210;
      auVar69._56_8_ = uStack_8208;
      auVar68._8_4_ = 0.14249323;
      auVar68._12_4_ = 0.14249323;
      auVar68._0_4_ = 0.14249323;
      auVar68._4_4_ = 0.14249323;
      auVar68._16_4_ = 0.14249323;
      auVar68._20_4_ = 0.14249323;
      auVar68._24_4_ = 0.14249323;
      auVar68._28_4_ = 0.14249323;
      auVar68._32_4_ = 0.14249323;
      auVar68._36_4_ = 0.14249323;
      auVar68._40_4_ = 0.14249323;
      auVar68._44_4_ = 0.14249323;
      auVar68._48_4_ = 0.14249323;
      auVar68._52_4_ = 0.14249323;
      auVar68._56_4_ = 0.14249323;
      auVar68._60_4_ = 0.14249323;
      auVar281 = vfmadd213ps_avx512f(auVar69,auVar281,auVar68);
      auVar67._16_8_ = uStack_8230;
      auVar67._0_16_ = local_8240;
      auVar67._24_8_ = uStack_8228;
      auVar67._32_8_ = uStack_8220;
      auVar67._40_8_ = uStack_8218;
      auVar67._48_8_ = uStack_8210;
      auVar67._56_8_ = uStack_8208;
      auVar66._8_4_ = -0.16668057;
      auVar66._12_4_ = -0.16668057;
      auVar66._0_4_ = -0.16668057;
      auVar66._4_4_ = -0.16668057;
      auVar66._16_4_ = -0.16668057;
      auVar66._20_4_ = -0.16668057;
      auVar66._24_4_ = -0.16668057;
      auVar66._28_4_ = -0.16668057;
      auVar66._32_4_ = -0.16668057;
      auVar66._36_4_ = -0.16668057;
      auVar66._40_4_ = -0.16668057;
      auVar66._44_4_ = -0.16668057;
      auVar66._48_4_ = -0.16668057;
      auVar66._52_4_ = -0.16668057;
      auVar66._56_4_ = -0.16668057;
      auVar66._60_4_ = -0.16668057;
      auVar281 = vfmadd213ps_avx512f(auVar67,auVar281,auVar66);
      auVar65._16_8_ = uStack_8230;
      auVar65._0_16_ = local_8240;
      auVar65._24_8_ = uStack_8228;
      auVar65._32_8_ = uStack_8220;
      auVar65._40_8_ = uStack_8218;
      auVar65._48_8_ = uStack_8210;
      auVar65._56_8_ = uStack_8208;
      auVar64._8_4_ = 0.20000714;
      auVar64._12_4_ = 0.20000714;
      auVar64._0_4_ = 0.20000714;
      auVar64._4_4_ = 0.20000714;
      auVar64._16_4_ = 0.20000714;
      auVar64._20_4_ = 0.20000714;
      auVar64._24_4_ = 0.20000714;
      auVar64._28_4_ = 0.20000714;
      auVar64._32_4_ = 0.20000714;
      auVar64._36_4_ = 0.20000714;
      auVar64._40_4_ = 0.20000714;
      auVar64._44_4_ = 0.20000714;
      auVar64._48_4_ = 0.20000714;
      auVar64._52_4_ = 0.20000714;
      auVar64._56_4_ = 0.20000714;
      auVar64._60_4_ = 0.20000714;
      auVar281 = vfmadd213ps_avx512f(auVar65,auVar281,auVar64);
      auVar63._16_8_ = uStack_8230;
      auVar63._0_16_ = local_8240;
      auVar63._24_8_ = uStack_8228;
      auVar63._32_8_ = uStack_8220;
      auVar63._40_8_ = uStack_8218;
      auVar63._48_8_ = uStack_8210;
      auVar63._56_8_ = uStack_8208;
      auVar62._8_4_ = -0.24999994;
      auVar62._12_4_ = -0.24999994;
      auVar62._0_4_ = -0.24999994;
      auVar62._4_4_ = -0.24999994;
      auVar62._16_4_ = -0.24999994;
      auVar62._20_4_ = -0.24999994;
      auVar62._24_4_ = -0.24999994;
      auVar62._28_4_ = -0.24999994;
      auVar62._32_4_ = -0.24999994;
      auVar62._36_4_ = -0.24999994;
      auVar62._40_4_ = -0.24999994;
      auVar62._44_4_ = -0.24999994;
      auVar62._48_4_ = -0.24999994;
      auVar62._52_4_ = -0.24999994;
      auVar62._56_4_ = -0.24999994;
      auVar62._60_4_ = -0.24999994;
      auVar281 = vfmadd213ps_avx512f(auVar63,auVar281,auVar62);
      auVar61._16_8_ = uStack_8230;
      auVar61._0_16_ = local_8240;
      auVar61._24_8_ = uStack_8228;
      auVar61._32_8_ = uStack_8220;
      auVar61._40_8_ = uStack_8218;
      auVar61._48_8_ = uStack_8210;
      auVar61._56_8_ = uStack_8208;
      auVar60._8_4_ = 0.3333333;
      auVar60._12_4_ = 0.3333333;
      auVar60._0_4_ = 0.3333333;
      auVar60._4_4_ = 0.3333333;
      auVar60._16_4_ = 0.3333333;
      auVar60._20_4_ = 0.3333333;
      auVar60._24_4_ = 0.3333333;
      auVar60._28_4_ = 0.3333333;
      auVar60._32_4_ = 0.3333333;
      auVar60._36_4_ = 0.3333333;
      auVar60._40_4_ = 0.3333333;
      auVar60._44_4_ = 0.3333333;
      auVar60._48_4_ = 0.3333333;
      auVar60._52_4_ = 0.3333333;
      auVar60._56_4_ = 0.3333333;
      auVar60._60_4_ = 0.3333333;
      auVar281 = vfmadd213ps_avx512f(auVar61,auVar281,auVar60);
      auVar52._16_8_ = uStack_8230;
      auVar52._0_16_ = local_8240;
      auVar52._24_8_ = uStack_8228;
      auVar52._32_8_ = uStack_8220;
      auVar52._40_8_ = uStack_8218;
      auVar52._48_8_ = uStack_8210;
      auVar52._56_8_ = uStack_8208;
      auVar281 = vmulps_avx512f(auVar281,auVar52);
      auVar281 = vmulps_avx512f(auVar281,auVar279);
      uStack_8328 = auVar17._24_8_;
      uStack_8320 = auVar271._32_8_;
      uStack_8318 = auVar272._40_8_;
      uStack_8310 = auVar273._48_8_;
      uStack_8308 = auVar280._56_8_;
      auVar59._16_8_ = uStack_8330;
      auVar59._0_16_ = local_8340;
      auVar59._24_8_ = uStack_8328;
      auVar59._32_8_ = uStack_8320;
      auVar59._40_8_ = uStack_8318;
      auVar59._48_8_ = uStack_8310;
      auVar59._56_8_ = uStack_8308;
      auVar58._8_4_ = -0.00021219444;
      auVar58._12_4_ = -0.00021219444;
      auVar58._0_4_ = -0.00021219444;
      auVar58._4_4_ = -0.00021219444;
      auVar58._16_4_ = -0.00021219444;
      auVar58._20_4_ = -0.00021219444;
      auVar58._24_4_ = -0.00021219444;
      auVar58._28_4_ = -0.00021219444;
      auVar58._32_4_ = -0.00021219444;
      auVar58._36_4_ = -0.00021219444;
      auVar58._40_4_ = -0.00021219444;
      auVar58._44_4_ = -0.00021219444;
      auVar58._48_4_ = -0.00021219444;
      auVar58._52_4_ = -0.00021219444;
      auVar58._56_4_ = -0.00021219444;
      auVar58._60_4_ = -0.00021219444;
      auVar280 = vfmadd213ps_avx512f(auVar58,auVar59,auVar281);
      auVar148._8_4_ = 0.5;
      auVar148._12_4_ = 0.5;
      auVar148._0_4_ = 0.5;
      auVar148._4_4_ = 0.5;
      auVar148._16_4_ = 0.5;
      auVar148._20_4_ = 0.5;
      auVar148._24_4_ = 0.5;
      auVar148._28_4_ = 0.5;
      auVar148._32_4_ = 0.5;
      auVar148._36_4_ = 0.5;
      auVar148._40_4_ = 0.5;
      auVar148._44_4_ = 0.5;
      auVar148._48_4_ = 0.5;
      auVar148._52_4_ = 0.5;
      auVar148._56_4_ = 0.5;
      auVar148._60_4_ = 0.5;
      auVar280 = vfnmadd213ps_avx512f(auVar148,auVar279,auVar280);
      auVar49._16_8_ = uStack_8230;
      auVar49._0_16_ = local_8240;
      auVar49._24_8_ = uStack_8228;
      auVar49._32_8_ = uStack_8220;
      auVar49._40_8_ = uStack_8218;
      auVar49._48_8_ = uStack_8210;
      auVar49._56_8_ = uStack_8208;
      auVar280 = vaddps_avx512f(auVar49,auVar280);
      auVar57._16_8_ = uStack_8330;
      auVar57._0_16_ = local_8340;
      auVar57._24_8_ = uStack_8328;
      auVar57._32_8_ = uStack_8320;
      auVar57._40_8_ = uStack_8318;
      auVar57._48_8_ = uStack_8310;
      auVar57._56_8_ = uStack_8308;
      auVar56._8_4_ = 0.6933594;
      auVar56._12_4_ = 0.6933594;
      auVar56._0_4_ = 0.6933594;
      auVar56._4_4_ = 0.6933594;
      auVar56._16_4_ = 0.6933594;
      auVar56._20_4_ = 0.6933594;
      auVar56._24_4_ = 0.6933594;
      auVar56._28_4_ = 0.6933594;
      auVar56._32_4_ = 0.6933594;
      auVar56._36_4_ = 0.6933594;
      auVar56._40_4_ = 0.6933594;
      auVar56._44_4_ = 0.6933594;
      auVar56._48_4_ = 0.6933594;
      auVar56._52_4_ = 0.6933594;
      auVar56._56_4_ = 0.6933594;
      auVar56._60_4_ = 0.6933594;
      auVar279 = vfmadd213ps_avx512f(auVar56,auVar57,auVar280);
      auVar280 = vpmovm2d_avx512dq(uVar24 & 0xffff);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vpord_avx512f(auVar279,auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmulps_avx512f(auVar278,auVar280);
      auVar281._8_4_ = 88.37626;
      auVar281._12_4_ = 88.37626;
      auVar281._0_4_ = 88.37626;
      auVar281._4_4_ = 88.37626;
      auVar281._16_4_ = 88.37626;
      auVar281._20_4_ = 88.37626;
      auVar281._24_4_ = 88.37626;
      auVar281._28_4_ = 88.37626;
      auVar281._32_4_ = 88.37626;
      auVar281._36_4_ = 88.37626;
      auVar281._40_4_ = 88.37626;
      auVar281._44_4_ = 88.37626;
      auVar281._48_4_ = 88.37626;
      auVar281._52_4_ = 88.37626;
      auVar281._56_4_ = 88.37626;
      auVar281._60_4_ = 88.37626;
      auVar280 = vminps_avx512f(auVar280,auVar281);
      auVar279._8_4_ = -88.37626;
      auVar279._12_4_ = -88.37626;
      auVar279._0_4_ = -88.37626;
      auVar279._4_4_ = -88.37626;
      auVar279._16_4_ = -88.37626;
      auVar279._20_4_ = -88.37626;
      auVar279._24_4_ = -88.37626;
      auVar279._28_4_ = -88.37626;
      auVar279._32_4_ = -88.37626;
      auVar279._36_4_ = -88.37626;
      auVar279._40_4_ = -88.37626;
      auVar279._44_4_ = -88.37626;
      auVar279._48_4_ = -88.37626;
      auVar279._52_4_ = -88.37626;
      auVar279._56_4_ = -88.37626;
      auVar279._60_4_ = -88.37626;
      auVar279 = vmaxps_avx512f(auVar280,auVar279);
      auVar125._8_4_ = 1.442695;
      auVar125._12_4_ = 1.442695;
      auVar125._0_4_ = 1.442695;
      auVar125._4_4_ = 1.442695;
      auVar125._16_4_ = 1.442695;
      auVar125._20_4_ = 1.442695;
      auVar125._24_4_ = 1.442695;
      auVar125._28_4_ = 1.442695;
      auVar125._32_4_ = 1.442695;
      auVar125._36_4_ = 1.442695;
      auVar125._40_4_ = 1.442695;
      auVar125._44_4_ = 1.442695;
      auVar125._48_4_ = 1.442695;
      auVar125._52_4_ = 1.442695;
      auVar125._56_4_ = 1.442695;
      auVar125._60_4_ = 1.442695;
      auVar124._8_4_ = 0.5;
      auVar124._12_4_ = 0.5;
      auVar124._0_4_ = 0.5;
      auVar124._4_4_ = 0.5;
      auVar124._16_4_ = 0.5;
      auVar124._20_4_ = 0.5;
      auVar124._24_4_ = 0.5;
      auVar124._28_4_ = 0.5;
      auVar124._32_4_ = 0.5;
      auVar124._36_4_ = 0.5;
      auVar124._40_4_ = 0.5;
      auVar124._44_4_ = 0.5;
      auVar124._48_4_ = 0.5;
      auVar124._52_4_ = 0.5;
      auVar124._56_4_ = 0.5;
      auVar124._60_4_ = 0.5;
      auVar280 = vfmadd213ps_avx512f(auVar125,auVar279,auVar124);
      auVar281 = vrndscaleps_avx512f(auVar280,1);
      uVar25 = vcmpps_avx512f(auVar280,auVar281,1);
      uVar28 = (ushort)uVar25;
      auVar145._8_4_ = 1.0;
      auVar145._12_4_ = 1.0;
      auVar145._0_4_ = 1.0;
      auVar145._4_4_ = 1.0;
      auVar145._16_4_ = 1.0;
      auVar145._20_4_ = 1.0;
      auVar145._24_4_ = 1.0;
      auVar145._28_4_ = 1.0;
      auVar145._32_4_ = 1.0;
      auVar145._36_4_ = 1.0;
      auVar145._40_4_ = 1.0;
      auVar145._44_4_ = 1.0;
      auVar145._48_4_ = 1.0;
      auVar145._52_4_ = 1.0;
      auVar145._56_4_ = 1.0;
      auVar145._60_4_ = 1.0;
      local_5180 = auVar281._0_4_;
      iStack_517c = auVar281._4_4_;
      iStack_5178 = auVar281._8_4_;
      iStack_5174 = auVar281._12_4_;
      iStack_5170 = auVar281._16_4_;
      iStack_516c = auVar281._20_4_;
      iStack_5168 = auVar281._24_4_;
      iStack_5164 = auVar281._28_4_;
      iStack_5160 = auVar281._32_4_;
      iStack_515c = auVar281._36_4_;
      iStack_5158 = auVar281._40_4_;
      iStack_5154 = auVar281._44_4_;
      iStack_5150 = auVar281._48_4_;
      iStack_514c = auVar281._52_4_;
      iStack_5148 = auVar281._56_4_;
      iStack_5144 = auVar281._60_4_;
      auVar280 = vsubps_avx512f(auVar281,auVar145);
      bVar1 = (bool)((byte)uVar25 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar25 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_9300._4_4_ = (uint)bVar2 * auVar280._4_4_ | (uint)!bVar2 * iStack_517c;
      local_9300._0_4_ = (uint)bVar1 * auVar280._0_4_ | (uint)!bVar1 * local_5180;
      local_9300._8_4_ = (uint)bVar3 * auVar280._8_4_ | (uint)!bVar3 * iStack_5178;
      local_9300._12_4_ = (uint)bVar4 * auVar280._12_4_ | (uint)!bVar4 * iStack_5174;
      uStack_92f0._0_4_ = (uint)bVar5 * auVar280._16_4_ | (uint)!bVar5 * iStack_5170;
      uStack_92f0._4_4_ = (uint)bVar6 * auVar280._20_4_ | (uint)!bVar6 * iStack_516c;
      uStack_92e8._0_4_ = (uint)bVar7 * auVar280._24_4_ | (uint)!bVar7 * iStack_5168;
      uStack_92e8._4_4_ = (uint)bVar8 * auVar280._28_4_ | (uint)!bVar8 * iStack_5164;
      auVar17 = _local_9300;
      uStack_92e0._0_4_ =
           (uint)(bVar9 & 1) * auVar280._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5160;
      uStack_92e0._4_4_ = (uint)bVar10 * auVar280._36_4_ | (uint)!bVar10 * iStack_515c;
      auVar271 = _local_9300;
      uStack_92d8._0_4_ = (uint)bVar11 * auVar280._40_4_ | (uint)!bVar11 * iStack_5158;
      uStack_92d8._4_4_ = (uint)bVar12 * auVar280._44_4_ | (uint)!bVar12 * iStack_5154;
      auVar272 = _local_9300;
      uStack_92d0._0_4_ = (uint)bVar13 * auVar280._48_4_ | (uint)!bVar13 * iStack_5150;
      uStack_92d0._4_4_ = (uint)bVar14 * auVar280._52_4_ | (uint)!bVar14 * iStack_514c;
      auVar273 = _local_9300;
      uStack_92c8._0_4_ = (uint)bVar15 * auVar280._56_4_ | (uint)!bVar15 * iStack_5148;
      uStack_92c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar280._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5144;
      auVar280 = _local_9300;
      uStack_92e8 = auVar17._24_8_;
      uStack_92e0 = auVar271._32_8_;
      uStack_92d8 = auVar272._40_8_;
      uStack_92d0 = auVar273._48_8_;
      uStack_92c8 = auVar280._56_8_;
      auVar154._16_8_ = uStack_92f0;
      auVar154._0_16_ = local_9300;
      auVar154._24_8_ = uStack_92e8;
      auVar154._32_8_ = uStack_92e0;
      auVar154._40_8_ = uStack_92d8;
      auVar154._48_8_ = uStack_92d0;
      auVar154._56_8_ = uStack_92c8;
      auVar153._8_4_ = 0.6933594;
      auVar153._12_4_ = 0.6933594;
      auVar153._0_4_ = 0.6933594;
      auVar153._4_4_ = 0.6933594;
      auVar153._16_4_ = 0.6933594;
      auVar153._20_4_ = 0.6933594;
      auVar153._24_4_ = 0.6933594;
      auVar153._28_4_ = 0.6933594;
      auVar153._32_4_ = 0.6933594;
      auVar153._36_4_ = 0.6933594;
      auVar153._40_4_ = 0.6933594;
      auVar153._44_4_ = 0.6933594;
      auVar153._48_4_ = 0.6933594;
      auVar153._52_4_ = 0.6933594;
      auVar153._56_4_ = 0.6933594;
      auVar153._60_4_ = 0.6933594;
      auVar280 = vfnmadd213ps_avx512f(auVar153,auVar154,auVar279);
      auVar152._16_8_ = uStack_92f0;
      auVar152._0_16_ = local_9300;
      auVar152._24_8_ = uStack_92e8;
      auVar152._32_8_ = uStack_92e0;
      auVar152._40_8_ = uStack_92d8;
      auVar152._48_8_ = uStack_92d0;
      auVar152._56_8_ = uStack_92c8;
      auVar151._8_4_ = -0.00021219444;
      auVar151._12_4_ = -0.00021219444;
      auVar151._0_4_ = -0.00021219444;
      auVar151._4_4_ = -0.00021219444;
      auVar151._16_4_ = -0.00021219444;
      auVar151._20_4_ = -0.00021219444;
      auVar151._24_4_ = -0.00021219444;
      auVar151._28_4_ = -0.00021219444;
      auVar151._32_4_ = -0.00021219444;
      auVar151._36_4_ = -0.00021219444;
      auVar151._40_4_ = -0.00021219444;
      auVar151._44_4_ = -0.00021219444;
      auVar151._48_4_ = -0.00021219444;
      auVar151._52_4_ = -0.00021219444;
      auVar151._56_4_ = -0.00021219444;
      auVar151._60_4_ = -0.00021219444;
      auVar280 = vfnmadd213ps_avx512f(auVar151,auVar152,auVar280);
      auVar279 = vmulps_avx512f(auVar280,auVar280);
      uStack_93f8._0_4_ = 0.00019875691;
      uStack_93f8._4_4_ = 0.00019875691;
      local_9400._0_4_ = 0.00019875691;
      local_9400._4_4_ = 0.00019875691;
      auVar123._16_4_ = 0.00019875691;
      auVar123._20_4_ = 0.00019875691;
      auVar123._0_16_ = _local_9400;
      auVar123._24_4_ = 0.00019875691;
      auVar123._28_4_ = 0.00019875691;
      auVar123._32_4_ = 0.00019875691;
      auVar123._36_4_ = 0.00019875691;
      auVar123._40_4_ = 0.00019875691;
      auVar123._44_4_ = 0.00019875691;
      auVar123._48_4_ = 0.00019875691;
      auVar123._52_4_ = 0.00019875691;
      auVar123._56_4_ = 0.00019875691;
      auVar123._60_4_ = 0.00019875691;
      auVar122._8_4_ = 0.0013981999;
      auVar122._12_4_ = 0.0013981999;
      auVar122._0_4_ = 0.0013981999;
      auVar122._4_4_ = 0.0013981999;
      auVar122._16_4_ = 0.0013981999;
      auVar122._20_4_ = 0.0013981999;
      auVar122._24_4_ = 0.0013981999;
      auVar122._28_4_ = 0.0013981999;
      auVar122._32_4_ = 0.0013981999;
      auVar122._36_4_ = 0.0013981999;
      auVar122._40_4_ = 0.0013981999;
      auVar122._44_4_ = 0.0013981999;
      auVar122._48_4_ = 0.0013981999;
      auVar122._52_4_ = 0.0013981999;
      auVar122._56_4_ = 0.0013981999;
      auVar122._60_4_ = 0.0013981999;
      auVar281 = vfmadd213ps_avx512f(auVar280,auVar123,auVar122);
      auVar121._8_4_ = 0.008333452;
      auVar121._12_4_ = 0.008333452;
      auVar121._0_4_ = 0.008333452;
      auVar121._4_4_ = 0.008333452;
      auVar121._16_4_ = 0.008333452;
      auVar121._20_4_ = 0.008333452;
      auVar121._24_4_ = 0.008333452;
      auVar121._28_4_ = 0.008333452;
      auVar121._32_4_ = 0.008333452;
      auVar121._36_4_ = 0.008333452;
      auVar121._40_4_ = 0.008333452;
      auVar121._44_4_ = 0.008333452;
      auVar121._48_4_ = 0.008333452;
      auVar121._52_4_ = 0.008333452;
      auVar121._56_4_ = 0.008333452;
      auVar121._60_4_ = 0.008333452;
      auVar281 = vfmadd213ps_avx512f(auVar280,auVar281,auVar121);
      auVar120._8_4_ = 0.041665796;
      auVar120._12_4_ = 0.041665796;
      auVar120._0_4_ = 0.041665796;
      auVar120._4_4_ = 0.041665796;
      auVar120._16_4_ = 0.041665796;
      auVar120._20_4_ = 0.041665796;
      auVar120._24_4_ = 0.041665796;
      auVar120._28_4_ = 0.041665796;
      auVar120._32_4_ = 0.041665796;
      auVar120._36_4_ = 0.041665796;
      auVar120._40_4_ = 0.041665796;
      auVar120._44_4_ = 0.041665796;
      auVar120._48_4_ = 0.041665796;
      auVar120._52_4_ = 0.041665796;
      auVar120._56_4_ = 0.041665796;
      auVar120._60_4_ = 0.041665796;
      auVar281 = vfmadd213ps_avx512f(auVar280,auVar281,auVar120);
      auVar119._8_4_ = 0.16666666;
      auVar119._12_4_ = 0.16666666;
      auVar119._0_4_ = 0.16666666;
      auVar119._4_4_ = 0.16666666;
      auVar119._16_4_ = 0.16666666;
      auVar119._20_4_ = 0.16666666;
      auVar119._24_4_ = 0.16666666;
      auVar119._28_4_ = 0.16666666;
      auVar119._32_4_ = 0.16666666;
      auVar119._36_4_ = 0.16666666;
      auVar119._40_4_ = 0.16666666;
      auVar119._44_4_ = 0.16666666;
      auVar119._48_4_ = 0.16666666;
      auVar119._52_4_ = 0.16666666;
      auVar119._56_4_ = 0.16666666;
      auVar119._60_4_ = 0.16666666;
      auVar281 = vfmadd213ps_avx512f(auVar280,auVar281,auVar119);
      auVar278._8_4_ = 0.5;
      auVar278._12_4_ = 0.5;
      auVar278._0_4_ = 0.5;
      auVar278._4_4_ = 0.5;
      auVar278._16_4_ = 0.5;
      auVar278._20_4_ = 0.5;
      auVar278._24_4_ = 0.5;
      auVar278._28_4_ = 0.5;
      auVar278._32_4_ = 0.5;
      auVar278._36_4_ = 0.5;
      auVar278._40_4_ = 0.5;
      auVar278._44_4_ = 0.5;
      auVar278._48_4_ = 0.5;
      auVar278._52_4_ = 0.5;
      auVar278._56_4_ = 0.5;
      auVar278._60_4_ = 0.5;
      auVar281 = vfmadd213ps_avx512f(auVar280,auVar281,auVar278);
      auVar279 = vfmadd213ps_avx512f(auVar279,auVar281,auVar280);
      auVar280._8_4_ = 1.0;
      auVar280._12_4_ = 1.0;
      auVar280._0_4_ = 1.0;
      auVar280._4_4_ = 1.0;
      auVar280._16_4_ = 1.0;
      auVar280._20_4_ = 1.0;
      auVar280._24_4_ = 1.0;
      auVar280._28_4_ = 1.0;
      auVar280._32_4_ = 1.0;
      auVar280._36_4_ = 1.0;
      auVar280._40_4_ = 1.0;
      auVar280._44_4_ = 1.0;
      auVar280._48_4_ = 1.0;
      auVar280._52_4_ = 1.0;
      auVar280._56_4_ = 1.0;
      auVar280._60_4_ = 1.0;
      auVar281 = vaddps_avx512f(auVar279,auVar280);
      auVar163._16_8_ = uStack_92f0;
      auVar163._0_16_ = local_9300;
      auVar163._24_8_ = uStack_92e8;
      auVar163._32_8_ = uStack_92e0;
      auVar163._40_8_ = uStack_92d8;
      auVar163._48_8_ = uStack_92d0;
      auVar163._56_8_ = uStack_92c8;
      auVar280 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar280);
      auVar280 = vcvttps2dq_avx512f(auVar163);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar279 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar280 = vpaddd_avx512f(auVar280,auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vpslld_avx512f(auVar280,ZEXT416(0x17));
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmulps_avx512f(auVar281,auVar280);
      local_9400 = auVar280._0_8_;
      uStack_93f8 = auVar280._8_8_;
      uStack_93f0 = auVar280._16_8_;
      uStack_93e8 = auVar280._24_8_;
      uStack_93e0 = auVar280._32_8_;
      uStack_93d8 = auVar280._40_8_;
      uStack_93d0 = auVar280._48_8_;
      uStack_93c8 = auVar280._56_8_;
      *local_a5e0 = local_9400;
      local_a5e0[1] = uStack_93f8;
      local_a5e0[2] = uStack_93f0;
      local_a5e0[3] = uStack_93e8;
      local_a5e0[4] = uStack_93e0;
      local_a5e0[5] = uStack_93d8;
      local_a5e0[6] = uStack_93d0;
      local_a5e0[7] = uStack_93c8;
      local_a5d8 = local_a5d8 + 1;
      local_a5e0 = local_a5e0 + 8;
    }
  }
  if (in_R8D == 8) {
    local_a6c4 = 0;
    auVar286 = *(undefined1 (*) [32])*in_RDI;
    auVar17 = *(undefined1 (*) [32])*in_RDI;
    auVar282 = vinsertf64x4_avx512f
                         (ZEXT3264(*(undefined1 (*) [32])*in_RDI),*(undefined1 (*) [32])*in_RDI,1);
    for (; local_a6c4 + 1 < in_ECX; local_a6c4 = local_a6c4 + 2) {
      fVar284 = *local_a5d8;
      auVar18 = vinsertps_avx(ZEXT416((uint)fVar284),ZEXT416((uint)fVar284),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar284),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar284),0x30);
      auVar19 = vinsertps_avx(ZEXT416((uint)fVar284),ZEXT416((uint)fVar284),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar284),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar284),0x30);
      uStack_a190 = auVar19._0_8_;
      uStack_a188 = auVar19._8_8_;
      fVar284 = local_a5d8[1];
      auVar19 = vinsertps_avx(ZEXT416((uint)fVar284),ZEXT416((uint)fVar284),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar284),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar284),0x30);
      auVar20 = vinsertps_avx(ZEXT416((uint)fVar284),ZEXT416((uint)fVar284),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)fVar284),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)fVar284),0x30);
      uStack_a150 = auVar20._0_8_;
      uStack_a148 = auVar20._8_8_;
      auVar16._16_8_ = uStack_a150;
      auVar16._0_16_ = auVar19;
      auVar16._24_8_ = uStack_a148;
      auVar281 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_a188,CONCAT816(uStack_a190,auVar18))),auVar16,
                            1);
      uVar24 = vcmpps_avx512f(auVar282,ZEXT1664(ZEXT816(0)),2);
      auVar48._8_4_ = 0x800000;
      auVar48._12_4_ = 0x800000;
      auVar48._0_4_ = 0x800000;
      auVar48._4_4_ = 0x800000;
      auVar48._16_4_ = 0x800000;
      auVar48._20_4_ = 0x800000;
      auVar48._24_4_ = 0x800000;
      auVar48._28_4_ = 0x800000;
      auVar48._32_4_ = 0x800000;
      auVar48._36_4_ = 0x800000;
      auVar48._40_4_ = 0x800000;
      auVar48._44_4_ = 0x800000;
      auVar48._48_4_ = 0x800000;
      auVar48._52_4_ = 0x800000;
      auVar48._56_4_ = 0x800000;
      auVar48._60_4_ = 0x800000;
      auVar280 = vmaxps_avx512f(auVar282,auVar48);
      auVar283 = vmovdqa64_avx512f(auVar280);
      auVar283 = vpsrld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar167._8_4_ = -0x7f800001;
      auVar167._12_4_ = -0x7f800001;
      auVar167._0_4_ = -0x7f800001;
      auVar167._4_4_ = -0x7f800001;
      auVar167._16_4_ = -0x7f800001;
      auVar167._20_4_ = -0x7f800001;
      auVar167._24_4_ = -0x7f800001;
      auVar167._28_4_ = -0x7f800001;
      auVar167._32_4_ = -0x7f800001;
      auVar167._36_4_ = -0x7f800001;
      auVar167._40_4_ = -0x7f800001;
      auVar167._44_4_ = -0x7f800001;
      auVar167._48_4_ = -0x7f800001;
      auVar167._52_4_ = -0x7f800001;
      auVar167._56_4_ = -0x7f800001;
      auVar167._60_4_ = -0x7f800001;
      auVar279 = vmovdqa64_avx512f(auVar167);
      auVar280 = vpandd_avx512f(auVar280,auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar170._8_4_ = 0.5;
      auVar170._12_4_ = 0.5;
      auVar170._0_4_ = 0.5;
      auVar170._4_4_ = 0.5;
      auVar170._16_4_ = 0.5;
      auVar170._20_4_ = 0.5;
      auVar170._24_4_ = 0.5;
      auVar170._28_4_ = 0.5;
      auVar170._32_4_ = 0.5;
      auVar170._36_4_ = 0.5;
      auVar170._40_4_ = 0.5;
      auVar170._44_4_ = 0.5;
      auVar170._48_4_ = 0.5;
      auVar170._52_4_ = 0.5;
      auVar170._56_4_ = 0.5;
      auVar170._60_4_ = 0.5;
      auVar279 = vmovdqa64_avx512f(auVar170);
      auVar280 = vpord_avx512f(auVar280,auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar279 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar283 = vpsubd_avx512f(auVar283,auVar279);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vcvtdq2ps_avx512f(auVar283);
      auVar43._8_4_ = 1.0;
      auVar43._12_4_ = 1.0;
      auVar43._0_4_ = 1.0;
      auVar43._4_4_ = 1.0;
      auVar43._16_4_ = 1.0;
      auVar43._20_4_ = 1.0;
      auVar43._24_4_ = 1.0;
      auVar43._28_4_ = 1.0;
      auVar43._32_4_ = 1.0;
      auVar43._36_4_ = 1.0;
      auVar43._40_4_ = 1.0;
      auVar43._44_4_ = 1.0;
      auVar43._48_4_ = 1.0;
      auVar43._52_4_ = 1.0;
      auVar43._56_4_ = 1.0;
      auVar43._60_4_ = 1.0;
      auVar283 = vaddps_avx512f(auVar283,auVar43);
      uVar25 = vcmpps_avx512f(auVar280,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar28 = (ushort)uVar25;
      auVar44._8_4_ = 1.0;
      auVar44._12_4_ = 1.0;
      auVar44._0_4_ = 1.0;
      auVar44._4_4_ = 1.0;
      auVar44._16_4_ = 1.0;
      auVar44._20_4_ = 1.0;
      auVar44._24_4_ = 1.0;
      auVar44._28_4_ = 1.0;
      auVar44._32_4_ = 1.0;
      auVar44._36_4_ = 1.0;
      auVar44._40_4_ = 1.0;
      auVar44._44_4_ = 1.0;
      auVar44._48_4_ = 1.0;
      auVar44._52_4_ = 1.0;
      auVar44._56_4_ = 1.0;
      auVar44._60_4_ = 1.0;
      auVar279 = vsubps_avx512f(auVar280,auVar44);
      auVar143._8_4_ = 1.0;
      auVar143._12_4_ = 1.0;
      auVar143._0_4_ = 1.0;
      auVar143._4_4_ = 1.0;
      auVar143._16_4_ = 1.0;
      auVar143._20_4_ = 1.0;
      auVar143._24_4_ = 1.0;
      auVar143._28_4_ = 1.0;
      auVar143._32_4_ = 1.0;
      auVar143._36_4_ = 1.0;
      auVar143._40_4_ = 1.0;
      auVar143._44_4_ = 1.0;
      auVar143._48_4_ = 1.0;
      auVar143._52_4_ = 1.0;
      auVar143._56_4_ = 1.0;
      auVar143._60_4_ = 1.0;
      local_5480 = auVar283._0_4_;
      iStack_547c = auVar283._4_4_;
      iStack_5478 = auVar283._8_4_;
      iStack_5474 = auVar283._12_4_;
      iStack_5470 = auVar283._16_4_;
      iStack_546c = auVar283._20_4_;
      iStack_5468 = auVar283._24_4_;
      iStack_5464 = auVar283._28_4_;
      iStack_5460 = auVar283._32_4_;
      iStack_545c = auVar283._36_4_;
      iStack_5458 = auVar283._40_4_;
      iStack_5454 = auVar283._44_4_;
      iStack_5450 = auVar283._48_4_;
      iStack_544c = auVar283._52_4_;
      iStack_5448 = auVar283._56_4_;
      iStack_5444 = auVar283._60_4_;
      auVar283 = vsubps_avx512f(auVar283,auVar143);
      bVar1 = (bool)((byte)uVar25 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar25 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8900._4_4_ = (uint)bVar2 * auVar283._4_4_ | (uint)!bVar2 * iStack_547c;
      local_8900._0_4_ = (uint)bVar1 * auVar283._0_4_ | (uint)!bVar1 * local_5480;
      local_8900._8_4_ = (uint)bVar3 * auVar283._8_4_ | (uint)!bVar3 * iStack_5478;
      local_8900._12_4_ = (uint)bVar4 * auVar283._12_4_ | (uint)!bVar4 * iStack_5474;
      uStack_88f0._0_4_ = (uint)bVar5 * auVar283._16_4_ | (uint)!bVar5 * iStack_5470;
      uStack_88f0._4_4_ = (uint)bVar6 * auVar283._20_4_ | (uint)!bVar6 * iStack_546c;
      uStack_88e8._0_4_ = (uint)bVar7 * auVar283._24_4_ | (uint)!bVar7 * iStack_5468;
      uStack_88e8._4_4_ = (uint)bVar8 * auVar283._28_4_ | (uint)!bVar8 * iStack_5464;
      auVar16 = _local_8900;
      uStack_88e0._0_4_ =
           (uint)(bVar9 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_5460;
      uStack_88e0._4_4_ = (uint)bVar10 * auVar283._36_4_ | (uint)!bVar10 * iStack_545c;
      auVar271 = _local_8900;
      uStack_88d8._0_4_ = (uint)bVar11 * auVar283._40_4_ | (uint)!bVar11 * iStack_5458;
      uStack_88d8._4_4_ = (uint)bVar12 * auVar283._44_4_ | (uint)!bVar12 * iStack_5454;
      auVar272 = _local_8900;
      uStack_88d0._0_4_ = (uint)bVar13 * auVar283._48_4_ | (uint)!bVar13 * iStack_5450;
      uStack_88d0._4_4_ = (uint)bVar14 * auVar283._52_4_ | (uint)!bVar14 * iStack_544c;
      auVar273 = _local_8900;
      uStack_88c8._0_4_ = (uint)bVar15 * auVar283._56_4_ | (uint)!bVar15 * iStack_5448;
      uStack_88c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_5444;
      auVar283 = _local_8900;
      local_35c0 = auVar279._0_4_;
      iStack_35bc = auVar279._4_4_;
      iStack_35b8 = auVar279._8_4_;
      iStack_35b4 = auVar279._12_4_;
      iStack_35b0 = auVar279._16_4_;
      iStack_35ac = auVar279._20_4_;
      iStack_35a8 = auVar279._24_4_;
      iStack_35a4 = auVar279._28_4_;
      iStack_35a0 = auVar279._32_4_;
      iStack_359c = auVar279._36_4_;
      iStack_3598 = auVar279._40_4_;
      iStack_3594 = auVar279._44_4_;
      iStack_3590 = auVar279._48_4_;
      iStack_358c = auVar279._52_4_;
      iStack_3588 = auVar279._56_4_;
      iStack_3584 = auVar279._60_4_;
      auVar280 = vaddps_avx512f(auVar279,auVar280);
      bVar1 = (bool)((byte)uVar25 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8800._4_4_ = (uint)bVar2 * auVar280._4_4_ | (uint)!bVar2 * iStack_35bc;
      local_8800._0_4_ = (uint)bVar1 * auVar280._0_4_ | (uint)!bVar1 * local_35c0;
      local_8800._8_4_ = (uint)bVar3 * auVar280._8_4_ | (uint)!bVar3 * iStack_35b8;
      local_8800._12_4_ = (uint)bVar4 * auVar280._12_4_ | (uint)!bVar4 * iStack_35b4;
      uStack_87f0._0_4_ = (uint)bVar5 * auVar280._16_4_ | (uint)!bVar5 * iStack_35b0;
      uStack_87f0._4_4_ = (uint)bVar6 * auVar280._20_4_ | (uint)!bVar6 * iStack_35ac;
      uStack_87e8._0_4_ = (uint)bVar7 * auVar280._24_4_ | (uint)!bVar7 * iStack_35a8;
      uStack_87e8._4_4_ = (uint)bVar8 * auVar280._28_4_ | (uint)!bVar8 * iStack_35a4;
      auVar285 = _local_8800;
      uStack_87e0._0_4_ =
           (uint)(bVar9 & 1) * auVar280._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_35a0;
      uStack_87e0._4_4_ = (uint)bVar10 * auVar280._36_4_ | (uint)!bVar10 * iStack_359c;
      auVar274 = _local_8800;
      uStack_87d8._0_4_ = (uint)bVar11 * auVar280._40_4_ | (uint)!bVar11 * iStack_3598;
      uStack_87d8._4_4_ = (uint)bVar12 * auVar280._44_4_ | (uint)!bVar12 * iStack_3594;
      auVar275 = _local_8800;
      uStack_87d0._0_4_ = (uint)bVar13 * auVar280._48_4_ | (uint)!bVar13 * iStack_3590;
      uStack_87d0._4_4_ = (uint)bVar14 * auVar280._52_4_ | (uint)!bVar14 * iStack_358c;
      auVar276 = _local_8800;
      uStack_87c8._0_4_ = (uint)bVar15 * auVar280._56_4_ | (uint)!bVar15 * iStack_3588;
      uStack_87c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar280._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_3584;
      auVar280 = _local_8800;
      uStack_87e8 = auVar285._24_8_;
      uStack_87e0 = auVar274._32_8_;
      uStack_87d8 = auVar275._40_8_;
      uStack_87d0 = auVar276._48_8_;
      uStack_87c8 = auVar280._56_8_;
      auVar47._16_8_ = uStack_87f0;
      auVar47._0_16_ = local_8800;
      auVar47._24_8_ = uStack_87e8;
      auVar47._32_8_ = uStack_87e0;
      auVar47._40_8_ = uStack_87d8;
      auVar47._48_8_ = uStack_87d0;
      auVar47._56_8_ = uStack_87c8;
      auVar46._16_8_ = uStack_87f0;
      auVar46._0_16_ = local_8800;
      auVar46._24_8_ = uStack_87e8;
      auVar46._32_8_ = uStack_87e0;
      auVar46._40_8_ = uStack_87d8;
      auVar46._48_8_ = uStack_87d0;
      auVar46._56_8_ = uStack_87c8;
      auVar280 = vmulps_avx512f(auVar47,auVar46);
      local_8a00._8_4_ = 0.070376836;
      local_8a00._12_4_ = 0.070376836;
      local_8a00._0_4_ = 0.070376836;
      local_8a00._4_4_ = 0.070376836;
      auVar97._16_4_ = 0.070376836;
      auVar97._20_4_ = 0.070376836;
      auVar97._0_16_ = local_8a00._0_16_;
      auVar97._24_4_ = 0.070376836;
      auVar97._28_4_ = 0.070376836;
      auVar97._32_4_ = 0.070376836;
      auVar97._36_4_ = 0.070376836;
      auVar97._40_4_ = 0.070376836;
      auVar97._44_4_ = 0.070376836;
      auVar97._48_4_ = 0.070376836;
      auVar97._52_4_ = 0.070376836;
      auVar97._56_4_ = 0.070376836;
      auVar97._60_4_ = 0.070376836;
      auVar96._16_8_ = uStack_87f0;
      auVar96._0_16_ = local_8800;
      auVar96._24_8_ = uStack_87e8;
      auVar96._32_8_ = uStack_87e0;
      auVar96._40_8_ = uStack_87d8;
      auVar96._48_8_ = uStack_87d0;
      auVar96._56_8_ = uStack_87c8;
      auVar95._8_4_ = -0.1151461;
      auVar95._12_4_ = -0.1151461;
      auVar95._0_4_ = -0.1151461;
      auVar95._4_4_ = -0.1151461;
      auVar95._16_4_ = -0.1151461;
      auVar95._20_4_ = -0.1151461;
      auVar95._24_4_ = -0.1151461;
      auVar95._28_4_ = -0.1151461;
      auVar95._32_4_ = -0.1151461;
      auVar95._36_4_ = -0.1151461;
      auVar95._40_4_ = -0.1151461;
      auVar95._44_4_ = -0.1151461;
      auVar95._48_4_ = -0.1151461;
      auVar95._52_4_ = -0.1151461;
      auVar95._56_4_ = -0.1151461;
      auVar95._60_4_ = -0.1151461;
      auVar279 = vfmadd213ps_avx512f(auVar96,auVar97,auVar95);
      auVar94._16_8_ = uStack_87f0;
      auVar94._0_16_ = local_8800;
      auVar94._24_8_ = uStack_87e8;
      auVar94._32_8_ = uStack_87e0;
      auVar94._40_8_ = uStack_87d8;
      auVar94._48_8_ = uStack_87d0;
      auVar94._56_8_ = uStack_87c8;
      auVar93._8_4_ = 0.116769984;
      auVar93._12_4_ = 0.116769984;
      auVar93._0_4_ = 0.116769984;
      auVar93._4_4_ = 0.116769984;
      auVar93._16_4_ = 0.116769984;
      auVar93._20_4_ = 0.116769984;
      auVar93._24_4_ = 0.116769984;
      auVar93._28_4_ = 0.116769984;
      auVar93._32_4_ = 0.116769984;
      auVar93._36_4_ = 0.116769984;
      auVar93._40_4_ = 0.116769984;
      auVar93._44_4_ = 0.116769984;
      auVar93._48_4_ = 0.116769984;
      auVar93._52_4_ = 0.116769984;
      auVar93._56_4_ = 0.116769984;
      auVar93._60_4_ = 0.116769984;
      auVar279 = vfmadd213ps_avx512f(auVar94,auVar279,auVar93);
      auVar92._16_8_ = uStack_87f0;
      auVar92._0_16_ = local_8800;
      auVar92._24_8_ = uStack_87e8;
      auVar92._32_8_ = uStack_87e0;
      auVar92._40_8_ = uStack_87d8;
      auVar92._48_8_ = uStack_87d0;
      auVar92._56_8_ = uStack_87c8;
      auVar91._8_4_ = -0.12420141;
      auVar91._12_4_ = -0.12420141;
      auVar91._0_4_ = -0.12420141;
      auVar91._4_4_ = -0.12420141;
      auVar91._16_4_ = -0.12420141;
      auVar91._20_4_ = -0.12420141;
      auVar91._24_4_ = -0.12420141;
      auVar91._28_4_ = -0.12420141;
      auVar91._32_4_ = -0.12420141;
      auVar91._36_4_ = -0.12420141;
      auVar91._40_4_ = -0.12420141;
      auVar91._44_4_ = -0.12420141;
      auVar91._48_4_ = -0.12420141;
      auVar91._52_4_ = -0.12420141;
      auVar91._56_4_ = -0.12420141;
      auVar91._60_4_ = -0.12420141;
      auVar279 = vfmadd213ps_avx512f(auVar92,auVar279,auVar91);
      auVar90._16_8_ = uStack_87f0;
      auVar90._0_16_ = local_8800;
      auVar90._24_8_ = uStack_87e8;
      auVar90._32_8_ = uStack_87e0;
      auVar90._40_8_ = uStack_87d8;
      auVar90._48_8_ = uStack_87d0;
      auVar90._56_8_ = uStack_87c8;
      auVar89._8_4_ = 0.14249323;
      auVar89._12_4_ = 0.14249323;
      auVar89._0_4_ = 0.14249323;
      auVar89._4_4_ = 0.14249323;
      auVar89._16_4_ = 0.14249323;
      auVar89._20_4_ = 0.14249323;
      auVar89._24_4_ = 0.14249323;
      auVar89._28_4_ = 0.14249323;
      auVar89._32_4_ = 0.14249323;
      auVar89._36_4_ = 0.14249323;
      auVar89._40_4_ = 0.14249323;
      auVar89._44_4_ = 0.14249323;
      auVar89._48_4_ = 0.14249323;
      auVar89._52_4_ = 0.14249323;
      auVar89._56_4_ = 0.14249323;
      auVar89._60_4_ = 0.14249323;
      auVar279 = vfmadd213ps_avx512f(auVar90,auVar279,auVar89);
      auVar88._16_8_ = uStack_87f0;
      auVar88._0_16_ = local_8800;
      auVar88._24_8_ = uStack_87e8;
      auVar88._32_8_ = uStack_87e0;
      auVar88._40_8_ = uStack_87d8;
      auVar88._48_8_ = uStack_87d0;
      auVar88._56_8_ = uStack_87c8;
      auVar87._8_4_ = -0.16668057;
      auVar87._12_4_ = -0.16668057;
      auVar87._0_4_ = -0.16668057;
      auVar87._4_4_ = -0.16668057;
      auVar87._16_4_ = -0.16668057;
      auVar87._20_4_ = -0.16668057;
      auVar87._24_4_ = -0.16668057;
      auVar87._28_4_ = -0.16668057;
      auVar87._32_4_ = -0.16668057;
      auVar87._36_4_ = -0.16668057;
      auVar87._40_4_ = -0.16668057;
      auVar87._44_4_ = -0.16668057;
      auVar87._48_4_ = -0.16668057;
      auVar87._52_4_ = -0.16668057;
      auVar87._56_4_ = -0.16668057;
      auVar87._60_4_ = -0.16668057;
      auVar279 = vfmadd213ps_avx512f(auVar88,auVar279,auVar87);
      auVar86._16_8_ = uStack_87f0;
      auVar86._0_16_ = local_8800;
      auVar86._24_8_ = uStack_87e8;
      auVar86._32_8_ = uStack_87e0;
      auVar86._40_8_ = uStack_87d8;
      auVar86._48_8_ = uStack_87d0;
      auVar86._56_8_ = uStack_87c8;
      auVar85._8_4_ = 0.20000714;
      auVar85._12_4_ = 0.20000714;
      auVar85._0_4_ = 0.20000714;
      auVar85._4_4_ = 0.20000714;
      auVar85._16_4_ = 0.20000714;
      auVar85._20_4_ = 0.20000714;
      auVar85._24_4_ = 0.20000714;
      auVar85._28_4_ = 0.20000714;
      auVar85._32_4_ = 0.20000714;
      auVar85._36_4_ = 0.20000714;
      auVar85._40_4_ = 0.20000714;
      auVar85._44_4_ = 0.20000714;
      auVar85._48_4_ = 0.20000714;
      auVar85._52_4_ = 0.20000714;
      auVar85._56_4_ = 0.20000714;
      auVar85._60_4_ = 0.20000714;
      auVar279 = vfmadd213ps_avx512f(auVar86,auVar279,auVar85);
      auVar84._16_8_ = uStack_87f0;
      auVar84._0_16_ = local_8800;
      auVar84._24_8_ = uStack_87e8;
      auVar84._32_8_ = uStack_87e0;
      auVar84._40_8_ = uStack_87d8;
      auVar84._48_8_ = uStack_87d0;
      auVar84._56_8_ = uStack_87c8;
      auVar83._8_4_ = -0.24999994;
      auVar83._12_4_ = -0.24999994;
      auVar83._0_4_ = -0.24999994;
      auVar83._4_4_ = -0.24999994;
      auVar83._16_4_ = -0.24999994;
      auVar83._20_4_ = -0.24999994;
      auVar83._24_4_ = -0.24999994;
      auVar83._28_4_ = -0.24999994;
      auVar83._32_4_ = -0.24999994;
      auVar83._36_4_ = -0.24999994;
      auVar83._40_4_ = -0.24999994;
      auVar83._44_4_ = -0.24999994;
      auVar83._48_4_ = -0.24999994;
      auVar83._52_4_ = -0.24999994;
      auVar83._56_4_ = -0.24999994;
      auVar83._60_4_ = -0.24999994;
      auVar279 = vfmadd213ps_avx512f(auVar84,auVar279,auVar83);
      auVar82._16_8_ = uStack_87f0;
      auVar82._0_16_ = local_8800;
      auVar82._24_8_ = uStack_87e8;
      auVar82._32_8_ = uStack_87e0;
      auVar82._40_8_ = uStack_87d8;
      auVar82._48_8_ = uStack_87d0;
      auVar82._56_8_ = uStack_87c8;
      auVar81._8_4_ = 0.3333333;
      auVar81._12_4_ = 0.3333333;
      auVar81._0_4_ = 0.3333333;
      auVar81._4_4_ = 0.3333333;
      auVar81._16_4_ = 0.3333333;
      auVar81._20_4_ = 0.3333333;
      auVar81._24_4_ = 0.3333333;
      auVar81._28_4_ = 0.3333333;
      auVar81._32_4_ = 0.3333333;
      auVar81._36_4_ = 0.3333333;
      auVar81._40_4_ = 0.3333333;
      auVar81._44_4_ = 0.3333333;
      auVar81._48_4_ = 0.3333333;
      auVar81._52_4_ = 0.3333333;
      auVar81._56_4_ = 0.3333333;
      auVar81._60_4_ = 0.3333333;
      auVar279 = vfmadd213ps_avx512f(auVar82,auVar279,auVar81);
      auVar45._16_8_ = uStack_87f0;
      auVar45._0_16_ = local_8800;
      auVar45._24_8_ = uStack_87e8;
      auVar45._32_8_ = uStack_87e0;
      auVar45._40_8_ = uStack_87d8;
      auVar45._48_8_ = uStack_87d0;
      auVar45._56_8_ = uStack_87c8;
      auVar279 = vmulps_avx512f(auVar279,auVar45);
      auVar279 = vmulps_avx512f(auVar279,auVar280);
      uStack_88e8 = auVar16._24_8_;
      uStack_88e0 = auVar271._32_8_;
      uStack_88d8 = auVar272._40_8_;
      uStack_88d0 = auVar273._48_8_;
      uStack_88c8 = auVar283._56_8_;
      auVar80._16_8_ = uStack_88f0;
      auVar80._0_16_ = local_8900;
      auVar80._24_8_ = uStack_88e8;
      auVar80._32_8_ = uStack_88e0;
      auVar80._40_8_ = uStack_88d8;
      auVar80._48_8_ = uStack_88d0;
      auVar80._56_8_ = uStack_88c8;
      auVar79._8_4_ = -0.00021219444;
      auVar79._12_4_ = -0.00021219444;
      auVar79._0_4_ = -0.00021219444;
      auVar79._4_4_ = -0.00021219444;
      auVar79._16_4_ = -0.00021219444;
      auVar79._20_4_ = -0.00021219444;
      auVar79._24_4_ = -0.00021219444;
      auVar79._28_4_ = -0.00021219444;
      auVar79._32_4_ = -0.00021219444;
      auVar79._36_4_ = -0.00021219444;
      auVar79._40_4_ = -0.00021219444;
      auVar79._44_4_ = -0.00021219444;
      auVar79._48_4_ = -0.00021219444;
      auVar79._52_4_ = -0.00021219444;
      auVar79._56_4_ = -0.00021219444;
      auVar79._60_4_ = -0.00021219444;
      auVar283 = vfmadd213ps_avx512f(auVar79,auVar80,auVar279);
      auVar149._8_4_ = 0.5;
      auVar149._12_4_ = 0.5;
      auVar149._0_4_ = 0.5;
      auVar149._4_4_ = 0.5;
      auVar149._16_4_ = 0.5;
      auVar149._20_4_ = 0.5;
      auVar149._24_4_ = 0.5;
      auVar149._28_4_ = 0.5;
      auVar149._32_4_ = 0.5;
      auVar149._36_4_ = 0.5;
      auVar149._40_4_ = 0.5;
      auVar149._44_4_ = 0.5;
      auVar149._48_4_ = 0.5;
      auVar149._52_4_ = 0.5;
      auVar149._56_4_ = 0.5;
      auVar149._60_4_ = 0.5;
      auVar283 = vfnmadd213ps_avx512f(auVar149,auVar280,auVar283);
      auVar42._16_8_ = uStack_87f0;
      auVar42._0_16_ = local_8800;
      auVar42._24_8_ = uStack_87e8;
      auVar42._32_8_ = uStack_87e0;
      auVar42._40_8_ = uStack_87d8;
      auVar42._48_8_ = uStack_87d0;
      auVar42._56_8_ = uStack_87c8;
      auVar283 = vaddps_avx512f(auVar42,auVar283);
      auVar78._16_8_ = uStack_88f0;
      auVar78._0_16_ = local_8900;
      auVar78._24_8_ = uStack_88e8;
      auVar78._32_8_ = uStack_88e0;
      auVar78._40_8_ = uStack_88d8;
      auVar78._48_8_ = uStack_88d0;
      auVar78._56_8_ = uStack_88c8;
      auVar77._8_4_ = 0.6933594;
      auVar77._12_4_ = 0.6933594;
      auVar77._0_4_ = 0.6933594;
      auVar77._4_4_ = 0.6933594;
      auVar77._16_4_ = 0.6933594;
      auVar77._20_4_ = 0.6933594;
      auVar77._24_4_ = 0.6933594;
      auVar77._28_4_ = 0.6933594;
      auVar77._32_4_ = 0.6933594;
      auVar77._36_4_ = 0.6933594;
      auVar77._40_4_ = 0.6933594;
      auVar77._44_4_ = 0.6933594;
      auVar77._48_4_ = 0.6933594;
      auVar77._52_4_ = 0.6933594;
      auVar77._56_4_ = 0.6933594;
      auVar77._60_4_ = 0.6933594;
      auVar280 = vfmadd213ps_avx512f(auVar77,auVar78,auVar283);
      auVar283 = vpmovm2d_avx512dq(uVar24 & 0xffff);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpord_avx512f(auVar280,auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(auVar281,auVar283);
      auVar34._8_4_ = 88.37626;
      auVar34._12_4_ = 88.37626;
      auVar34._0_4_ = 88.37626;
      auVar34._4_4_ = 88.37626;
      auVar34._16_4_ = 88.37626;
      auVar34._20_4_ = 88.37626;
      auVar34._24_4_ = 88.37626;
      auVar34._28_4_ = 88.37626;
      auVar34._32_4_ = 88.37626;
      auVar34._36_4_ = 88.37626;
      auVar34._40_4_ = 88.37626;
      auVar34._44_4_ = 88.37626;
      auVar34._48_4_ = 88.37626;
      auVar34._52_4_ = 88.37626;
      auVar34._56_4_ = 88.37626;
      auVar34._60_4_ = 88.37626;
      auVar283 = vminps_avx512f(auVar283,auVar34);
      auVar33._8_4_ = -88.37626;
      auVar33._12_4_ = -88.37626;
      auVar33._0_4_ = -88.37626;
      auVar33._4_4_ = -88.37626;
      auVar33._16_4_ = -88.37626;
      auVar33._20_4_ = -88.37626;
      auVar33._24_4_ = -88.37626;
      auVar33._28_4_ = -88.37626;
      auVar33._32_4_ = -88.37626;
      auVar33._36_4_ = -88.37626;
      auVar33._40_4_ = -88.37626;
      auVar33._44_4_ = -88.37626;
      auVar33._48_4_ = -88.37626;
      auVar33._52_4_ = -88.37626;
      auVar33._56_4_ = -88.37626;
      auVar33._60_4_ = -88.37626;
      auVar280 = vmaxps_avx512f(auVar283,auVar33);
      auVar133._8_4_ = 1.442695;
      auVar133._12_4_ = 1.442695;
      auVar133._0_4_ = 1.442695;
      auVar133._4_4_ = 1.442695;
      auVar133._16_4_ = 1.442695;
      auVar133._20_4_ = 1.442695;
      auVar133._24_4_ = 1.442695;
      auVar133._28_4_ = 1.442695;
      auVar133._32_4_ = 1.442695;
      auVar133._36_4_ = 1.442695;
      auVar133._40_4_ = 1.442695;
      auVar133._44_4_ = 1.442695;
      auVar133._48_4_ = 1.442695;
      auVar133._52_4_ = 1.442695;
      auVar133._56_4_ = 1.442695;
      auVar133._60_4_ = 1.442695;
      auVar132._8_4_ = 0.5;
      auVar132._12_4_ = 0.5;
      auVar132._0_4_ = 0.5;
      auVar132._4_4_ = 0.5;
      auVar132._16_4_ = 0.5;
      auVar132._20_4_ = 0.5;
      auVar132._24_4_ = 0.5;
      auVar132._28_4_ = 0.5;
      auVar132._32_4_ = 0.5;
      auVar132._36_4_ = 0.5;
      auVar132._40_4_ = 0.5;
      auVar132._44_4_ = 0.5;
      auVar132._48_4_ = 0.5;
      auVar132._52_4_ = 0.5;
      auVar132._56_4_ = 0.5;
      auVar132._60_4_ = 0.5;
      auVar283 = vfmadd213ps_avx512f(auVar133,auVar280,auVar132);
      auVar279 = vrndscaleps_avx512f(auVar283,1);
      uVar25 = vcmpps_avx512f(auVar283,auVar279,1);
      uVar28 = (ushort)uVar25;
      auVar146._8_4_ = 1.0;
      auVar146._12_4_ = 1.0;
      auVar146._0_4_ = 1.0;
      auVar146._4_4_ = 1.0;
      auVar146._16_4_ = 1.0;
      auVar146._20_4_ = 1.0;
      auVar146._24_4_ = 1.0;
      auVar146._28_4_ = 1.0;
      auVar146._32_4_ = 1.0;
      auVar146._36_4_ = 1.0;
      auVar146._40_4_ = 1.0;
      auVar146._44_4_ = 1.0;
      auVar146._48_4_ = 1.0;
      auVar146._52_4_ = 1.0;
      auVar146._56_4_ = 1.0;
      auVar146._60_4_ = 1.0;
      local_5000 = auVar279._0_4_;
      iStack_4ffc = auVar279._4_4_;
      iStack_4ff8 = auVar279._8_4_;
      iStack_4ff4 = auVar279._12_4_;
      iStack_4ff0 = auVar279._16_4_;
      iStack_4fec = auVar279._20_4_;
      iStack_4fe8 = auVar279._24_4_;
      iStack_4fe4 = auVar279._28_4_;
      iStack_4fe0 = auVar279._32_4_;
      iStack_4fdc = auVar279._36_4_;
      iStack_4fd8 = auVar279._40_4_;
      iStack_4fd4 = auVar279._44_4_;
      iStack_4fd0 = auVar279._48_4_;
      iStack_4fcc = auVar279._52_4_;
      iStack_4fc8 = auVar279._56_4_;
      iStack_4fc4 = auVar279._60_4_;
      auVar283 = vsubps_avx512f(auVar279,auVar146);
      bVar1 = (bool)((byte)uVar25 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar25 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_9780._4_4_ = (uint)bVar2 * auVar283._4_4_ | (uint)!bVar2 * iStack_4ffc;
      local_9780._0_4_ = (uint)bVar1 * auVar283._0_4_ | (uint)!bVar1 * local_5000;
      local_9780._8_4_ = (uint)bVar3 * auVar283._8_4_ | (uint)!bVar3 * iStack_4ff8;
      local_9780._12_4_ = (uint)bVar4 * auVar283._12_4_ | (uint)!bVar4 * iStack_4ff4;
      uStack_9770._0_4_ = (uint)bVar5 * auVar283._16_4_ | (uint)!bVar5 * iStack_4ff0;
      uStack_9770._4_4_ = (uint)bVar6 * auVar283._20_4_ | (uint)!bVar6 * iStack_4fec;
      uStack_9768._0_4_ = (uint)bVar7 * auVar283._24_4_ | (uint)!bVar7 * iStack_4fe8;
      uStack_9768._4_4_ = (uint)bVar8 * auVar283._28_4_ | (uint)!bVar8 * iStack_4fe4;
      auVar16 = _local_9780;
      uStack_9760._0_4_ =
           (uint)(bVar9 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_4fe0;
      uStack_9760._4_4_ = (uint)bVar10 * auVar283._36_4_ | (uint)!bVar10 * iStack_4fdc;
      auVar271 = _local_9780;
      uStack_9758._0_4_ = (uint)bVar11 * auVar283._40_4_ | (uint)!bVar11 * iStack_4fd8;
      uStack_9758._4_4_ = (uint)bVar12 * auVar283._44_4_ | (uint)!bVar12 * iStack_4fd4;
      auVar272 = _local_9780;
      uStack_9750._0_4_ = (uint)bVar13 * auVar283._48_4_ | (uint)!bVar13 * iStack_4fd0;
      uStack_9750._4_4_ = (uint)bVar14 * auVar283._52_4_ | (uint)!bVar14 * iStack_4fcc;
      auVar273 = _local_9780;
      uStack_9748._0_4_ = (uint)bVar15 * auVar283._56_4_ | (uint)!bVar15 * iStack_4fc8;
      uStack_9748._4_4_ =
           (uint)(bVar9 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_4fc4;
      auVar283 = _local_9780;
      uStack_9768 = auVar16._24_8_;
      uStack_9760 = auVar271._32_8_;
      uStack_9758 = auVar272._40_8_;
      uStack_9750 = auVar273._48_8_;
      uStack_9748 = auVar283._56_8_;
      auVar158._16_8_ = uStack_9770;
      auVar158._0_16_ = local_9780;
      auVar158._24_8_ = uStack_9768;
      auVar158._32_8_ = uStack_9760;
      auVar158._40_8_ = uStack_9758;
      auVar158._48_8_ = uStack_9750;
      auVar158._56_8_ = uStack_9748;
      auVar157._8_4_ = 0.6933594;
      auVar157._12_4_ = 0.6933594;
      auVar157._0_4_ = 0.6933594;
      auVar157._4_4_ = 0.6933594;
      auVar157._16_4_ = 0.6933594;
      auVar157._20_4_ = 0.6933594;
      auVar157._24_4_ = 0.6933594;
      auVar157._28_4_ = 0.6933594;
      auVar157._32_4_ = 0.6933594;
      auVar157._36_4_ = 0.6933594;
      auVar157._40_4_ = 0.6933594;
      auVar157._44_4_ = 0.6933594;
      auVar157._48_4_ = 0.6933594;
      auVar157._52_4_ = 0.6933594;
      auVar157._56_4_ = 0.6933594;
      auVar157._60_4_ = 0.6933594;
      auVar283 = vfnmadd213ps_avx512f(auVar157,auVar158,auVar280);
      auVar156._16_8_ = uStack_9770;
      auVar156._0_16_ = local_9780;
      auVar156._24_8_ = uStack_9768;
      auVar156._32_8_ = uStack_9760;
      auVar156._40_8_ = uStack_9758;
      auVar156._48_8_ = uStack_9750;
      auVar156._56_8_ = uStack_9748;
      auVar155._8_4_ = -0.00021219444;
      auVar155._12_4_ = -0.00021219444;
      auVar155._0_4_ = -0.00021219444;
      auVar155._4_4_ = -0.00021219444;
      auVar155._16_4_ = -0.00021219444;
      auVar155._20_4_ = -0.00021219444;
      auVar155._24_4_ = -0.00021219444;
      auVar155._28_4_ = -0.00021219444;
      auVar155._32_4_ = -0.00021219444;
      auVar155._36_4_ = -0.00021219444;
      auVar155._40_4_ = -0.00021219444;
      auVar155._44_4_ = -0.00021219444;
      auVar155._48_4_ = -0.00021219444;
      auVar155._52_4_ = -0.00021219444;
      auVar155._56_4_ = -0.00021219444;
      auVar155._60_4_ = -0.00021219444;
      auVar283 = vfnmadd213ps_avx512f(auVar155,auVar156,auVar283);
      auVar280 = vmulps_avx512f(auVar283,auVar283);
      uStack_9878._0_4_ = 0.00019875691;
      uStack_9878._4_4_ = 0.00019875691;
      local_9880._0_4_ = 0.00019875691;
      local_9880._4_4_ = 0.00019875691;
      auVar131._16_4_ = 0.00019875691;
      auVar131._20_4_ = 0.00019875691;
      auVar131._0_16_ = _local_9880;
      auVar131._24_4_ = 0.00019875691;
      auVar131._28_4_ = 0.00019875691;
      auVar131._32_4_ = 0.00019875691;
      auVar131._36_4_ = 0.00019875691;
      auVar131._40_4_ = 0.00019875691;
      auVar131._44_4_ = 0.00019875691;
      auVar131._48_4_ = 0.00019875691;
      auVar131._52_4_ = 0.00019875691;
      auVar131._56_4_ = 0.00019875691;
      auVar131._60_4_ = 0.00019875691;
      auVar130._8_4_ = 0.0013981999;
      auVar130._12_4_ = 0.0013981999;
      auVar130._0_4_ = 0.0013981999;
      auVar130._4_4_ = 0.0013981999;
      auVar130._16_4_ = 0.0013981999;
      auVar130._20_4_ = 0.0013981999;
      auVar130._24_4_ = 0.0013981999;
      auVar130._28_4_ = 0.0013981999;
      auVar130._32_4_ = 0.0013981999;
      auVar130._36_4_ = 0.0013981999;
      auVar130._40_4_ = 0.0013981999;
      auVar130._44_4_ = 0.0013981999;
      auVar130._48_4_ = 0.0013981999;
      auVar130._52_4_ = 0.0013981999;
      auVar130._56_4_ = 0.0013981999;
      auVar130._60_4_ = 0.0013981999;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar131,auVar130);
      auVar129._8_4_ = 0.008333452;
      auVar129._12_4_ = 0.008333452;
      auVar129._0_4_ = 0.008333452;
      auVar129._4_4_ = 0.008333452;
      auVar129._16_4_ = 0.008333452;
      auVar129._20_4_ = 0.008333452;
      auVar129._24_4_ = 0.008333452;
      auVar129._28_4_ = 0.008333452;
      auVar129._32_4_ = 0.008333452;
      auVar129._36_4_ = 0.008333452;
      auVar129._40_4_ = 0.008333452;
      auVar129._44_4_ = 0.008333452;
      auVar129._48_4_ = 0.008333452;
      auVar129._52_4_ = 0.008333452;
      auVar129._56_4_ = 0.008333452;
      auVar129._60_4_ = 0.008333452;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar129);
      auVar128._8_4_ = 0.041665796;
      auVar128._12_4_ = 0.041665796;
      auVar128._0_4_ = 0.041665796;
      auVar128._4_4_ = 0.041665796;
      auVar128._16_4_ = 0.041665796;
      auVar128._20_4_ = 0.041665796;
      auVar128._24_4_ = 0.041665796;
      auVar128._28_4_ = 0.041665796;
      auVar128._32_4_ = 0.041665796;
      auVar128._36_4_ = 0.041665796;
      auVar128._40_4_ = 0.041665796;
      auVar128._44_4_ = 0.041665796;
      auVar128._48_4_ = 0.041665796;
      auVar128._52_4_ = 0.041665796;
      auVar128._56_4_ = 0.041665796;
      auVar128._60_4_ = 0.041665796;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar128);
      auVar127._8_4_ = 0.16666666;
      auVar127._12_4_ = 0.16666666;
      auVar127._0_4_ = 0.16666666;
      auVar127._4_4_ = 0.16666666;
      auVar127._16_4_ = 0.16666666;
      auVar127._20_4_ = 0.16666666;
      auVar127._24_4_ = 0.16666666;
      auVar127._28_4_ = 0.16666666;
      auVar127._32_4_ = 0.16666666;
      auVar127._36_4_ = 0.16666666;
      auVar127._40_4_ = 0.16666666;
      auVar127._44_4_ = 0.16666666;
      auVar127._48_4_ = 0.16666666;
      auVar127._52_4_ = 0.16666666;
      auVar127._56_4_ = 0.16666666;
      auVar127._60_4_ = 0.16666666;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar127);
      auVar126._8_4_ = 0.5;
      auVar126._12_4_ = 0.5;
      auVar126._0_4_ = 0.5;
      auVar126._4_4_ = 0.5;
      auVar126._16_4_ = 0.5;
      auVar126._20_4_ = 0.5;
      auVar126._24_4_ = 0.5;
      auVar126._28_4_ = 0.5;
      auVar126._32_4_ = 0.5;
      auVar126._36_4_ = 0.5;
      auVar126._40_4_ = 0.5;
      auVar126._44_4_ = 0.5;
      auVar126._48_4_ = 0.5;
      auVar126._52_4_ = 0.5;
      auVar126._56_4_ = 0.5;
      auVar126._60_4_ = 0.5;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar126);
      auVar280 = vfmadd213ps_avx512f(auVar280,auVar279,auVar283);
      auVar283._8_4_ = 1.0;
      auVar283._12_4_ = 1.0;
      auVar283._0_4_ = 1.0;
      auVar283._4_4_ = 1.0;
      auVar283._16_4_ = 1.0;
      auVar283._20_4_ = 1.0;
      auVar283._24_4_ = 1.0;
      auVar283._28_4_ = 1.0;
      auVar283._32_4_ = 1.0;
      auVar283._36_4_ = 1.0;
      auVar283._40_4_ = 1.0;
      auVar283._44_4_ = 1.0;
      auVar283._48_4_ = 1.0;
      auVar283._52_4_ = 1.0;
      auVar283._56_4_ = 1.0;
      auVar283._60_4_ = 1.0;
      auVar279 = vaddps_avx512f(auVar280,auVar283);
      auVar164._16_8_ = uStack_9770;
      auVar164._0_16_ = local_9780;
      auVar164._24_8_ = uStack_9768;
      auVar164._32_8_ = uStack_9760;
      auVar164._40_8_ = uStack_9758;
      auVar164._48_8_ = uStack_9750;
      auVar164._56_8_ = uStack_9748;
      auVar283 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar283);
      auVar283 = vcvttps2dq_avx512f(auVar164);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vpaddd_avx512f(auVar283,auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpslld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(auVar279,auVar283);
      local_9880 = auVar283._0_8_;
      uStack_9878 = auVar283._8_8_;
      uStack_9870 = auVar283._16_8_;
      uStack_9868 = auVar283._24_8_;
      uStack_9860 = auVar283._32_8_;
      uStack_9858 = auVar283._40_8_;
      uStack_9850 = auVar283._48_8_;
      uStack_9848 = auVar283._56_8_;
      *local_a5e0 = local_9880;
      local_a5e0[1] = uStack_9878;
      local_a5e0[2] = uStack_9870;
      local_a5e0[3] = uStack_9868;
      local_a5e0[4] = uStack_9860;
      local_a5e0[5] = uStack_9858;
      local_a5e0[6] = uStack_9850;
      local_a5e0[7] = uStack_9848;
      local_a5d8 = local_a5d8 + 2;
      local_a5e0 = local_a5e0 + 8;
    }
    for (; local_a6c4 < in_ECX; local_a6c4 = local_a6c4 + 1) {
      fVar284 = *local_a5d8;
      auVar18 = vinsertps_avx(ZEXT416((uint)fVar284),ZEXT416((uint)fVar284),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar284),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)fVar284),0x30);
      auVar19 = vinsertps_avx(ZEXT416((uint)fVar284),ZEXT416((uint)fVar284),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar284),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)fVar284),0x30);
      auVar16 = vcmpps_avx(auVar17,ZEXT1632(ZEXT816(0)),2);
      auVar180._8_4_ = 0x800000;
      auVar180._0_8_ = 0x80000000800000;
      auVar180._12_4_ = 0x800000;
      auVar180._16_4_ = 0x800000;
      auVar180._20_4_ = 0x800000;
      auVar180._24_4_ = 0x800000;
      auVar180._28_4_ = 0x800000;
      auVar285 = vmaxps_avx(auVar286,auVar180);
      auVar23 = vpsrld_avx2(auVar285,ZEXT416(0x17));
      auVar182._8_4_ = 0x807fffff;
      auVar182._0_8_ = 0x807fffff807fffff;
      auVar182._12_4_ = 0x807fffff;
      auVar182._16_4_ = 0x807fffff;
      auVar182._20_4_ = 0x807fffff;
      auVar182._24_4_ = 0x807fffff;
      auVar182._28_4_ = 0x807fffff;
      auVar285 = vpand_avx2(auVar285,auVar182);
      auVar231._8_4_ = 0x3f000000;
      auVar231._0_8_ = 0x3f0000003f000000;
      auVar231._12_4_ = 0x3f000000;
      auVar231._16_4_ = 0x3f000000;
      auVar231._20_4_ = 0x3f000000;
      auVar231._24_4_ = 0x3f000000;
      auVar231._28_4_ = 0x3f000000;
      auVar22 = vpor_avx2(auVar285,auVar231);
      auVar234._8_8_ = 0x7f0000007f;
      auVar234._0_8_ = 0x7f0000007f;
      auVar234._16_8_ = 0x7f0000007f;
      auVar234._24_8_ = 0x7f0000007f;
      auVar285 = vpsubd_avx2(auVar23,auVar234);
      auVar285 = vcvtdq2ps_avx(auVar285);
      local_2840 = auVar285._0_4_;
      fStack_283c = auVar285._4_4_;
      fStack_2838 = auVar285._8_4_;
      fStack_2834 = auVar285._12_4_;
      fStack_2830 = auVar285._16_4_;
      fStack_282c = auVar285._20_4_;
      fStack_2828 = auVar285._24_4_;
      fStack_2824 = auVar285._28_4_;
      local_2980._4_4_ = fStack_283c + 1.0;
      local_2980._0_4_ = local_2840 + 1.0;
      fStack_2978 = fStack_2838 + 1.0;
      fStack_2974 = fStack_2834 + 1.0;
      uStack_2970._0_4_ = fStack_2830 + 1.0;
      uStack_2970._4_4_ = fStack_282c + 1.0;
      uStack_2968._0_4_ = fStack_2828 + 1.0;
      uStack_2968._4_4_ = fStack_2824 + 1.0;
      auVar178 = _local_2980;
      auVar290._8_4_ = 0x3f3504f3;
      auVar290._0_8_ = 0x3f3504f33f3504f3;
      auVar290._12_4_ = 0x3f3504f3;
      auVar290._16_4_ = 0x3f3504f3;
      auVar290._20_4_ = 0x3f3504f3;
      auVar290._24_4_ = 0x3f3504f3;
      auVar290._28_4_ = 0x3f3504f3;
      auVar285 = vcmpps_avx(auVar22,auVar290,1);
      auVar23 = vpand_avx2(auVar22,auVar285);
      auVar179._8_8_ = 0x3f8000003f800000;
      auVar179._0_8_ = 0x3f8000003f800000;
      auVar179._16_8_ = 0x3f8000003f800000;
      auVar179._24_8_ = 0x3f8000003f800000;
      auVar22 = vsubps_avx(auVar22,auVar179);
      uStack_2968 = auVar178._24_8_;
      auVar181._8_8_ = 0x3f8000003f800000;
      auVar181._0_8_ = 0x3f8000003f800000;
      auVar181._16_8_ = 0x3f8000003f800000;
      auVar181._24_8_ = 0x3f8000003f800000;
      auVar285 = vpand_avx2(auVar181,auVar285);
      auVar178._16_8_ = uStack_2970;
      auVar178._0_16_ = _local_2980;
      auVar178._24_8_ = uStack_2968;
      auVar285 = vsubps_avx(auVar178,auVar285);
      local_2880 = auVar22._0_4_;
      fStack_287c = auVar22._4_4_;
      fStack_2878 = auVar22._8_4_;
      fStack_2874 = auVar22._12_4_;
      fStack_2870 = auVar22._16_4_;
      fStack_286c = auVar22._20_4_;
      fStack_2868 = auVar22._24_4_;
      fStack_2864 = auVar22._28_4_;
      local_28a0 = auVar23._0_4_;
      fStack_289c = auVar23._4_4_;
      fStack_2898 = auVar23._8_4_;
      fStack_2894 = auVar23._12_4_;
      fStack_2890 = auVar23._16_4_;
      fStack_288c = auVar23._20_4_;
      fStack_2888 = auVar23._24_4_;
      fStack_2884 = auVar23._28_4_;
      local_2900._0_4_ = local_2880 + local_28a0;
      local_2900._4_4_ = fStack_287c + fStack_289c;
      fStack_28f8 = fStack_2878 + fStack_2898;
      fStack_28f4 = fStack_2874 + fStack_2894;
      fStack_28f0 = fStack_2870 + fStack_2890;
      fStack_28ec = fStack_286c + fStack_288c;
      fStack_28e8 = fStack_2868 + fStack_2888;
      fStack_28e4 = fStack_2864 + fStack_2884;
      fStack_29f8 = 0.070376836;
      local_2a00 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_29f4 = 0.070376836;
      fStack_29f0 = 0.070376836;
      fStack_29ec = 0.070376836;
      fStack_29e8 = 0.070376836;
      uStack_29e4 = 0x3d9021bb;
      auVar211._8_4_ = -0.1151461;
      auVar211._12_4_ = -0.1151461;
      auVar211._0_4_ = -0.1151461;
      auVar211._4_4_ = -0.1151461;
      auVar211._16_4_ = -0.1151461;
      auVar211._20_4_ = -0.1151461;
      auVar211._24_4_ = -0.1151461;
      auVar211._28_4_ = -0.1151461;
      auVar20 = vfmadd213ps_fma(_local_2900,_local_2a00,auVar211);
      auVar212._8_4_ = 0.116769984;
      auVar212._12_4_ = 0.116769984;
      auVar212._0_4_ = 0.116769984;
      auVar212._4_4_ = 0.116769984;
      auVar212._16_4_ = 0.116769984;
      auVar212._20_4_ = 0.116769984;
      auVar212._24_4_ = 0.116769984;
      auVar212._28_4_ = 0.116769984;
      auVar20 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar20),auVar212);
      auVar213._8_4_ = -0.12420141;
      auVar213._12_4_ = -0.12420141;
      auVar213._0_4_ = -0.12420141;
      auVar213._4_4_ = -0.12420141;
      auVar213._16_4_ = -0.12420141;
      auVar213._20_4_ = -0.12420141;
      auVar213._24_4_ = -0.12420141;
      auVar213._28_4_ = -0.12420141;
      auVar20 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar20),auVar213);
      auVar214._8_4_ = 0.14249323;
      auVar214._12_4_ = 0.14249323;
      auVar214._0_4_ = 0.14249323;
      auVar214._4_4_ = 0.14249323;
      auVar214._16_4_ = 0.14249323;
      auVar214._20_4_ = 0.14249323;
      auVar214._24_4_ = 0.14249323;
      auVar214._28_4_ = 0.14249323;
      auVar20 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar20),auVar214);
      auVar215._8_4_ = -0.16668057;
      auVar215._12_4_ = -0.16668057;
      auVar215._0_4_ = -0.16668057;
      auVar215._4_4_ = -0.16668057;
      auVar215._16_4_ = -0.16668057;
      auVar215._20_4_ = -0.16668057;
      auVar215._24_4_ = -0.16668057;
      auVar215._28_4_ = -0.16668057;
      auVar20 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar20),auVar215);
      auVar216._8_4_ = 0.20000714;
      auVar216._12_4_ = 0.20000714;
      auVar216._0_4_ = 0.20000714;
      auVar216._4_4_ = 0.20000714;
      auVar216._16_4_ = 0.20000714;
      auVar216._20_4_ = 0.20000714;
      auVar216._24_4_ = 0.20000714;
      auVar216._28_4_ = 0.20000714;
      auVar20 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar20),auVar216);
      auVar217._8_4_ = -0.24999994;
      auVar217._12_4_ = -0.24999994;
      auVar217._0_4_ = -0.24999994;
      auVar217._4_4_ = -0.24999994;
      auVar217._16_4_ = -0.24999994;
      auVar217._20_4_ = -0.24999994;
      auVar217._24_4_ = -0.24999994;
      auVar217._28_4_ = -0.24999994;
      auVar20 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar20),auVar217);
      auVar218._8_4_ = 0.3333333;
      auVar218._12_4_ = 0.3333333;
      auVar218._0_4_ = 0.3333333;
      auVar218._4_4_ = 0.3333333;
      auVar218._16_4_ = 0.3333333;
      auVar218._20_4_ = 0.3333333;
      auVar218._24_4_ = 0.3333333;
      auVar218._28_4_ = 0.3333333;
      auVar20 = vfmadd213ps_fma(_local_2900,ZEXT1632(auVar20),auVar218);
      local_2740 = auVar20._0_4_;
      fStack_273c = auVar20._4_4_;
      fStack_2738 = auVar20._8_4_;
      fStack_2734 = auVar20._12_4_;
      local_2a00._4_4_ =
           fStack_273c * (float)local_2900._4_4_ * (float)local_2900._4_4_ * (float)local_2900._4_4_
      ;
      local_2a00._0_4_ =
           local_2740 * (float)local_2900._0_4_ * (float)local_2900._0_4_ * (float)local_2900._0_4_;
      fStack_29f8 = fStack_2738 * fStack_28f8 * fStack_28f8 * fStack_28f8;
      fStack_29f4 = fStack_2734 * fStack_28f4 * fStack_28f4 * fStack_28f4;
      fStack_29f0 = fStack_28f0 * 0.0 * fStack_28f0 * fStack_28f0;
      fStack_29ec = fStack_28ec * 0.0 * fStack_28ec * fStack_28ec;
      fStack_29e8 = fStack_28e8 * 0.0 * fStack_28e8 * fStack_28e8;
      uStack_29e4 = 0;
      auVar219._8_4_ = -0.00021219444;
      auVar219._12_4_ = -0.00021219444;
      auVar219._0_4_ = -0.00021219444;
      auVar219._4_4_ = -0.00021219444;
      auVar219._16_4_ = -0.00021219444;
      auVar219._20_4_ = -0.00021219444;
      auVar219._24_4_ = -0.00021219444;
      auVar219._28_4_ = -0.00021219444;
      auVar20 = vfmadd213ps_fma(auVar219,auVar285,_local_2a00);
      auVar268._4_4_ = (float)local_2900._4_4_ * (float)local_2900._4_4_;
      auVar268._0_4_ = (float)local_2900._0_4_ * (float)local_2900._0_4_;
      auVar268._8_4_ = fStack_28f8 * fStack_28f8;
      auVar268._12_4_ = fStack_28f4 * fStack_28f4;
      auVar268._16_4_ = fStack_28f0 * fStack_28f0;
      auVar268._20_4_ = fStack_28ec * fStack_28ec;
      auVar268._24_4_ = fStack_28e8 * fStack_28e8;
      auVar268._28_4_ = fStack_28e4;
      auVar226._8_4_ = 0.5;
      auVar226._12_4_ = 0.5;
      auVar226._0_4_ = 0.5;
      auVar226._4_4_ = 0.5;
      auVar226._16_4_ = 0.5;
      auVar226._20_4_ = 0.5;
      auVar226._24_4_ = 0.5;
      auVar226._28_4_ = 0.5;
      auVar20 = vfnmadd213ps_fma(auVar226,auVar268,ZEXT1632(auVar20));
      local_28e0 = auVar20._0_4_;
      fStack_28dc = auVar20._4_4_;
      fStack_28d8 = auVar20._8_4_;
      fStack_28d4 = auVar20._12_4_;
      local_2900._4_4_ = (float)local_2900._4_4_ + fStack_28dc;
      local_2900._0_4_ = (float)local_2900._0_4_ + local_28e0;
      fStack_28f8 = fStack_28f8 + fStack_28d8;
      fStack_28f4 = fStack_28f4 + fStack_28d4;
      fStack_28f0 = fStack_28f0 + 0.0;
      fStack_28ec = fStack_28ec + 0.0;
      fStack_28e8 = fStack_28e8 + 0.0;
      fStack_28e4 = fStack_28e4 + 0.0;
      auVar220._8_4_ = 0.6933594;
      auVar220._12_4_ = 0.6933594;
      auVar220._0_4_ = 0.6933594;
      auVar220._4_4_ = 0.6933594;
      auVar220._16_4_ = 0.6933594;
      auVar220._20_4_ = 0.6933594;
      auVar220._24_4_ = 0.6933594;
      auVar220._28_4_ = 0.6933594;
      auVar20 = vfmadd213ps_fma(auVar220,auVar285,_local_2900);
      auVar16 = vpor_avx2(ZEXT1632(auVar20),auVar16);
      local_3300 = auVar18._0_4_;
      fStack_32fc = auVar18._4_4_;
      fStack_32f8 = auVar18._8_4_;
      fStack_32f4 = auVar18._12_4_;
      fStack_32f0 = auVar19._0_4_;
      fStack_32ec = auVar19._4_4_;
      fStack_32e8 = auVar19._8_4_;
      uStack_32e4 = auVar19._12_4_;
      local_3320 = auVar16._0_4_;
      fStack_331c = auVar16._4_4_;
      fStack_3318 = auVar16._8_4_;
      fStack_3314 = auVar16._12_4_;
      fStack_3310 = auVar16._16_4_;
      fStack_330c = auVar16._20_4_;
      fStack_3308 = auVar16._24_4_;
      local_2f00._4_4_ = fStack_32fc * fStack_331c;
      local_2f00._0_4_ = local_3300 * local_3320;
      fStack_2ef8 = fStack_32f8 * fStack_3318;
      fStack_2ef4 = fStack_32f4 * fStack_3314;
      uStack_2ef0._0_4_ = fStack_32f0 * fStack_3310;
      uStack_2ef0._4_4_ = fStack_32ec * fStack_330c;
      uStack_2ee8._0_4_ = fStack_32e8 * fStack_3308;
      uStack_2ee8._4_4_ = uStack_32e4;
      auVar16 = _local_2f00;
      uStack_2ee8 = auVar16._24_8_;
      auVar23._16_8_ = uStack_2ef0;
      auVar23._0_16_ = _local_2f00;
      auVar23._24_8_ = uStack_2ee8;
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar22._16_4_ = 0x42b0c0a5;
      auVar22._20_4_ = 0x42b0c0a5;
      auVar22._24_4_ = 0x42b0c0a5;
      auVar22._28_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar23,auVar22);
      auVar285._8_4_ = 0xc2b0c0a5;
      auVar285._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar285._12_4_ = 0xc2b0c0a5;
      auVar285._16_4_ = 0xc2b0c0a5;
      auVar285._20_4_ = 0xc2b0c0a5;
      auVar285._24_4_ = 0xc2b0c0a5;
      auVar285._28_4_ = 0xc2b0c0a5;
      auVar285 = vmaxps_avx(auVar16,auVar285);
      auVar195._8_4_ = 1.442695;
      auVar195._12_4_ = 1.442695;
      auVar195._0_4_ = 1.442695;
      auVar195._4_4_ = 1.442695;
      auVar195._16_4_ = 1.442695;
      auVar195._20_4_ = 1.442695;
      auVar195._24_4_ = 1.442695;
      auVar195._28_4_ = 1.442695;
      auVar194._8_4_ = 0.5;
      auVar194._12_4_ = 0.5;
      auVar194._0_4_ = 0.5;
      auVar194._4_4_ = 0.5;
      auVar194._16_4_ = 0.5;
      auVar194._20_4_ = 0.5;
      auVar194._24_4_ = 0.5;
      auVar194._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar195,auVar285,auVar194);
      auVar22 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar16 = vcmpps_avx(ZEXT1632(auVar18),auVar22,1);
      auVar185._8_8_ = 0x3f8000003f800000;
      auVar185._0_8_ = 0x3f8000003f800000;
      auVar185._16_8_ = 0x3f8000003f800000;
      auVar185._24_8_ = 0x3f8000003f800000;
      auVar16 = vpand_avx2(auVar16,auVar185);
      auVar16 = vsubps_avx(auVar22,auVar16);
      auVar223._8_4_ = 0.6933594;
      auVar223._12_4_ = 0.6933594;
      auVar223._0_4_ = 0.6933594;
      auVar223._4_4_ = 0.6933594;
      auVar223._16_4_ = 0.6933594;
      auVar223._20_4_ = 0.6933594;
      auVar223._24_4_ = 0.6933594;
      auVar223._28_4_ = 0.6933594;
      auVar18 = vfnmadd213ps_fma(auVar223,auVar16,auVar285);
      auVar224._8_4_ = -0.00021219444;
      auVar224._12_4_ = -0.00021219444;
      auVar224._0_4_ = -0.00021219444;
      auVar224._4_4_ = -0.00021219444;
      auVar224._16_4_ = -0.00021219444;
      auVar224._20_4_ = -0.00021219444;
      auVar224._24_4_ = -0.00021219444;
      auVar224._28_4_ = -0.00021219444;
      auVar18 = vfnmadd213ps_fma(auVar224,auVar16,ZEXT1632(auVar18));
      auVar285 = ZEXT1632(auVar18);
      local_2e00 = auVar18._0_4_;
      fStack_2dfc = auVar18._4_4_;
      fStack_2df8 = auVar18._8_4_;
      fStack_2df4 = auVar18._12_4_;
      _local_2f20 = ZEXT1632(CONCAT412(fStack_2df4 * fStack_2df4,
                                       CONCAT48(fStack_2df8 * fStack_2df8,
                                                CONCAT44(fStack_2dfc * fStack_2dfc,
                                                         local_2e00 * local_2e00))));
      uStack_2fb8._0_4_ = 0x39506967;
      local_2fc0 = (undefined1  [8])0x3950696739506967;
      uStack_2fb8._4_4_ = 0x39506967;
      uStack_2fb0._0_4_ = 0x39506967;
      uStack_2fb0._4_4_ = 0x39506967;
      uStack_2fa8._0_4_ = 0x39506967;
      uStack_2fa8._4_4_ = 0x39506967;
      auVar196._8_4_ = 0.0013981999;
      auVar196._12_4_ = 0.0013981999;
      auVar196._0_4_ = 0.0013981999;
      auVar196._4_4_ = 0.0013981999;
      auVar196._16_4_ = 0.0013981999;
      auVar196._20_4_ = 0.0013981999;
      auVar196._24_4_ = 0.0013981999;
      auVar196._28_4_ = 0.0013981999;
      auVar18 = vfmadd213ps_fma(auVar285,_local_2fc0,auVar196);
      auVar197._8_4_ = 0.008333452;
      auVar197._12_4_ = 0.008333452;
      auVar197._0_4_ = 0.008333452;
      auVar197._4_4_ = 0.008333452;
      auVar197._16_4_ = 0.008333452;
      auVar197._20_4_ = 0.008333452;
      auVar197._24_4_ = 0.008333452;
      auVar197._28_4_ = 0.008333452;
      auVar18 = vfmadd213ps_fma(auVar285,ZEXT1632(auVar18),auVar197);
      auVar198._8_4_ = 0.041665796;
      auVar198._12_4_ = 0.041665796;
      auVar198._0_4_ = 0.041665796;
      auVar198._4_4_ = 0.041665796;
      auVar198._16_4_ = 0.041665796;
      auVar198._20_4_ = 0.041665796;
      auVar198._24_4_ = 0.041665796;
      auVar198._28_4_ = 0.041665796;
      auVar18 = vfmadd213ps_fma(auVar285,ZEXT1632(auVar18),auVar198);
      auVar199._8_4_ = 0.16666666;
      auVar199._12_4_ = 0.16666666;
      auVar199._0_4_ = 0.16666666;
      auVar199._4_4_ = 0.16666666;
      auVar199._16_4_ = 0.16666666;
      auVar199._20_4_ = 0.16666666;
      auVar199._24_4_ = 0.16666666;
      auVar199._28_4_ = 0.16666666;
      auVar18 = vfmadd213ps_fma(auVar285,ZEXT1632(auVar18),auVar199);
      auVar200._8_4_ = 0.5;
      auVar200._12_4_ = 0.5;
      auVar200._0_4_ = 0.5;
      auVar200._4_4_ = 0.5;
      auVar200._16_4_ = 0.5;
      auVar200._20_4_ = 0.5;
      auVar200._24_4_ = 0.5;
      auVar200._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar285,ZEXT1632(auVar18),auVar200);
      auVar18 = vfmadd213ps_fma(_local_2f20,ZEXT1632(auVar18),auVar285);
      local_2ec0 = auVar18._0_4_;
      fStack_2ebc = auVar18._4_4_;
      fStack_2eb8 = auVar18._8_4_;
      fStack_2eb4 = auVar18._12_4_;
      local_2040 = auVar16._0_4_;
      fStack_203c = auVar16._4_4_;
      fStack_2038 = auVar16._8_4_;
      fStack_2034 = auVar16._12_4_;
      fStack_2030 = auVar16._16_4_;
      fStack_202c = auVar16._20_4_;
      fStack_2028 = auVar16._24_4_;
      fStack_2024 = auVar16._28_4_;
      local_2f60._4_4_ = (int)fStack_203c;
      local_2f60._0_4_ = (int)local_2040;
      local_2f60._8_4_ = (int)fStack_2038;
      local_2f60._12_4_ = (int)fStack_2034;
      uStack_2f50._0_4_ = (int)fStack_2030;
      uStack_2f50._4_4_ = (int)fStack_202c;
      uStack_2f48._0_4_ = (int)fStack_2028;
      uStack_2f48._4_4_ = (int)fStack_2024;
      auVar16 = _local_2f60;
      uStack_2f48 = auVar16._24_8_;
      auVar230._16_8_ = uStack_2f50;
      auVar230._0_16_ = local_2f60;
      auVar230._24_8_ = uStack_2f48;
      auVar229._8_8_ = 0x7f0000007f;
      auVar229._0_8_ = 0x7f0000007f;
      auVar229._16_8_ = 0x7f0000007f;
      auVar229._24_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx2(auVar230,auVar229);
      auVar16 = vpslld_avx2(auVar16,ZEXT416(0x17));
      local_2e60 = auVar16._0_4_;
      fStack_2e5c = auVar16._4_4_;
      fStack_2e58 = auVar16._8_4_;
      fStack_2e54 = auVar16._12_4_;
      fStack_2e50 = auVar16._16_4_;
      fStack_2e4c = auVar16._20_4_;
      fStack_2e48 = auVar16._24_4_;
      local_2fc0._4_4_ = (fStack_2ebc + 1.0) * fStack_2e5c;
      local_2fc0._0_4_ = (local_2ec0 + 1.0) * local_2e60;
      uStack_2fb8._0_4_ = (fStack_2eb8 + 1.0) * fStack_2e58;
      uStack_2fb8._4_4_ = (fStack_2eb4 + 1.0) * fStack_2e54;
      uStack_2fb0._0_4_ = fStack_2e50 * 1.0;
      uStack_2fb0._4_4_ = fStack_2e4c * 1.0;
      auVar277 = _local_2fc0;
      uStack_2fa8._0_4_ = fStack_2e48 * 1.0;
      uStack_2fa8._4_4_ = 0x3f800000;
      auVar16 = _local_2fc0;
      uStack_2fb0 = auVar277._16_8_;
      uStack_2fa8 = auVar16._24_8_;
      *local_a5e0 = local_2fc0;
      local_a5e0[1] = uStack_2fb8;
      local_a5e0[2] = uStack_2fb0;
      local_a5e0[3] = uStack_2fa8;
      local_a5d8 = local_a5d8 + 1;
      local_a5e0 = local_a5e0 + 4;
    }
  }
  if (in_R8D == 4) {
    local_a844 = 0;
    uVar25 = *(undefined8 *)*in_RDI;
    uVar29 = *(undefined8 *)(*in_RDI + 8);
    auVar270 = *(undefined1 (*) [16])*in_RDI;
    auVar20 = *(undefined1 (*) [16])*in_RDI;
    auVar19 = *(undefined1 (*) [16])*in_RDI;
    auVar18 = *(undefined1 (*) [16])*in_RDI;
    auVar17._16_8_ = uVar25;
    auVar17._0_16_ = *(undefined1 (*) [16])*in_RDI;
    auVar17._24_8_ = uVar29;
    auVar282 = vinsertf64x4_avx512f
                         (ZEXT3264(CONCAT824(uVar29,CONCAT816(uVar25,*(undefined1 (*) [16])*in_RDI))
                                  ),auVar17,1);
    for (; local_a844 + 3 < in_ECX; local_a844 = local_a844 + 4) {
      fVar284 = *local_a5d8;
      fVar287 = local_a5d8[1];
      fVar288 = local_a5d8[2];
      auVar286._4_4_ = fVar288;
      auVar286._0_4_ = fVar288;
      auVar286._12_4_ = fVar288;
      auVar286._8_4_ = fVar288;
      fVar288 = local_a5d8[3];
      auVar286._20_4_ = fVar288;
      auVar286._16_4_ = fVar288;
      auVar286._28_4_ = fVar288;
      auVar286._24_4_ = fVar288;
      auVar281 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(CONCAT44(fVar287,fVar287),
                                               CONCAT816(CONCAT44(fVar287,fVar287),
                                                         CONCAT88(CONCAT44(fVar284,fVar284),
                                                                  CONCAT44(fVar284,fVar284))))),
                            auVar286,1);
      uVar24 = vcmpps_avx512f(auVar282,ZEXT1664(ZEXT816(0)),2);
      auVar41._8_4_ = 0x800000;
      auVar41._12_4_ = 0x800000;
      auVar41._0_4_ = 0x800000;
      auVar41._4_4_ = 0x800000;
      auVar41._16_4_ = 0x800000;
      auVar41._20_4_ = 0x800000;
      auVar41._24_4_ = 0x800000;
      auVar41._28_4_ = 0x800000;
      auVar41._32_4_ = 0x800000;
      auVar41._36_4_ = 0x800000;
      auVar41._40_4_ = 0x800000;
      auVar41._44_4_ = 0x800000;
      auVar41._48_4_ = 0x800000;
      auVar41._52_4_ = 0x800000;
      auVar41._56_4_ = 0x800000;
      auVar41._60_4_ = 0x800000;
      auVar280 = vmaxps_avx512f(auVar282,auVar41);
      auVar283 = vmovdqa64_avx512f(auVar280);
      auVar283 = vpsrld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar168._8_4_ = -0x7f800001;
      auVar168._12_4_ = -0x7f800001;
      auVar168._0_4_ = -0x7f800001;
      auVar168._4_4_ = -0x7f800001;
      auVar168._16_4_ = -0x7f800001;
      auVar168._20_4_ = -0x7f800001;
      auVar168._24_4_ = -0x7f800001;
      auVar168._28_4_ = -0x7f800001;
      auVar168._32_4_ = -0x7f800001;
      auVar168._36_4_ = -0x7f800001;
      auVar168._40_4_ = -0x7f800001;
      auVar168._44_4_ = -0x7f800001;
      auVar168._48_4_ = -0x7f800001;
      auVar168._52_4_ = -0x7f800001;
      auVar168._56_4_ = -0x7f800001;
      auVar168._60_4_ = -0x7f800001;
      auVar279 = vmovdqa64_avx512f(auVar168);
      auVar280 = vpandd_avx512f(auVar280,auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar171._8_4_ = 0.5;
      auVar171._12_4_ = 0.5;
      auVar171._0_4_ = 0.5;
      auVar171._4_4_ = 0.5;
      auVar171._16_4_ = 0.5;
      auVar171._20_4_ = 0.5;
      auVar171._24_4_ = 0.5;
      auVar171._28_4_ = 0.5;
      auVar171._32_4_ = 0.5;
      auVar171._36_4_ = 0.5;
      auVar171._40_4_ = 0.5;
      auVar171._44_4_ = 0.5;
      auVar171._48_4_ = 0.5;
      auVar171._52_4_ = 0.5;
      auVar171._56_4_ = 0.5;
      auVar171._60_4_ = 0.5;
      auVar279 = vmovdqa64_avx512f(auVar171);
      auVar280 = vpord_avx512f(auVar280,auVar279);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar279 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar279 = vmovdqa64_avx512f(auVar279);
      auVar283 = vpsubd_avx512f(auVar283,auVar279);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vcvtdq2ps_avx512f(auVar283);
      auVar36._8_4_ = 1.0;
      auVar36._12_4_ = 1.0;
      auVar36._0_4_ = 1.0;
      auVar36._4_4_ = 1.0;
      auVar36._16_4_ = 1.0;
      auVar36._20_4_ = 1.0;
      auVar36._24_4_ = 1.0;
      auVar36._28_4_ = 1.0;
      auVar36._32_4_ = 1.0;
      auVar36._36_4_ = 1.0;
      auVar36._40_4_ = 1.0;
      auVar36._44_4_ = 1.0;
      auVar36._48_4_ = 1.0;
      auVar36._52_4_ = 1.0;
      auVar36._56_4_ = 1.0;
      auVar36._60_4_ = 1.0;
      auVar283 = vaddps_avx512f(auVar283,auVar36);
      uVar26 = vcmpps_avx512f(auVar280,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar28 = (ushort)uVar26;
      auVar37._8_4_ = 1.0;
      auVar37._12_4_ = 1.0;
      auVar37._0_4_ = 1.0;
      auVar37._4_4_ = 1.0;
      auVar37._16_4_ = 1.0;
      auVar37._20_4_ = 1.0;
      auVar37._24_4_ = 1.0;
      auVar37._28_4_ = 1.0;
      auVar37._32_4_ = 1.0;
      auVar37._36_4_ = 1.0;
      auVar37._40_4_ = 1.0;
      auVar37._44_4_ = 1.0;
      auVar37._48_4_ = 1.0;
      auVar37._52_4_ = 1.0;
      auVar37._56_4_ = 1.0;
      auVar37._60_4_ = 1.0;
      auVar279 = vsubps_avx512f(auVar280,auVar37);
      auVar144._8_4_ = 1.0;
      auVar144._12_4_ = 1.0;
      auVar144._0_4_ = 1.0;
      auVar144._4_4_ = 1.0;
      auVar144._16_4_ = 1.0;
      auVar144._20_4_ = 1.0;
      auVar144._24_4_ = 1.0;
      auVar144._28_4_ = 1.0;
      auVar144._32_4_ = 1.0;
      auVar144._36_4_ = 1.0;
      auVar144._40_4_ = 1.0;
      auVar144._44_4_ = 1.0;
      auVar144._48_4_ = 1.0;
      auVar144._52_4_ = 1.0;
      auVar144._56_4_ = 1.0;
      auVar144._60_4_ = 1.0;
      local_5300 = auVar283._0_4_;
      iStack_52fc = auVar283._4_4_;
      iStack_52f8 = auVar283._8_4_;
      iStack_52f4 = auVar283._12_4_;
      iStack_52f0 = auVar283._16_4_;
      iStack_52ec = auVar283._20_4_;
      iStack_52e8 = auVar283._24_4_;
      iStack_52e4 = auVar283._28_4_;
      iStack_52e0 = auVar283._32_4_;
      iStack_52dc = auVar283._36_4_;
      iStack_52d8 = auVar283._40_4_;
      iStack_52d4 = auVar283._44_4_;
      iStack_52d0 = auVar283._48_4_;
      iStack_52cc = auVar283._52_4_;
      iStack_52c8 = auVar283._56_4_;
      iStack_52c4 = auVar283._60_4_;
      auVar283 = vsubps_avx512f(auVar283,auVar144);
      bVar1 = (bool)((byte)uVar26 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar26 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8ec0._4_4_ = (uint)bVar2 * auVar283._4_4_ | (uint)!bVar2 * iStack_52fc;
      local_8ec0._0_4_ = (uint)bVar1 * auVar283._0_4_ | (uint)!bVar1 * local_5300;
      local_8ec0._8_4_ = (uint)bVar3 * auVar283._8_4_ | (uint)!bVar3 * iStack_52f8;
      local_8ec0._12_4_ = (uint)bVar4 * auVar283._12_4_ | (uint)!bVar4 * iStack_52f4;
      uStack_8eb0._0_4_ = (uint)bVar5 * auVar283._16_4_ | (uint)!bVar5 * iStack_52f0;
      uStack_8eb0._4_4_ = (uint)bVar6 * auVar283._20_4_ | (uint)!bVar6 * iStack_52ec;
      uStack_8ea8._0_4_ = (uint)bVar7 * auVar283._24_4_ | (uint)!bVar7 * iStack_52e8;
      uStack_8ea8._4_4_ = (uint)bVar8 * auVar283._28_4_ | (uint)!bVar8 * iStack_52e4;
      auVar17 = _local_8ec0;
      uStack_8ea0._0_4_ =
           (uint)(bVar9 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_52e0;
      uStack_8ea0._4_4_ = (uint)bVar10 * auVar283._36_4_ | (uint)!bVar10 * iStack_52dc;
      auVar271 = _local_8ec0;
      uStack_8e98._0_4_ = (uint)bVar11 * auVar283._40_4_ | (uint)!bVar11 * iStack_52d8;
      uStack_8e98._4_4_ = (uint)bVar12 * auVar283._44_4_ | (uint)!bVar12 * iStack_52d4;
      auVar272 = _local_8ec0;
      uStack_8e90._0_4_ = (uint)bVar13 * auVar283._48_4_ | (uint)!bVar13 * iStack_52d0;
      uStack_8e90._4_4_ = (uint)bVar14 * auVar283._52_4_ | (uint)!bVar14 * iStack_52cc;
      auVar273 = _local_8ec0;
      uStack_8e88._0_4_ = (uint)bVar15 * auVar283._56_4_ | (uint)!bVar15 * iStack_52c8;
      uStack_8e88._4_4_ =
           (uint)(bVar9 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_52c4;
      auVar283 = _local_8ec0;
      local_3440 = auVar279._0_4_;
      iStack_343c = auVar279._4_4_;
      iStack_3438 = auVar279._8_4_;
      iStack_3434 = auVar279._12_4_;
      iStack_3430 = auVar279._16_4_;
      iStack_342c = auVar279._20_4_;
      iStack_3428 = auVar279._24_4_;
      iStack_3424 = auVar279._28_4_;
      iStack_3420 = auVar279._32_4_;
      iStack_341c = auVar279._36_4_;
      iStack_3418 = auVar279._40_4_;
      iStack_3414 = auVar279._44_4_;
      iStack_3410 = auVar279._48_4_;
      iStack_340c = auVar279._52_4_;
      iStack_3408 = auVar279._56_4_;
      iStack_3404 = auVar279._60_4_;
      auVar280 = vaddps_avx512f(auVar279,auVar280);
      bVar1 = (bool)((byte)uVar26 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_8dc0._4_4_ = (uint)bVar2 * auVar280._4_4_ | (uint)!bVar2 * iStack_343c;
      local_8dc0._0_4_ = (uint)bVar1 * auVar280._0_4_ | (uint)!bVar1 * local_3440;
      local_8dc0._8_4_ = (uint)bVar3 * auVar280._8_4_ | (uint)!bVar3 * iStack_3438;
      local_8dc0._12_4_ = (uint)bVar4 * auVar280._12_4_ | (uint)!bVar4 * iStack_3434;
      uStack_8db0._0_4_ = (uint)bVar5 * auVar280._16_4_ | (uint)!bVar5 * iStack_3430;
      uStack_8db0._4_4_ = (uint)bVar6 * auVar280._20_4_ | (uint)!bVar6 * iStack_342c;
      uStack_8da8._0_4_ = (uint)bVar7 * auVar280._24_4_ | (uint)!bVar7 * iStack_3428;
      uStack_8da8._4_4_ = (uint)bVar8 * auVar280._28_4_ | (uint)!bVar8 * iStack_3424;
      auVar286 = _local_8dc0;
      uStack_8da0._0_4_ =
           (uint)(bVar9 & 1) * auVar280._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_3420;
      uStack_8da0._4_4_ = (uint)bVar10 * auVar280._36_4_ | (uint)!bVar10 * iStack_341c;
      auVar274 = _local_8dc0;
      uStack_8d98._0_4_ = (uint)bVar11 * auVar280._40_4_ | (uint)!bVar11 * iStack_3418;
      uStack_8d98._4_4_ = (uint)bVar12 * auVar280._44_4_ | (uint)!bVar12 * iStack_3414;
      auVar275 = _local_8dc0;
      uStack_8d90._0_4_ = (uint)bVar13 * auVar280._48_4_ | (uint)!bVar13 * iStack_3410;
      uStack_8d90._4_4_ = (uint)bVar14 * auVar280._52_4_ | (uint)!bVar14 * iStack_340c;
      auVar276 = _local_8dc0;
      uStack_8d88._0_4_ = (uint)bVar15 * auVar280._56_4_ | (uint)!bVar15 * iStack_3408;
      uStack_8d88._4_4_ =
           (uint)(bVar9 >> 7) * auVar280._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_3404;
      auVar280 = _local_8dc0;
      uStack_8da8 = auVar286._24_8_;
      uStack_8da0 = auVar274._32_8_;
      uStack_8d98 = auVar275._40_8_;
      uStack_8d90 = auVar276._48_8_;
      uStack_8d88 = auVar280._56_8_;
      auVar40._16_8_ = uStack_8db0;
      auVar40._0_16_ = local_8dc0;
      auVar40._24_8_ = uStack_8da8;
      auVar40._32_8_ = uStack_8da0;
      auVar40._40_8_ = uStack_8d98;
      auVar40._48_8_ = uStack_8d90;
      auVar40._56_8_ = uStack_8d88;
      auVar39._16_8_ = uStack_8db0;
      auVar39._0_16_ = local_8dc0;
      auVar39._24_8_ = uStack_8da8;
      auVar39._32_8_ = uStack_8da0;
      auVar39._40_8_ = uStack_8d98;
      auVar39._48_8_ = uStack_8d90;
      auVar39._56_8_ = uStack_8d88;
      auVar280 = vmulps_avx512f(auVar40,auVar39);
      local_8fc0._8_4_ = 0.070376836;
      local_8fc0._12_4_ = 0.070376836;
      local_8fc0._0_4_ = 0.070376836;
      local_8fc0._4_4_ = 0.070376836;
      auVar118._16_4_ = 0.070376836;
      auVar118._20_4_ = 0.070376836;
      auVar118._0_16_ = local_8fc0._0_16_;
      auVar118._24_4_ = 0.070376836;
      auVar118._28_4_ = 0.070376836;
      auVar118._32_4_ = 0.070376836;
      auVar118._36_4_ = 0.070376836;
      auVar118._40_4_ = 0.070376836;
      auVar118._44_4_ = 0.070376836;
      auVar118._48_4_ = 0.070376836;
      auVar118._52_4_ = 0.070376836;
      auVar118._56_4_ = 0.070376836;
      auVar118._60_4_ = 0.070376836;
      auVar117._16_8_ = uStack_8db0;
      auVar117._0_16_ = local_8dc0;
      auVar117._24_8_ = uStack_8da8;
      auVar117._32_8_ = uStack_8da0;
      auVar117._40_8_ = uStack_8d98;
      auVar117._48_8_ = uStack_8d90;
      auVar117._56_8_ = uStack_8d88;
      auVar116._8_4_ = -0.1151461;
      auVar116._12_4_ = -0.1151461;
      auVar116._0_4_ = -0.1151461;
      auVar116._4_4_ = -0.1151461;
      auVar116._16_4_ = -0.1151461;
      auVar116._20_4_ = -0.1151461;
      auVar116._24_4_ = -0.1151461;
      auVar116._28_4_ = -0.1151461;
      auVar116._32_4_ = -0.1151461;
      auVar116._36_4_ = -0.1151461;
      auVar116._40_4_ = -0.1151461;
      auVar116._44_4_ = -0.1151461;
      auVar116._48_4_ = -0.1151461;
      auVar116._52_4_ = -0.1151461;
      auVar116._56_4_ = -0.1151461;
      auVar116._60_4_ = -0.1151461;
      auVar279 = vfmadd213ps_avx512f(auVar117,auVar118,auVar116);
      auVar115._16_8_ = uStack_8db0;
      auVar115._0_16_ = local_8dc0;
      auVar115._24_8_ = uStack_8da8;
      auVar115._32_8_ = uStack_8da0;
      auVar115._40_8_ = uStack_8d98;
      auVar115._48_8_ = uStack_8d90;
      auVar115._56_8_ = uStack_8d88;
      auVar114._8_4_ = 0.116769984;
      auVar114._12_4_ = 0.116769984;
      auVar114._0_4_ = 0.116769984;
      auVar114._4_4_ = 0.116769984;
      auVar114._16_4_ = 0.116769984;
      auVar114._20_4_ = 0.116769984;
      auVar114._24_4_ = 0.116769984;
      auVar114._28_4_ = 0.116769984;
      auVar114._32_4_ = 0.116769984;
      auVar114._36_4_ = 0.116769984;
      auVar114._40_4_ = 0.116769984;
      auVar114._44_4_ = 0.116769984;
      auVar114._48_4_ = 0.116769984;
      auVar114._52_4_ = 0.116769984;
      auVar114._56_4_ = 0.116769984;
      auVar114._60_4_ = 0.116769984;
      auVar279 = vfmadd213ps_avx512f(auVar115,auVar279,auVar114);
      auVar113._16_8_ = uStack_8db0;
      auVar113._0_16_ = local_8dc0;
      auVar113._24_8_ = uStack_8da8;
      auVar113._32_8_ = uStack_8da0;
      auVar113._40_8_ = uStack_8d98;
      auVar113._48_8_ = uStack_8d90;
      auVar113._56_8_ = uStack_8d88;
      auVar112._8_4_ = -0.12420141;
      auVar112._12_4_ = -0.12420141;
      auVar112._0_4_ = -0.12420141;
      auVar112._4_4_ = -0.12420141;
      auVar112._16_4_ = -0.12420141;
      auVar112._20_4_ = -0.12420141;
      auVar112._24_4_ = -0.12420141;
      auVar112._28_4_ = -0.12420141;
      auVar112._32_4_ = -0.12420141;
      auVar112._36_4_ = -0.12420141;
      auVar112._40_4_ = -0.12420141;
      auVar112._44_4_ = -0.12420141;
      auVar112._48_4_ = -0.12420141;
      auVar112._52_4_ = -0.12420141;
      auVar112._56_4_ = -0.12420141;
      auVar112._60_4_ = -0.12420141;
      auVar279 = vfmadd213ps_avx512f(auVar113,auVar279,auVar112);
      auVar111._16_8_ = uStack_8db0;
      auVar111._0_16_ = local_8dc0;
      auVar111._24_8_ = uStack_8da8;
      auVar111._32_8_ = uStack_8da0;
      auVar111._40_8_ = uStack_8d98;
      auVar111._48_8_ = uStack_8d90;
      auVar111._56_8_ = uStack_8d88;
      auVar110._8_4_ = 0.14249323;
      auVar110._12_4_ = 0.14249323;
      auVar110._0_4_ = 0.14249323;
      auVar110._4_4_ = 0.14249323;
      auVar110._16_4_ = 0.14249323;
      auVar110._20_4_ = 0.14249323;
      auVar110._24_4_ = 0.14249323;
      auVar110._28_4_ = 0.14249323;
      auVar110._32_4_ = 0.14249323;
      auVar110._36_4_ = 0.14249323;
      auVar110._40_4_ = 0.14249323;
      auVar110._44_4_ = 0.14249323;
      auVar110._48_4_ = 0.14249323;
      auVar110._52_4_ = 0.14249323;
      auVar110._56_4_ = 0.14249323;
      auVar110._60_4_ = 0.14249323;
      auVar279 = vfmadd213ps_avx512f(auVar111,auVar279,auVar110);
      auVar109._16_8_ = uStack_8db0;
      auVar109._0_16_ = local_8dc0;
      auVar109._24_8_ = uStack_8da8;
      auVar109._32_8_ = uStack_8da0;
      auVar109._40_8_ = uStack_8d98;
      auVar109._48_8_ = uStack_8d90;
      auVar109._56_8_ = uStack_8d88;
      auVar108._8_4_ = -0.16668057;
      auVar108._12_4_ = -0.16668057;
      auVar108._0_4_ = -0.16668057;
      auVar108._4_4_ = -0.16668057;
      auVar108._16_4_ = -0.16668057;
      auVar108._20_4_ = -0.16668057;
      auVar108._24_4_ = -0.16668057;
      auVar108._28_4_ = -0.16668057;
      auVar108._32_4_ = -0.16668057;
      auVar108._36_4_ = -0.16668057;
      auVar108._40_4_ = -0.16668057;
      auVar108._44_4_ = -0.16668057;
      auVar108._48_4_ = -0.16668057;
      auVar108._52_4_ = -0.16668057;
      auVar108._56_4_ = -0.16668057;
      auVar108._60_4_ = -0.16668057;
      auVar279 = vfmadd213ps_avx512f(auVar109,auVar279,auVar108);
      auVar107._16_8_ = uStack_8db0;
      auVar107._0_16_ = local_8dc0;
      auVar107._24_8_ = uStack_8da8;
      auVar107._32_8_ = uStack_8da0;
      auVar107._40_8_ = uStack_8d98;
      auVar107._48_8_ = uStack_8d90;
      auVar107._56_8_ = uStack_8d88;
      auVar106._8_4_ = 0.20000714;
      auVar106._12_4_ = 0.20000714;
      auVar106._0_4_ = 0.20000714;
      auVar106._4_4_ = 0.20000714;
      auVar106._16_4_ = 0.20000714;
      auVar106._20_4_ = 0.20000714;
      auVar106._24_4_ = 0.20000714;
      auVar106._28_4_ = 0.20000714;
      auVar106._32_4_ = 0.20000714;
      auVar106._36_4_ = 0.20000714;
      auVar106._40_4_ = 0.20000714;
      auVar106._44_4_ = 0.20000714;
      auVar106._48_4_ = 0.20000714;
      auVar106._52_4_ = 0.20000714;
      auVar106._56_4_ = 0.20000714;
      auVar106._60_4_ = 0.20000714;
      auVar279 = vfmadd213ps_avx512f(auVar107,auVar279,auVar106);
      auVar105._16_8_ = uStack_8db0;
      auVar105._0_16_ = local_8dc0;
      auVar105._24_8_ = uStack_8da8;
      auVar105._32_8_ = uStack_8da0;
      auVar105._40_8_ = uStack_8d98;
      auVar105._48_8_ = uStack_8d90;
      auVar105._56_8_ = uStack_8d88;
      auVar104._8_4_ = -0.24999994;
      auVar104._12_4_ = -0.24999994;
      auVar104._0_4_ = -0.24999994;
      auVar104._4_4_ = -0.24999994;
      auVar104._16_4_ = -0.24999994;
      auVar104._20_4_ = -0.24999994;
      auVar104._24_4_ = -0.24999994;
      auVar104._28_4_ = -0.24999994;
      auVar104._32_4_ = -0.24999994;
      auVar104._36_4_ = -0.24999994;
      auVar104._40_4_ = -0.24999994;
      auVar104._44_4_ = -0.24999994;
      auVar104._48_4_ = -0.24999994;
      auVar104._52_4_ = -0.24999994;
      auVar104._56_4_ = -0.24999994;
      auVar104._60_4_ = -0.24999994;
      auVar279 = vfmadd213ps_avx512f(auVar105,auVar279,auVar104);
      auVar103._16_8_ = uStack_8db0;
      auVar103._0_16_ = local_8dc0;
      auVar103._24_8_ = uStack_8da8;
      auVar103._32_8_ = uStack_8da0;
      auVar103._40_8_ = uStack_8d98;
      auVar103._48_8_ = uStack_8d90;
      auVar103._56_8_ = uStack_8d88;
      auVar102._8_4_ = 0.3333333;
      auVar102._12_4_ = 0.3333333;
      auVar102._0_4_ = 0.3333333;
      auVar102._4_4_ = 0.3333333;
      auVar102._16_4_ = 0.3333333;
      auVar102._20_4_ = 0.3333333;
      auVar102._24_4_ = 0.3333333;
      auVar102._28_4_ = 0.3333333;
      auVar102._32_4_ = 0.3333333;
      auVar102._36_4_ = 0.3333333;
      auVar102._40_4_ = 0.3333333;
      auVar102._44_4_ = 0.3333333;
      auVar102._48_4_ = 0.3333333;
      auVar102._52_4_ = 0.3333333;
      auVar102._56_4_ = 0.3333333;
      auVar102._60_4_ = 0.3333333;
      auVar279 = vfmadd213ps_avx512f(auVar103,auVar279,auVar102);
      auVar38._16_8_ = uStack_8db0;
      auVar38._0_16_ = local_8dc0;
      auVar38._24_8_ = uStack_8da8;
      auVar38._32_8_ = uStack_8da0;
      auVar38._40_8_ = uStack_8d98;
      auVar38._48_8_ = uStack_8d90;
      auVar38._56_8_ = uStack_8d88;
      auVar279 = vmulps_avx512f(auVar279,auVar38);
      auVar279 = vmulps_avx512f(auVar279,auVar280);
      uStack_8ea8 = auVar17._24_8_;
      uStack_8ea0 = auVar271._32_8_;
      uStack_8e98 = auVar272._40_8_;
      uStack_8e90 = auVar273._48_8_;
      uStack_8e88 = auVar283._56_8_;
      auVar101._16_8_ = uStack_8eb0;
      auVar101._0_16_ = local_8ec0;
      auVar101._24_8_ = uStack_8ea8;
      auVar101._32_8_ = uStack_8ea0;
      auVar101._40_8_ = uStack_8e98;
      auVar101._48_8_ = uStack_8e90;
      auVar101._56_8_ = uStack_8e88;
      auVar100._8_4_ = -0.00021219444;
      auVar100._12_4_ = -0.00021219444;
      auVar100._0_4_ = -0.00021219444;
      auVar100._4_4_ = -0.00021219444;
      auVar100._16_4_ = -0.00021219444;
      auVar100._20_4_ = -0.00021219444;
      auVar100._24_4_ = -0.00021219444;
      auVar100._28_4_ = -0.00021219444;
      auVar100._32_4_ = -0.00021219444;
      auVar100._36_4_ = -0.00021219444;
      auVar100._40_4_ = -0.00021219444;
      auVar100._44_4_ = -0.00021219444;
      auVar100._48_4_ = -0.00021219444;
      auVar100._52_4_ = -0.00021219444;
      auVar100._56_4_ = -0.00021219444;
      auVar100._60_4_ = -0.00021219444;
      auVar283 = vfmadd213ps_avx512f(auVar100,auVar101,auVar279);
      auVar150._8_4_ = 0.5;
      auVar150._12_4_ = 0.5;
      auVar150._0_4_ = 0.5;
      auVar150._4_4_ = 0.5;
      auVar150._16_4_ = 0.5;
      auVar150._20_4_ = 0.5;
      auVar150._24_4_ = 0.5;
      auVar150._28_4_ = 0.5;
      auVar150._32_4_ = 0.5;
      auVar150._36_4_ = 0.5;
      auVar150._40_4_ = 0.5;
      auVar150._44_4_ = 0.5;
      auVar150._48_4_ = 0.5;
      auVar150._52_4_ = 0.5;
      auVar150._56_4_ = 0.5;
      auVar150._60_4_ = 0.5;
      auVar283 = vfnmadd213ps_avx512f(auVar150,auVar280,auVar283);
      auVar35._16_8_ = uStack_8db0;
      auVar35._0_16_ = local_8dc0;
      auVar35._24_8_ = uStack_8da8;
      auVar35._32_8_ = uStack_8da0;
      auVar35._40_8_ = uStack_8d98;
      auVar35._48_8_ = uStack_8d90;
      auVar35._56_8_ = uStack_8d88;
      auVar283 = vaddps_avx512f(auVar35,auVar283);
      auVar99._16_8_ = uStack_8eb0;
      auVar99._0_16_ = local_8ec0;
      auVar99._24_8_ = uStack_8ea8;
      auVar99._32_8_ = uStack_8ea0;
      auVar99._40_8_ = uStack_8e98;
      auVar99._48_8_ = uStack_8e90;
      auVar99._56_8_ = uStack_8e88;
      auVar98._8_4_ = 0.6933594;
      auVar98._12_4_ = 0.6933594;
      auVar98._0_4_ = 0.6933594;
      auVar98._4_4_ = 0.6933594;
      auVar98._16_4_ = 0.6933594;
      auVar98._20_4_ = 0.6933594;
      auVar98._24_4_ = 0.6933594;
      auVar98._28_4_ = 0.6933594;
      auVar98._32_4_ = 0.6933594;
      auVar98._36_4_ = 0.6933594;
      auVar98._40_4_ = 0.6933594;
      auVar98._44_4_ = 0.6933594;
      auVar98._48_4_ = 0.6933594;
      auVar98._52_4_ = 0.6933594;
      auVar98._56_4_ = 0.6933594;
      auVar98._60_4_ = 0.6933594;
      auVar280 = vfmadd213ps_avx512f(auVar98,auVar99,auVar283);
      auVar283 = vpmovm2d_avx512dq(uVar24 & 0xffff);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpord_avx512f(auVar280,auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(auVar281,auVar283);
      auVar32._8_4_ = 88.37626;
      auVar32._12_4_ = 88.37626;
      auVar32._0_4_ = 88.37626;
      auVar32._4_4_ = 88.37626;
      auVar32._16_4_ = 88.37626;
      auVar32._20_4_ = 88.37626;
      auVar32._24_4_ = 88.37626;
      auVar32._28_4_ = 88.37626;
      auVar32._32_4_ = 88.37626;
      auVar32._36_4_ = 88.37626;
      auVar32._40_4_ = 88.37626;
      auVar32._44_4_ = 88.37626;
      auVar32._48_4_ = 88.37626;
      auVar32._52_4_ = 88.37626;
      auVar32._56_4_ = 88.37626;
      auVar32._60_4_ = 88.37626;
      auVar283 = vminps_avx512f(auVar283,auVar32);
      auVar31._8_4_ = -88.37626;
      auVar31._12_4_ = -88.37626;
      auVar31._0_4_ = -88.37626;
      auVar31._4_4_ = -88.37626;
      auVar31._16_4_ = -88.37626;
      auVar31._20_4_ = -88.37626;
      auVar31._24_4_ = -88.37626;
      auVar31._28_4_ = -88.37626;
      auVar31._32_4_ = -88.37626;
      auVar31._36_4_ = -88.37626;
      auVar31._40_4_ = -88.37626;
      auVar31._44_4_ = -88.37626;
      auVar31._48_4_ = -88.37626;
      auVar31._52_4_ = -88.37626;
      auVar31._56_4_ = -88.37626;
      auVar31._60_4_ = -88.37626;
      auVar280 = vmaxps_avx512f(auVar283,auVar31);
      auVar141._8_4_ = 1.442695;
      auVar141._12_4_ = 1.442695;
      auVar141._0_4_ = 1.442695;
      auVar141._4_4_ = 1.442695;
      auVar141._16_4_ = 1.442695;
      auVar141._20_4_ = 1.442695;
      auVar141._24_4_ = 1.442695;
      auVar141._28_4_ = 1.442695;
      auVar141._32_4_ = 1.442695;
      auVar141._36_4_ = 1.442695;
      auVar141._40_4_ = 1.442695;
      auVar141._44_4_ = 1.442695;
      auVar141._48_4_ = 1.442695;
      auVar141._52_4_ = 1.442695;
      auVar141._56_4_ = 1.442695;
      auVar141._60_4_ = 1.442695;
      auVar140._8_4_ = 0.5;
      auVar140._12_4_ = 0.5;
      auVar140._0_4_ = 0.5;
      auVar140._4_4_ = 0.5;
      auVar140._16_4_ = 0.5;
      auVar140._20_4_ = 0.5;
      auVar140._24_4_ = 0.5;
      auVar140._28_4_ = 0.5;
      auVar140._32_4_ = 0.5;
      auVar140._36_4_ = 0.5;
      auVar140._40_4_ = 0.5;
      auVar140._44_4_ = 0.5;
      auVar140._48_4_ = 0.5;
      auVar140._52_4_ = 0.5;
      auVar140._56_4_ = 0.5;
      auVar140._60_4_ = 0.5;
      auVar283 = vfmadd213ps_avx512f(auVar141,auVar280,auVar140);
      auVar279 = vrndscaleps_avx512f(auVar283,1);
      uVar26 = vcmpps_avx512f(auVar283,auVar279,1);
      uVar28 = (ushort)uVar26;
      auVar147._8_4_ = 1.0;
      auVar147._12_4_ = 1.0;
      auVar147._0_4_ = 1.0;
      auVar147._4_4_ = 1.0;
      auVar147._16_4_ = 1.0;
      auVar147._20_4_ = 1.0;
      auVar147._24_4_ = 1.0;
      auVar147._28_4_ = 1.0;
      auVar147._32_4_ = 1.0;
      auVar147._36_4_ = 1.0;
      auVar147._40_4_ = 1.0;
      auVar147._44_4_ = 1.0;
      auVar147._48_4_ = 1.0;
      auVar147._52_4_ = 1.0;
      auVar147._56_4_ = 1.0;
      auVar147._60_4_ = 1.0;
      local_4e80 = auVar279._0_4_;
      iStack_4e7c = auVar279._4_4_;
      iStack_4e78 = auVar279._8_4_;
      iStack_4e74 = auVar279._12_4_;
      iStack_4e70 = auVar279._16_4_;
      iStack_4e6c = auVar279._20_4_;
      iStack_4e68 = auVar279._24_4_;
      iStack_4e64 = auVar279._28_4_;
      iStack_4e60 = auVar279._32_4_;
      iStack_4e5c = auVar279._36_4_;
      iStack_4e58 = auVar279._40_4_;
      iStack_4e54 = auVar279._44_4_;
      iStack_4e50 = auVar279._48_4_;
      iStack_4e4c = auVar279._52_4_;
      iStack_4e48 = auVar279._56_4_;
      iStack_4e44 = auVar279._60_4_;
      auVar283 = vsubps_avx512f(auVar279,auVar147);
      bVar1 = (bool)((byte)uVar26 & 1);
      bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar26 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_9c00._4_4_ = (uint)bVar2 * auVar283._4_4_ | (uint)!bVar2 * iStack_4e7c;
      local_9c00._0_4_ = (uint)bVar1 * auVar283._0_4_ | (uint)!bVar1 * local_4e80;
      local_9c00._8_4_ = (uint)bVar3 * auVar283._8_4_ | (uint)!bVar3 * iStack_4e78;
      local_9c00._12_4_ = (uint)bVar4 * auVar283._12_4_ | (uint)!bVar4 * iStack_4e74;
      uStack_9bf0._0_4_ = (uint)bVar5 * auVar283._16_4_ | (uint)!bVar5 * iStack_4e70;
      uStack_9bf0._4_4_ = (uint)bVar6 * auVar283._20_4_ | (uint)!bVar6 * iStack_4e6c;
      uStack_9be8._0_4_ = (uint)bVar7 * auVar283._24_4_ | (uint)!bVar7 * iStack_4e68;
      uStack_9be8._4_4_ = (uint)bVar8 * auVar283._28_4_ | (uint)!bVar8 * iStack_4e64;
      auVar17 = _local_9c00;
      uStack_9be0._0_4_ =
           (uint)(bVar9 & 1) * auVar283._32_4_ | (uint)!(bool)(bVar9 & 1) * iStack_4e60;
      uStack_9be0._4_4_ = (uint)bVar10 * auVar283._36_4_ | (uint)!bVar10 * iStack_4e5c;
      auVar271 = _local_9c00;
      uStack_9bd8._0_4_ = (uint)bVar11 * auVar283._40_4_ | (uint)!bVar11 * iStack_4e58;
      uStack_9bd8._4_4_ = (uint)bVar12 * auVar283._44_4_ | (uint)!bVar12 * iStack_4e54;
      auVar272 = _local_9c00;
      uStack_9bd0._0_4_ = (uint)bVar13 * auVar283._48_4_ | (uint)!bVar13 * iStack_4e50;
      uStack_9bd0._4_4_ = (uint)bVar14 * auVar283._52_4_ | (uint)!bVar14 * iStack_4e4c;
      auVar273 = _local_9c00;
      uStack_9bc8._0_4_ = (uint)bVar15 * auVar283._56_4_ | (uint)!bVar15 * iStack_4e48;
      uStack_9bc8._4_4_ =
           (uint)(bVar9 >> 7) * auVar283._60_4_ | (uint)!(bool)(bVar9 >> 7) * iStack_4e44;
      auVar283 = _local_9c00;
      uStack_9be8 = auVar17._24_8_;
      uStack_9be0 = auVar271._32_8_;
      uStack_9bd8 = auVar272._40_8_;
      uStack_9bd0 = auVar273._48_8_;
      uStack_9bc8 = auVar283._56_8_;
      auVar162._16_8_ = uStack_9bf0;
      auVar162._0_16_ = local_9c00;
      auVar162._24_8_ = uStack_9be8;
      auVar162._32_8_ = uStack_9be0;
      auVar162._40_8_ = uStack_9bd8;
      auVar162._48_8_ = uStack_9bd0;
      auVar162._56_8_ = uStack_9bc8;
      auVar161._8_4_ = 0.6933594;
      auVar161._12_4_ = 0.6933594;
      auVar161._0_4_ = 0.6933594;
      auVar161._4_4_ = 0.6933594;
      auVar161._16_4_ = 0.6933594;
      auVar161._20_4_ = 0.6933594;
      auVar161._24_4_ = 0.6933594;
      auVar161._28_4_ = 0.6933594;
      auVar161._32_4_ = 0.6933594;
      auVar161._36_4_ = 0.6933594;
      auVar161._40_4_ = 0.6933594;
      auVar161._44_4_ = 0.6933594;
      auVar161._48_4_ = 0.6933594;
      auVar161._52_4_ = 0.6933594;
      auVar161._56_4_ = 0.6933594;
      auVar161._60_4_ = 0.6933594;
      auVar283 = vfnmadd213ps_avx512f(auVar161,auVar162,auVar280);
      auVar160._16_8_ = uStack_9bf0;
      auVar160._0_16_ = local_9c00;
      auVar160._24_8_ = uStack_9be8;
      auVar160._32_8_ = uStack_9be0;
      auVar160._40_8_ = uStack_9bd8;
      auVar160._48_8_ = uStack_9bd0;
      auVar160._56_8_ = uStack_9bc8;
      auVar159._8_4_ = -0.00021219444;
      auVar159._12_4_ = -0.00021219444;
      auVar159._0_4_ = -0.00021219444;
      auVar159._4_4_ = -0.00021219444;
      auVar159._16_4_ = -0.00021219444;
      auVar159._20_4_ = -0.00021219444;
      auVar159._24_4_ = -0.00021219444;
      auVar159._28_4_ = -0.00021219444;
      auVar159._32_4_ = -0.00021219444;
      auVar159._36_4_ = -0.00021219444;
      auVar159._40_4_ = -0.00021219444;
      auVar159._44_4_ = -0.00021219444;
      auVar159._48_4_ = -0.00021219444;
      auVar159._52_4_ = -0.00021219444;
      auVar159._56_4_ = -0.00021219444;
      auVar159._60_4_ = -0.00021219444;
      auVar283 = vfnmadd213ps_avx512f(auVar159,auVar160,auVar283);
      auVar280 = vmulps_avx512f(auVar283,auVar283);
      uStack_9cf8._0_4_ = 0.00019875691;
      uStack_9cf8._4_4_ = 0.00019875691;
      local_9d00._0_4_ = 0.00019875691;
      local_9d00._4_4_ = 0.00019875691;
      auVar139._16_4_ = 0.00019875691;
      auVar139._20_4_ = 0.00019875691;
      auVar139._0_16_ = _local_9d00;
      auVar139._24_4_ = 0.00019875691;
      auVar139._28_4_ = 0.00019875691;
      auVar139._32_4_ = 0.00019875691;
      auVar139._36_4_ = 0.00019875691;
      auVar139._40_4_ = 0.00019875691;
      auVar139._44_4_ = 0.00019875691;
      auVar139._48_4_ = 0.00019875691;
      auVar139._52_4_ = 0.00019875691;
      auVar139._56_4_ = 0.00019875691;
      auVar139._60_4_ = 0.00019875691;
      auVar138._8_4_ = 0.0013981999;
      auVar138._12_4_ = 0.0013981999;
      auVar138._0_4_ = 0.0013981999;
      auVar138._4_4_ = 0.0013981999;
      auVar138._16_4_ = 0.0013981999;
      auVar138._20_4_ = 0.0013981999;
      auVar138._24_4_ = 0.0013981999;
      auVar138._28_4_ = 0.0013981999;
      auVar138._32_4_ = 0.0013981999;
      auVar138._36_4_ = 0.0013981999;
      auVar138._40_4_ = 0.0013981999;
      auVar138._44_4_ = 0.0013981999;
      auVar138._48_4_ = 0.0013981999;
      auVar138._52_4_ = 0.0013981999;
      auVar138._56_4_ = 0.0013981999;
      auVar138._60_4_ = 0.0013981999;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar139,auVar138);
      auVar137._8_4_ = 0.008333452;
      auVar137._12_4_ = 0.008333452;
      auVar137._0_4_ = 0.008333452;
      auVar137._4_4_ = 0.008333452;
      auVar137._16_4_ = 0.008333452;
      auVar137._20_4_ = 0.008333452;
      auVar137._24_4_ = 0.008333452;
      auVar137._28_4_ = 0.008333452;
      auVar137._32_4_ = 0.008333452;
      auVar137._36_4_ = 0.008333452;
      auVar137._40_4_ = 0.008333452;
      auVar137._44_4_ = 0.008333452;
      auVar137._48_4_ = 0.008333452;
      auVar137._52_4_ = 0.008333452;
      auVar137._56_4_ = 0.008333452;
      auVar137._60_4_ = 0.008333452;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar137);
      auVar136._8_4_ = 0.041665796;
      auVar136._12_4_ = 0.041665796;
      auVar136._0_4_ = 0.041665796;
      auVar136._4_4_ = 0.041665796;
      auVar136._16_4_ = 0.041665796;
      auVar136._20_4_ = 0.041665796;
      auVar136._24_4_ = 0.041665796;
      auVar136._28_4_ = 0.041665796;
      auVar136._32_4_ = 0.041665796;
      auVar136._36_4_ = 0.041665796;
      auVar136._40_4_ = 0.041665796;
      auVar136._44_4_ = 0.041665796;
      auVar136._48_4_ = 0.041665796;
      auVar136._52_4_ = 0.041665796;
      auVar136._56_4_ = 0.041665796;
      auVar136._60_4_ = 0.041665796;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar136);
      auVar135._8_4_ = 0.16666666;
      auVar135._12_4_ = 0.16666666;
      auVar135._0_4_ = 0.16666666;
      auVar135._4_4_ = 0.16666666;
      auVar135._16_4_ = 0.16666666;
      auVar135._20_4_ = 0.16666666;
      auVar135._24_4_ = 0.16666666;
      auVar135._28_4_ = 0.16666666;
      auVar135._32_4_ = 0.16666666;
      auVar135._36_4_ = 0.16666666;
      auVar135._40_4_ = 0.16666666;
      auVar135._44_4_ = 0.16666666;
      auVar135._48_4_ = 0.16666666;
      auVar135._52_4_ = 0.16666666;
      auVar135._56_4_ = 0.16666666;
      auVar135._60_4_ = 0.16666666;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar135);
      auVar134._8_4_ = 0.5;
      auVar134._12_4_ = 0.5;
      auVar134._0_4_ = 0.5;
      auVar134._4_4_ = 0.5;
      auVar134._16_4_ = 0.5;
      auVar134._20_4_ = 0.5;
      auVar134._24_4_ = 0.5;
      auVar134._28_4_ = 0.5;
      auVar134._32_4_ = 0.5;
      auVar134._36_4_ = 0.5;
      auVar134._40_4_ = 0.5;
      auVar134._44_4_ = 0.5;
      auVar134._48_4_ = 0.5;
      auVar134._52_4_ = 0.5;
      auVar134._56_4_ = 0.5;
      auVar134._60_4_ = 0.5;
      auVar279 = vfmadd213ps_avx512f(auVar283,auVar279,auVar134);
      auVar283 = vfmadd213ps_avx512f(auVar280,auVar279,auVar283);
      auVar30._8_4_ = 1.0;
      auVar30._12_4_ = 1.0;
      auVar30._0_4_ = 1.0;
      auVar30._4_4_ = 1.0;
      auVar30._16_4_ = 1.0;
      auVar30._20_4_ = 1.0;
      auVar30._24_4_ = 1.0;
      auVar30._28_4_ = 1.0;
      auVar30._32_4_ = 1.0;
      auVar30._36_4_ = 1.0;
      auVar30._40_4_ = 1.0;
      auVar30._44_4_ = 1.0;
      auVar30._48_4_ = 1.0;
      auVar30._52_4_ = 1.0;
      auVar30._56_4_ = 1.0;
      auVar30._60_4_ = 1.0;
      auVar279 = vaddps_avx512f(auVar283,auVar30);
      auVar165._16_8_ = uStack_9bf0;
      auVar165._0_16_ = local_9c00;
      auVar165._24_8_ = uStack_9be8;
      auVar165._32_8_ = uStack_9be0;
      auVar165._40_8_ = uStack_9bd8;
      auVar165._48_8_ = uStack_9bd0;
      auVar165._56_8_ = uStack_9bc8;
      auVar283 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar283);
      auVar283 = vcvttps2dq_avx512f(auVar165);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar280 = vmovdqa64_avx512f(auVar280);
      auVar283 = vpaddd_avx512f(auVar283,auVar280);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vpslld_avx512f(auVar283,ZEXT416(0x17));
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmovdqa64_avx512f(auVar283);
      auVar283 = vmulps_avx512f(auVar279,auVar283);
      local_9d00 = auVar283._0_8_;
      uStack_9cf8 = auVar283._8_8_;
      uStack_9cf0 = auVar283._16_8_;
      uStack_9ce8 = auVar283._24_8_;
      uStack_9ce0 = auVar283._32_8_;
      uStack_9cd8 = auVar283._40_8_;
      uStack_9cd0 = auVar283._48_8_;
      uStack_9cc8 = auVar283._56_8_;
      *local_a5e0 = local_9d00;
      local_a5e0[1] = uStack_9cf8;
      local_a5e0[2] = uStack_9cf0;
      local_a5e0[3] = uStack_9ce8;
      local_a5e0[4] = uStack_9ce0;
      local_a5e0[5] = uStack_9cd8;
      local_a5e0[6] = uStack_9cd0;
      local_a5e0[7] = uStack_9cc8;
      local_a5d8 = local_a5d8 + 4;
      local_a5e0 = local_a5e0 + 8;
    }
    for (; local_a844 + 1 < in_ECX; local_a844 = local_a844 + 2) {
      fVar284 = *local_a5d8;
      uStack_3168._4_4_ = local_a5d8[1];
      auVar266._16_8_ = uVar25;
      auVar266._0_16_ = auVar19;
      auVar266._24_8_ = uVar29;
      auVar265._16_8_ = uVar25;
      auVar265._0_16_ = auVar18;
      auVar265._24_8_ = uVar29;
      auVar17 = vcmpps_avx(auVar265,ZEXT1632(ZEXT816(0)),2);
      auVar177._8_4_ = 0x800000;
      auVar177._0_8_ = 0x80000000800000;
      auVar177._12_4_ = 0x800000;
      auVar177._16_4_ = 0x800000;
      auVar177._20_4_ = 0x800000;
      auVar177._24_4_ = 0x800000;
      auVar177._28_4_ = 0x800000;
      auVar286 = vmaxps_avx(auVar266,auVar177);
      auVar285 = vpsrld_avx2(auVar286,ZEXT416(0x17));
      auVar184._8_4_ = 0x807fffff;
      auVar184._0_8_ = 0x807fffff807fffff;
      auVar184._12_4_ = 0x807fffff;
      auVar184._16_4_ = 0x807fffff;
      auVar184._20_4_ = 0x807fffff;
      auVar184._24_4_ = 0x807fffff;
      auVar184._28_4_ = 0x807fffff;
      auVar286 = vpand_avx2(auVar286,auVar184);
      auVar232._8_4_ = 0x3f000000;
      auVar232._0_8_ = 0x3f0000003f000000;
      auVar232._12_4_ = 0x3f000000;
      auVar232._16_4_ = 0x3f000000;
      auVar232._20_4_ = 0x3f000000;
      auVar232._24_4_ = 0x3f000000;
      auVar232._28_4_ = 0x3f000000;
      auVar16 = vpor_avx2(auVar286,auVar232);
      auVar233._8_8_ = 0x7f0000007f;
      auVar233._0_8_ = 0x7f0000007f;
      auVar233._16_8_ = 0x7f0000007f;
      auVar233._24_8_ = 0x7f0000007f;
      auVar286 = vpsubd_avx2(auVar285,auVar233);
      auVar286 = vcvtdq2ps_avx(auVar286);
      local_2ba0 = auVar286._0_4_;
      fStack_2b9c = auVar286._4_4_;
      fStack_2b98 = auVar286._8_4_;
      fStack_2b94 = auVar286._12_4_;
      fStack_2b90 = auVar286._16_4_;
      fStack_2b8c = auVar286._20_4_;
      fStack_2b88 = auVar286._24_4_;
      fStack_2b84 = auVar286._28_4_;
      local_2ce0._4_4_ = fStack_2b9c + 1.0;
      local_2ce0._0_4_ = local_2ba0 + 1.0;
      fStack_2cd8 = fStack_2b98 + 1.0;
      fStack_2cd4 = fStack_2b94 + 1.0;
      uStack_2cd0._0_4_ = fStack_2b90 + 1.0;
      uStack_2cd0._4_4_ = fStack_2b8c + 1.0;
      uStack_2cc8._0_4_ = fStack_2b88 + 1.0;
      uStack_2cc8._4_4_ = fStack_2b84 + 1.0;
      auVar22 = _local_2ce0;
      auVar291._8_4_ = 0x3f3504f3;
      auVar291._0_8_ = 0x3f3504f33f3504f3;
      auVar291._12_4_ = 0x3f3504f3;
      auVar291._16_4_ = 0x3f3504f3;
      auVar291._20_4_ = 0x3f3504f3;
      auVar291._24_4_ = 0x3f3504f3;
      auVar291._28_4_ = 0x3f3504f3;
      auVar286 = vcmpps_avx(auVar16,auVar291,1);
      auVar285 = vpand_avx2(auVar16,auVar286);
      auVar176._8_8_ = 0x3f8000003f800000;
      auVar176._0_8_ = 0x3f8000003f800000;
      auVar176._16_8_ = 0x3f8000003f800000;
      auVar176._24_8_ = 0x3f8000003f800000;
      auVar16 = vsubps_avx(auVar16,auVar176);
      uStack_2cc8 = auVar22._24_8_;
      auVar183._8_8_ = 0x3f8000003f800000;
      auVar183._0_8_ = 0x3f8000003f800000;
      auVar183._16_8_ = 0x3f8000003f800000;
      auVar183._24_8_ = 0x3f8000003f800000;
      auVar286 = vpand_avx2(auVar183,auVar286);
      auVar175._16_8_ = uStack_2cd0;
      auVar175._0_16_ = _local_2ce0;
      auVar175._24_8_ = uStack_2cc8;
      auVar286 = vsubps_avx(auVar175,auVar286);
      local_2be0 = auVar16._0_4_;
      fStack_2bdc = auVar16._4_4_;
      fStack_2bd8 = auVar16._8_4_;
      fStack_2bd4 = auVar16._12_4_;
      fStack_2bd0 = auVar16._16_4_;
      fStack_2bcc = auVar16._20_4_;
      fStack_2bc8 = auVar16._24_4_;
      fStack_2bc4 = auVar16._28_4_;
      local_2c00 = auVar285._0_4_;
      fStack_2bfc = auVar285._4_4_;
      fStack_2bf8 = auVar285._8_4_;
      fStack_2bf4 = auVar285._12_4_;
      fStack_2bf0 = auVar285._16_4_;
      fStack_2bec = auVar285._20_4_;
      fStack_2be8 = auVar285._24_4_;
      fStack_2be4 = auVar285._28_4_;
      local_2c60._0_4_ = local_2be0 + local_2c00;
      local_2c60._4_4_ = fStack_2bdc + fStack_2bfc;
      fStack_2c58 = fStack_2bd8 + fStack_2bf8;
      fStack_2c54 = fStack_2bd4 + fStack_2bf4;
      fStack_2c50 = fStack_2bd0 + fStack_2bf0;
      fStack_2c4c = fStack_2bcc + fStack_2bec;
      fStack_2c48 = fStack_2bc8 + fStack_2be8;
      fStack_2c44 = fStack_2bc4 + fStack_2be4;
      fStack_2d58 = 0.070376836;
      local_2d60 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_2d54 = 0.070376836;
      fStack_2d50 = 0.070376836;
      fStack_2d4c = 0.070376836;
      fStack_2d48 = 0.070376836;
      uStack_2d44 = 0x3d9021bb;
      auVar201._8_4_ = -0.1151461;
      auVar201._12_4_ = -0.1151461;
      auVar201._0_4_ = -0.1151461;
      auVar201._4_4_ = -0.1151461;
      auVar201._16_4_ = -0.1151461;
      auVar201._20_4_ = -0.1151461;
      auVar201._24_4_ = -0.1151461;
      auVar201._28_4_ = -0.1151461;
      auVar27 = vfmadd213ps_fma(_local_2c60,_local_2d60,auVar201);
      auVar202._8_4_ = 0.116769984;
      auVar202._12_4_ = 0.116769984;
      auVar202._0_4_ = 0.116769984;
      auVar202._4_4_ = 0.116769984;
      auVar202._16_4_ = 0.116769984;
      auVar202._20_4_ = 0.116769984;
      auVar202._24_4_ = 0.116769984;
      auVar202._28_4_ = 0.116769984;
      auVar27 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar27),auVar202);
      auVar203._8_4_ = -0.12420141;
      auVar203._12_4_ = -0.12420141;
      auVar203._0_4_ = -0.12420141;
      auVar203._4_4_ = -0.12420141;
      auVar203._16_4_ = -0.12420141;
      auVar203._20_4_ = -0.12420141;
      auVar203._24_4_ = -0.12420141;
      auVar203._28_4_ = -0.12420141;
      auVar27 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar27),auVar203);
      auVar204._8_4_ = 0.14249323;
      auVar204._12_4_ = 0.14249323;
      auVar204._0_4_ = 0.14249323;
      auVar204._4_4_ = 0.14249323;
      auVar204._16_4_ = 0.14249323;
      auVar204._20_4_ = 0.14249323;
      auVar204._24_4_ = 0.14249323;
      auVar204._28_4_ = 0.14249323;
      auVar27 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar27),auVar204);
      auVar205._8_4_ = -0.16668057;
      auVar205._12_4_ = -0.16668057;
      auVar205._0_4_ = -0.16668057;
      auVar205._4_4_ = -0.16668057;
      auVar205._16_4_ = -0.16668057;
      auVar205._20_4_ = -0.16668057;
      auVar205._24_4_ = -0.16668057;
      auVar205._28_4_ = -0.16668057;
      auVar27 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar27),auVar205);
      auVar206._8_4_ = 0.20000714;
      auVar206._12_4_ = 0.20000714;
      auVar206._0_4_ = 0.20000714;
      auVar206._4_4_ = 0.20000714;
      auVar206._16_4_ = 0.20000714;
      auVar206._20_4_ = 0.20000714;
      auVar206._24_4_ = 0.20000714;
      auVar206._28_4_ = 0.20000714;
      auVar27 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar27),auVar206);
      auVar207._8_4_ = -0.24999994;
      auVar207._12_4_ = -0.24999994;
      auVar207._0_4_ = -0.24999994;
      auVar207._4_4_ = -0.24999994;
      auVar207._16_4_ = -0.24999994;
      auVar207._20_4_ = -0.24999994;
      auVar207._24_4_ = -0.24999994;
      auVar207._28_4_ = -0.24999994;
      auVar27 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar27),auVar207);
      auVar208._8_4_ = 0.3333333;
      auVar208._12_4_ = 0.3333333;
      auVar208._0_4_ = 0.3333333;
      auVar208._4_4_ = 0.3333333;
      auVar208._16_4_ = 0.3333333;
      auVar208._20_4_ = 0.3333333;
      auVar208._24_4_ = 0.3333333;
      auVar208._28_4_ = 0.3333333;
      auVar27 = vfmadd213ps_fma(_local_2c60,ZEXT1632(auVar27),auVar208);
      local_2aa0 = auVar27._0_4_;
      fStack_2a9c = auVar27._4_4_;
      fStack_2a98 = auVar27._8_4_;
      fStack_2a94 = auVar27._12_4_;
      local_2d60._4_4_ =
           fStack_2a9c * (float)local_2c60._4_4_ * (float)local_2c60._4_4_ * (float)local_2c60._4_4_
      ;
      local_2d60._0_4_ =
           local_2aa0 * (float)local_2c60._0_4_ * (float)local_2c60._0_4_ * (float)local_2c60._0_4_;
      fStack_2d58 = fStack_2a98 * fStack_2c58 * fStack_2c58 * fStack_2c58;
      fStack_2d54 = fStack_2a94 * fStack_2c54 * fStack_2c54 * fStack_2c54;
      fStack_2d50 = fStack_2c50 * 0.0 * fStack_2c50 * fStack_2c50;
      fStack_2d4c = fStack_2c4c * 0.0 * fStack_2c4c * fStack_2c4c;
      fStack_2d48 = fStack_2c48 * 0.0 * fStack_2c48 * fStack_2c48;
      uStack_2d44 = 0;
      auVar209._8_4_ = -0.00021219444;
      auVar209._12_4_ = -0.00021219444;
      auVar209._0_4_ = -0.00021219444;
      auVar209._4_4_ = -0.00021219444;
      auVar209._16_4_ = -0.00021219444;
      auVar209._20_4_ = -0.00021219444;
      auVar209._24_4_ = -0.00021219444;
      auVar209._28_4_ = -0.00021219444;
      auVar27 = vfmadd213ps_fma(auVar209,auVar286,_local_2d60);
      auVar267._4_4_ = (float)local_2c60._4_4_ * (float)local_2c60._4_4_;
      auVar267._0_4_ = (float)local_2c60._0_4_ * (float)local_2c60._0_4_;
      auVar267._8_4_ = fStack_2c58 * fStack_2c58;
      auVar267._12_4_ = fStack_2c54 * fStack_2c54;
      auVar267._16_4_ = fStack_2c50 * fStack_2c50;
      auVar267._20_4_ = fStack_2c4c * fStack_2c4c;
      auVar267._24_4_ = fStack_2c48 * fStack_2c48;
      auVar267._28_4_ = fStack_2c44;
      auVar225._8_4_ = 0.5;
      auVar225._12_4_ = 0.5;
      auVar225._0_4_ = 0.5;
      auVar225._4_4_ = 0.5;
      auVar225._16_4_ = 0.5;
      auVar225._20_4_ = 0.5;
      auVar225._24_4_ = 0.5;
      auVar225._28_4_ = 0.5;
      auVar27 = vfnmadd213ps_fma(auVar225,auVar267,ZEXT1632(auVar27));
      local_2c40 = auVar27._0_4_;
      fStack_2c3c = auVar27._4_4_;
      fStack_2c38 = auVar27._8_4_;
      fStack_2c34 = auVar27._12_4_;
      local_2c60._4_4_ = (float)local_2c60._4_4_ + fStack_2c3c;
      local_2c60._0_4_ = (float)local_2c60._0_4_ + local_2c40;
      fStack_2c58 = fStack_2c58 + fStack_2c38;
      fStack_2c54 = fStack_2c54 + fStack_2c34;
      fStack_2c50 = fStack_2c50 + 0.0;
      fStack_2c4c = fStack_2c4c + 0.0;
      fStack_2c48 = fStack_2c48 + 0.0;
      fStack_2c44 = fStack_2c44 + 0.0;
      auVar210._8_4_ = 0.6933594;
      auVar210._12_4_ = 0.6933594;
      auVar210._0_4_ = 0.6933594;
      auVar210._4_4_ = 0.6933594;
      auVar210._16_4_ = 0.6933594;
      auVar210._20_4_ = 0.6933594;
      auVar210._24_4_ = 0.6933594;
      auVar210._28_4_ = 0.6933594;
      auVar27 = vfmadd213ps_fma(auVar210,auVar286,_local_2c60);
      auVar17 = vpor_avx2(ZEXT1632(auVar27),auVar17);
      local_32a0 = auVar17._0_4_;
      fStack_329c = auVar17._4_4_;
      fStack_3298 = auVar17._8_4_;
      fStack_3294 = auVar17._12_4_;
      fStack_3290 = auVar17._16_4_;
      fStack_328c = auVar17._20_4_;
      fStack_3288 = auVar17._24_4_;
      local_3180._4_4_ = fVar284 * fStack_329c;
      local_3180._0_4_ = fVar284 * local_32a0;
      fStack_3178 = fVar284 * fStack_3298;
      fStack_3174 = fVar284 * fStack_3294;
      uStack_3170._0_4_ = uStack_3168._4_4_ * fStack_3290;
      uStack_3170._4_4_ = uStack_3168._4_4_ * fStack_328c;
      uStack_3168._0_4_ = uStack_3168._4_4_ * fStack_3288;
      auVar17 = _local_3180;
      uStack_3168 = auVar17._24_8_;
      auVar174._16_8_ = uStack_3170;
      auVar174._0_16_ = _local_3180;
      auVar174._24_8_ = uStack_3168;
      auVar173._8_4_ = 0x42b0c0a5;
      auVar173._0_8_ = 0x42b0c0a542b0c0a5;
      auVar173._12_4_ = 0x42b0c0a5;
      auVar173._16_4_ = 0x42b0c0a5;
      auVar173._20_4_ = 0x42b0c0a5;
      auVar173._24_4_ = 0x42b0c0a5;
      auVar173._28_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar174,auVar173);
      auVar172._8_4_ = 0xc2b0c0a5;
      auVar172._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar172._12_4_ = 0xc2b0c0a5;
      auVar172._16_4_ = 0xc2b0c0a5;
      auVar172._20_4_ = 0xc2b0c0a5;
      auVar172._24_4_ = 0xc2b0c0a5;
      auVar172._28_4_ = 0xc2b0c0a5;
      auVar286 = vmaxps_avx(auVar17,auVar172);
      auVar188._8_4_ = 1.442695;
      auVar188._12_4_ = 1.442695;
      auVar188._0_4_ = 1.442695;
      auVar188._4_4_ = 1.442695;
      auVar188._16_4_ = 1.442695;
      auVar188._20_4_ = 1.442695;
      auVar188._24_4_ = 1.442695;
      auVar188._28_4_ = 1.442695;
      auVar187._8_4_ = 0.5;
      auVar187._12_4_ = 0.5;
      auVar187._0_4_ = 0.5;
      auVar187._4_4_ = 0.5;
      auVar187._16_4_ = 0.5;
      auVar187._20_4_ = 0.5;
      auVar187._24_4_ = 0.5;
      auVar187._28_4_ = 0.5;
      auVar27 = vfmadd213ps_fma(auVar188,auVar286,auVar187);
      auVar16 = vroundps_avx(ZEXT1632(auVar27),1);
      auVar17 = vcmpps_avx(ZEXT1632(auVar27),auVar16,1);
      auVar186._8_8_ = 0x3f8000003f800000;
      auVar186._0_8_ = 0x3f8000003f800000;
      auVar186._16_8_ = 0x3f8000003f800000;
      auVar186._24_8_ = 0x3f8000003f800000;
      auVar17 = vpand_avx2(auVar17,auVar186);
      auVar17 = vsubps_avx(auVar16,auVar17);
      auVar221._8_4_ = 0.6933594;
      auVar221._12_4_ = 0.6933594;
      auVar221._0_4_ = 0.6933594;
      auVar221._4_4_ = 0.6933594;
      auVar221._16_4_ = 0.6933594;
      auVar221._20_4_ = 0.6933594;
      auVar221._24_4_ = 0.6933594;
      auVar221._28_4_ = 0.6933594;
      auVar27 = vfnmadd213ps_fma(auVar221,auVar17,auVar286);
      auVar222._8_4_ = -0.00021219444;
      auVar222._12_4_ = -0.00021219444;
      auVar222._0_4_ = -0.00021219444;
      auVar222._4_4_ = -0.00021219444;
      auVar222._16_4_ = -0.00021219444;
      auVar222._20_4_ = -0.00021219444;
      auVar222._24_4_ = -0.00021219444;
      auVar222._28_4_ = -0.00021219444;
      auVar27 = vfnmadd213ps_fma(auVar222,auVar17,ZEXT1632(auVar27));
      auVar286 = ZEXT1632(auVar27);
      local_3080 = auVar27._0_4_;
      fStack_307c = auVar27._4_4_;
      fStack_3078 = auVar27._8_4_;
      fStack_3074 = auVar27._12_4_;
      _local_31a0 = ZEXT1632(CONCAT412(fStack_3074 * fStack_3074,
                                       CONCAT48(fStack_3078 * fStack_3078,
                                                CONCAT44(fStack_307c * fStack_307c,
                                                         local_3080 * local_3080))));
      uStack_3238._0_4_ = 0x39506967;
      local_3240 = (undefined1  [8])0x3950696739506967;
      uStack_3238._4_4_ = 0x39506967;
      uStack_3230._0_4_ = 0x39506967;
      uStack_3230._4_4_ = 0x39506967;
      uStack_3228._0_4_ = 0x39506967;
      uStack_3228._4_4_ = 0x39506967;
      auVar189._8_4_ = 0.0013981999;
      auVar189._12_4_ = 0.0013981999;
      auVar189._0_4_ = 0.0013981999;
      auVar189._4_4_ = 0.0013981999;
      auVar189._16_4_ = 0.0013981999;
      auVar189._20_4_ = 0.0013981999;
      auVar189._24_4_ = 0.0013981999;
      auVar189._28_4_ = 0.0013981999;
      auVar27 = vfmadd213ps_fma(auVar286,_local_3240,auVar189);
      auVar190._8_4_ = 0.008333452;
      auVar190._12_4_ = 0.008333452;
      auVar190._0_4_ = 0.008333452;
      auVar190._4_4_ = 0.008333452;
      auVar190._16_4_ = 0.008333452;
      auVar190._20_4_ = 0.008333452;
      auVar190._24_4_ = 0.008333452;
      auVar190._28_4_ = 0.008333452;
      auVar27 = vfmadd213ps_fma(auVar286,ZEXT1632(auVar27),auVar190);
      auVar191._8_4_ = 0.041665796;
      auVar191._12_4_ = 0.041665796;
      auVar191._0_4_ = 0.041665796;
      auVar191._4_4_ = 0.041665796;
      auVar191._16_4_ = 0.041665796;
      auVar191._20_4_ = 0.041665796;
      auVar191._24_4_ = 0.041665796;
      auVar191._28_4_ = 0.041665796;
      auVar27 = vfmadd213ps_fma(auVar286,ZEXT1632(auVar27),auVar191);
      auVar192._8_4_ = 0.16666666;
      auVar192._12_4_ = 0.16666666;
      auVar192._0_4_ = 0.16666666;
      auVar192._4_4_ = 0.16666666;
      auVar192._16_4_ = 0.16666666;
      auVar192._20_4_ = 0.16666666;
      auVar192._24_4_ = 0.16666666;
      auVar192._28_4_ = 0.16666666;
      auVar27 = vfmadd213ps_fma(auVar286,ZEXT1632(auVar27),auVar192);
      auVar193._8_4_ = 0.5;
      auVar193._12_4_ = 0.5;
      auVar193._0_4_ = 0.5;
      auVar193._4_4_ = 0.5;
      auVar193._16_4_ = 0.5;
      auVar193._20_4_ = 0.5;
      auVar193._24_4_ = 0.5;
      auVar193._28_4_ = 0.5;
      auVar27 = vfmadd213ps_fma(auVar286,ZEXT1632(auVar27),auVar193);
      auVar27 = vfmadd213ps_fma(_local_31a0,ZEXT1632(auVar27),auVar286);
      local_3140 = auVar27._0_4_;
      fStack_313c = auVar27._4_4_;
      fStack_3138 = auVar27._8_4_;
      fStack_3134 = auVar27._12_4_;
      local_2020 = auVar17._0_4_;
      fStack_201c = auVar17._4_4_;
      fStack_2018 = auVar17._8_4_;
      fStack_2014 = auVar17._12_4_;
      fStack_2010 = auVar17._16_4_;
      fStack_200c = auVar17._20_4_;
      fStack_2008 = auVar17._24_4_;
      fStack_2004 = auVar17._28_4_;
      local_31e0._4_4_ = (int)fStack_201c;
      local_31e0._0_4_ = (int)local_2020;
      local_31e0._8_4_ = (int)fStack_2018;
      local_31e0._12_4_ = (int)fStack_2014;
      uStack_31d0._0_4_ = (int)fStack_2010;
      uStack_31d0._4_4_ = (int)fStack_200c;
      uStack_31c8._0_4_ = (int)fStack_2008;
      uStack_31c8._4_4_ = (int)fStack_2004;
      auVar17 = _local_31e0;
      uStack_31c8 = auVar17._24_8_;
      auVar228._16_8_ = uStack_31d0;
      auVar228._0_16_ = local_31e0;
      auVar228._24_8_ = uStack_31c8;
      auVar227._8_8_ = 0x7f0000007f;
      auVar227._0_8_ = 0x7f0000007f;
      auVar227._16_8_ = 0x7f0000007f;
      auVar227._24_8_ = 0x7f0000007f;
      auVar17 = vpaddd_avx2(auVar228,auVar227);
      auVar17 = vpslld_avx2(auVar17,ZEXT416(0x17));
      local_30e0 = auVar17._0_4_;
      fStack_30dc = auVar17._4_4_;
      fStack_30d8 = auVar17._8_4_;
      fStack_30d4 = auVar17._12_4_;
      fStack_30d0 = auVar17._16_4_;
      fStack_30cc = auVar17._20_4_;
      fStack_30c8 = auVar17._24_4_;
      local_3240._4_4_ = (fStack_313c + 1.0) * fStack_30dc;
      local_3240._0_4_ = (local_3140 + 1.0) * local_30e0;
      uStack_3238._0_4_ = (fStack_3138 + 1.0) * fStack_30d8;
      uStack_3238._4_4_ = (fStack_3134 + 1.0) * fStack_30d4;
      uStack_3230._0_4_ = fStack_30d0 * 1.0;
      uStack_3230._4_4_ = fStack_30cc * 1.0;
      auVar277 = _local_3240;
      uStack_3228._0_4_ = fStack_30c8 * 1.0;
      uStack_3228._4_4_ = 0x3f800000;
      auVar17 = _local_3240;
      uStack_3230 = auVar277._16_8_;
      uStack_3228 = auVar17._24_8_;
      *local_a5e0 = local_3240;
      local_a5e0[1] = uStack_3238;
      local_a5e0[2] = uStack_3230;
      local_a5e0[3] = uStack_3228;
      local_a5d8 = local_a5d8 + 2;
      local_a5e0 = local_a5e0 + 4;
    }
    for (; local_a844 < in_ECX; local_a844 = local_a844 + 1) {
      fVar284 = *local_a5d8;
      auVar18 = vcmpps_avx(auVar270,ZEXT816(0),2);
      auVar21._8_4_ = 0x800000;
      auVar21._0_8_ = 0x80000000800000;
      auVar21._12_4_ = 0x800000;
      auVar19 = vmaxps_avx(auVar20,auVar21);
      auVar27 = vpsrld_avx(auVar19,ZEXT416(0x17));
      auVar240._8_4_ = 0x807fffff;
      auVar240._0_8_ = 0x807fffff807fffff;
      auVar240._12_4_ = 0x807fffff;
      auVar19 = vpand_avx(auVar19,auVar240);
      auVar262._8_4_ = 0x3f000000;
      auVar262._0_8_ = 0x3f0000003f000000;
      auVar262._12_4_ = 0x3f000000;
      auVar21 = vpor_avx(auVar19,auVar262);
      auVar263._8_8_ = 0x7f0000007f;
      auVar263._0_8_ = 0x7f0000007f;
      auVar19 = vpsubd_avx(auVar27,auVar263);
      auVar19 = vcvtdq2ps_avx(auVar19);
      local_8a0 = auVar19._0_4_;
      fStack_89c = auVar19._4_4_;
      fStack_898 = auVar19._8_4_;
      fStack_894 = auVar19._12_4_;
      local_940 = CONCAT44(fStack_89c + 1.0,local_8a0 + 1.0);
      uStack_938._0_4_ = fStack_898 + 1.0;
      uStack_938._4_4_ = fStack_894 + 1.0;
      auVar264._8_4_ = 0x3f3504f3;
      auVar264._0_8_ = 0x3f3504f33f3504f3;
      auVar264._12_4_ = 0x3f3504f3;
      auVar19 = vcmpps_avx(auVar21,auVar264,1);
      auVar27 = vpand_avx(auVar21,auVar19);
      auVar236._8_8_ = 0x3f8000003f800000;
      auVar236._0_8_ = 0x3f8000003f800000;
      auVar21 = vsubps_avx(auVar21,auVar236);
      auVar239._8_8_ = 0x3f8000003f800000;
      auVar239._0_8_ = 0x3f8000003f800000;
      auVar19 = vpand_avx(auVar239,auVar19);
      auVar235._8_8_ = uStack_938;
      auVar235._0_8_ = local_940;
      auVar19 = vsubps_avx(auVar235,auVar19);
      local_8c0 = auVar21._0_4_;
      fStack_8bc = auVar21._4_4_;
      fStack_8b8 = auVar21._8_4_;
      fStack_8b4 = auVar21._12_4_;
      local_8d0 = auVar27._0_4_;
      fStack_8cc = auVar27._4_4_;
      fStack_8c8 = auVar27._8_4_;
      fStack_8c4 = auVar27._12_4_;
      local_900._0_4_ = local_8c0 + local_8d0;
      local_900._4_4_ = fStack_8bc + fStack_8cc;
      fStack_8f8 = fStack_8b8 + fStack_8c8;
      fStack_8f4 = fStack_8b4 + fStack_8c4;
      fStack_978 = 0.070376836;
      local_980 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_974 = 0.070376836;
      auVar252._8_4_ = -0.1151461;
      auVar252._12_4_ = -0.1151461;
      auVar252._0_4_ = -0.1151461;
      auVar252._4_4_ = -0.1151461;
      auVar27 = vfmadd213ps_fma(_local_900,_local_980,auVar252);
      auVar253._8_4_ = 0.116769984;
      auVar253._12_4_ = 0.116769984;
      auVar253._0_4_ = 0.116769984;
      auVar253._4_4_ = 0.116769984;
      auVar27 = vfmadd213ps_fma(_local_900,auVar27,auVar253);
      auVar254._8_4_ = -0.12420141;
      auVar254._12_4_ = -0.12420141;
      auVar254._0_4_ = -0.12420141;
      auVar254._4_4_ = -0.12420141;
      auVar27 = vfmadd213ps_fma(_local_900,auVar27,auVar254);
      auVar255._8_4_ = 0.14249323;
      auVar255._12_4_ = 0.14249323;
      auVar255._0_4_ = 0.14249323;
      auVar255._4_4_ = 0.14249323;
      auVar27 = vfmadd213ps_fma(_local_900,auVar27,auVar255);
      auVar256._8_4_ = -0.16668057;
      auVar256._12_4_ = -0.16668057;
      auVar256._0_4_ = -0.16668057;
      auVar256._4_4_ = -0.16668057;
      auVar27 = vfmadd213ps_fma(_local_900,auVar27,auVar256);
      auVar257._8_4_ = 0.20000714;
      auVar257._12_4_ = 0.20000714;
      auVar257._0_4_ = 0.20000714;
      auVar257._4_4_ = 0.20000714;
      auVar27 = vfmadd213ps_fma(_local_900,auVar27,auVar257);
      auVar258._8_4_ = -0.24999994;
      auVar258._12_4_ = -0.24999994;
      auVar258._0_4_ = -0.24999994;
      auVar258._4_4_ = -0.24999994;
      auVar27 = vfmadd213ps_fma(_local_900,auVar27,auVar258);
      auVar259._8_4_ = 0.3333333;
      auVar259._12_4_ = 0.3333333;
      auVar259._0_4_ = 0.3333333;
      auVar259._4_4_ = 0.3333333;
      auVar27 = vfmadd213ps_fma(_local_900,auVar27,auVar259);
      local_820 = auVar27._0_4_;
      fStack_81c = auVar27._4_4_;
      fStack_818 = auVar27._8_4_;
      fStack_814 = auVar27._12_4_;
      local_980._4_4_ =
           fStack_81c * (float)local_900._4_4_ * (float)local_900._4_4_ * (float)local_900._4_4_;
      local_980._0_4_ =
           local_820 * (float)local_900._0_4_ * (float)local_900._0_4_ * (float)local_900._0_4_;
      fStack_978 = fStack_818 * fStack_8f8 * fStack_8f8 * fStack_8f8;
      fStack_974 = fStack_814 * fStack_8f4 * fStack_8f4 * fStack_8f4;
      auVar260._8_4_ = -0.00021219444;
      auVar260._12_4_ = -0.00021219444;
      auVar260._0_4_ = -0.00021219444;
      auVar260._4_4_ = -0.00021219444;
      auVar27 = vfmadd213ps_fma(auVar260,auVar19,_local_980);
      auVar269._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
      auVar269._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
      auVar269._8_4_ = fStack_8f8 * fStack_8f8;
      auVar269._12_4_ = fStack_8f4 * fStack_8f4;
      auVar246._8_4_ = 0.5;
      auVar246._12_4_ = 0.5;
      auVar246._0_4_ = 0.5;
      auVar246._4_4_ = 0.5;
      auVar27 = vfnmadd213ps_fma(auVar246,auVar269,auVar27);
      local_8f0 = auVar27._0_4_;
      fStack_8ec = auVar27._4_4_;
      fStack_8e8 = auVar27._8_4_;
      fStack_8e4 = auVar27._12_4_;
      local_900._4_4_ = (float)local_900._4_4_ + fStack_8ec;
      local_900._0_4_ = (float)local_900._0_4_ + local_8f0;
      fStack_8f8 = fStack_8f8 + fStack_8e8;
      fStack_8f4 = fStack_8f4 + fStack_8e4;
      auVar261._8_4_ = 0.6933594;
      auVar261._12_4_ = 0.6933594;
      auVar261._0_4_ = 0.6933594;
      auVar261._4_4_ = 0.6933594;
      auVar19 = vfmadd213ps_fma(auVar261,auVar19,_local_900);
      auVar18 = vpor_avx(auVar19,auVar18);
      local_b20 = auVar18._0_4_;
      fStack_b1c = auVar18._4_4_;
      fStack_b18 = auVar18._8_4_;
      fStack_b14 = auVar18._12_4_;
      local_a90 = CONCAT44(fVar284 * fStack_b1c,fVar284 * local_b20);
      uStack_a88._0_4_ = fVar284 * fStack_b18;
      uStack_a88._4_4_ = fVar284 * fStack_b14;
      auVar27._8_8_ = uStack_a88;
      auVar27._0_8_ = local_a90;
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar27,auVar18);
      auVar19._8_4_ = 0xc2b0c0a5;
      auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar19._12_4_ = 0xc2b0c0a5;
      auVar27 = vmaxps_avx(auVar18,auVar19);
      local_9d0 = auVar27._0_4_;
      fStack_9cc = auVar27._4_4_;
      fStack_9c8 = auVar27._8_4_;
      fStack_9c4 = auVar27._12_4_;
      fVar284 = local_9d0 * 1.442695 + 0.5;
      fVar287 = fStack_9cc * 1.442695 + 0.5;
      fVar288 = fStack_9c8 * 1.442695 + 0.5;
      fVar289 = fStack_9c4 * 1.442695 + 0.5;
      local_ab0 = CONCAT44(fVar287,fVar284);
      uStack_aa8._0_4_ = fVar288;
      uStack_aa8._4_4_ = fVar289;
      local_ac0 = CONCAT44((int)fVar287,(int)fVar284);
      uStack_ab8._0_4_ = (int)fVar288;
      uStack_ab8._4_4_ = (int)fVar289;
      auVar237._8_8_ = uStack_ab8;
      auVar237._0_8_ = local_ac0;
      auVar19 = vcvtdq2ps_avx(auVar237);
      auVar238._8_8_ = uStack_aa8;
      auVar238._0_8_ = local_ab0;
      auVar18 = vcmpps_avx(auVar238,auVar19,1);
      auVar241._8_8_ = 0x3f8000003f800000;
      auVar241._0_8_ = 0x3f8000003f800000;
      auVar18 = vpand_avx(auVar18,auVar241);
      auVar18 = vsubps_avx(auVar19,auVar18);
      auVar244._8_4_ = 0.6933594;
      auVar244._12_4_ = 0.6933594;
      auVar244._0_4_ = 0.6933594;
      auVar244._4_4_ = 0.6933594;
      auVar19 = vfnmadd213ps_fma(auVar244,auVar18,auVar27);
      auVar245._8_4_ = -0.00021219444;
      auVar245._12_4_ = -0.00021219444;
      auVar245._0_4_ = -0.00021219444;
      auVar245._4_4_ = -0.00021219444;
      auVar27 = vfnmadd213ps_fma(auVar245,auVar18,auVar19);
      local_9f0 = auVar27._0_4_;
      fStack_9ec = auVar27._4_4_;
      fStack_9e8 = auVar27._8_4_;
      fStack_9e4 = auVar27._12_4_;
      local_aa0._4_4_ = fStack_9ec * fStack_9ec;
      local_aa0._0_4_ = local_9f0 * local_9f0;
      fStack_a98 = fStack_9e8 * fStack_9e8;
      fStack_a94 = fStack_9e4 * fStack_9e4;
      uStack_ae8._0_4_ = 0x39506967;
      local_af0 = (undefined1  [8])0x3950696739506967;
      uStack_ae8._4_4_ = 0x39506967;
      auVar247._8_4_ = 0.0013981999;
      auVar247._12_4_ = 0.0013981999;
      auVar247._0_4_ = 0.0013981999;
      auVar247._4_4_ = 0.0013981999;
      auVar19 = vfmadd213ps_fma(auVar27,_local_af0,auVar247);
      auVar248._8_4_ = 0.008333452;
      auVar248._12_4_ = 0.008333452;
      auVar248._0_4_ = 0.008333452;
      auVar248._4_4_ = 0.008333452;
      auVar19 = vfmadd213ps_fma(auVar27,auVar19,auVar248);
      auVar249._8_4_ = 0.041665796;
      auVar249._12_4_ = 0.041665796;
      auVar249._0_4_ = 0.041665796;
      auVar249._4_4_ = 0.041665796;
      auVar19 = vfmadd213ps_fma(auVar27,auVar19,auVar249);
      auVar250._8_4_ = 0.16666666;
      auVar250._12_4_ = 0.16666666;
      auVar250._0_4_ = 0.16666666;
      auVar250._4_4_ = 0.16666666;
      auVar19 = vfmadd213ps_fma(auVar27,auVar19,auVar250);
      auVar251._8_4_ = 0.5;
      auVar251._12_4_ = 0.5;
      auVar251._0_4_ = 0.5;
      auVar251._4_4_ = 0.5;
      auVar19 = vfmadd213ps_fma(auVar27,auVar19,auVar251);
      auVar19 = vfmadd213ps_fma(_local_aa0,auVar19,auVar27);
      local_a70 = auVar19._0_4_;
      fStack_a6c = auVar19._4_4_;
      fStack_a68 = auVar19._8_4_;
      fStack_a64 = auVar19._12_4_;
      local_7b0 = auVar18._0_4_;
      fStack_7ac = auVar18._4_4_;
      fStack_7a8 = auVar18._8_4_;
      fStack_7a4 = auVar18._12_4_;
      local_ac0 = CONCAT44((int)fStack_7ac,(int)local_7b0);
      uStack_ab8._0_4_ = (int)fStack_7a8;
      uStack_ab8._4_4_ = (int)fStack_7a4;
      auVar243._8_8_ = uStack_ab8;
      auVar243._0_8_ = local_ac0;
      auVar242._8_8_ = 0x7f0000007f;
      auVar242._0_8_ = 0x7f0000007f;
      auVar18 = vpaddd_avx(auVar243,auVar242);
      auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
      local_a20 = auVar18._0_4_;
      fStack_a1c = auVar18._4_4_;
      fStack_a18 = auVar18._8_4_;
      fStack_a14 = auVar18._12_4_;
      local_af0._4_4_ = (fStack_a6c + 1.0) * fStack_a1c;
      local_af0._0_4_ = (local_a70 + 1.0) * local_a20;
      uStack_ae8._0_4_ = (fStack_a68 + 1.0) * fStack_a18;
      uStack_ae8._4_4_ = (fStack_a64 + 1.0) * fStack_a14;
      *local_a5e0 = local_af0;
      local_a5e0[1] = uStack_ae8;
      local_a5d8 = local_a5d8 + 1;
      local_a5e0 = local_a5e0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}